

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxshift.hpp
# Opt level: O3

void __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::unShift(SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *this)

{
  uint *puVar1;
  uint uVar2;
  SPxOut *pSVar3;
  pointer pnVar4;
  char cVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  int iVar14;
  fpclass_type fVar15;
  undefined8 *puVar16;
  Status **ppSVar17;
  pointer pnVar18;
  long lVar19;
  int32_t iVar20;
  cpp_dec_float<100U,_int,_void> *pcVar21;
  ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
  *pCVar22;
  ulong uVar23;
  ulong uVar24;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  Verbosity old_verbosity;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_6;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  eps;
  cpp_dec_float<100U,_int,_void> local_1f8;
  cpp_dec_float<100U,_int,_void> *local_1a0;
  cpp_dec_float<100U,_int,_void> local_198;
  cpp_dec_float<100U,_int,_void> local_148;
  cpp_dec_float<100U,_int,_void> local_f8;
  ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
  *local_a0;
  ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
  *local_98;
  Status **local_90;
  Status **local_88;
  cpp_dec_float<100U,_int,_void> local_80;
  
  pSVar3 = this->spxout;
  if ((pSVar3 != (SPxOut *)0x0) &&
     (local_148.data._M_elems[0] = pSVar3->m_verbosity, 4 < (int)local_148.data._M_elems[0])) {
    local_198.data._M_elems[0] = 5;
    (*pSVar3->_vptr_SPxOut[2])();
    pSVar3 = this->spxout;
    std::__ostream_insert<char,std::char_traits<char>>
              (pSVar3->m_streams[pSVar3->m_verbosity],"DSHIFT07 = ",0xb);
    std::__ostream_insert<char,std::char_traits<char>>
              (pSVar3->m_streams[pSVar3->m_verbosity],"unshifting ...",0xe);
    cVar5 = (char)pSVar3->m_streams[pSVar3->m_verbosity];
    std::ios::widen((char)*(undefined8 *)(*(long *)pSVar3->m_streams[pSVar3->m_verbosity] + -0x18) +
                    cVar5);
    std::ostream::put(cVar5);
    std::ostream::flush();
    (*this->spxout->_vptr_SPxOut[2])();
  }
  if (this->initialized == true) {
    local_148.fpclass = cpp_dec_float_finite;
    local_148.prec_elem = 0x10;
    local_148.data._M_elems[0] = 0;
    local_148.data._M_elems[1] = 0;
    local_148.data._M_elems[2] = 0;
    local_148.data._M_elems[3] = 0;
    local_148.data._M_elems[4] = 0;
    local_148.data._M_elems[5] = 0;
    local_148.data._M_elems[6] = 0;
    local_148.data._M_elems[7] = 0;
    local_148.data._M_elems[8] = 0;
    local_148.data._M_elems[9] = 0;
    local_148.data._M_elems[10] = 0;
    local_148.data._M_elems[0xb] = 0;
    local_148.data._M_elems[0xc] = 0;
    local_148.data._M_elems[0xd] = 0;
    local_148.data._M_elems._56_5_ = 0;
    local_148.data._M_elems[0xf]._1_3_ = 0;
    local_148.exp = 0;
    local_148.neg = false;
    local_198.fpclass = cpp_dec_float_finite;
    local_198.prec_elem = 0x10;
    local_198.data._M_elems[0] = 0;
    local_198.data._M_elems[1] = 0;
    local_198.data._M_elems[2] = 0;
    local_198.data._M_elems[3] = 0;
    local_198.data._M_elems[4] = 0;
    local_198.data._M_elems[5] = 0;
    local_198.data._M_elems[6] = 0;
    local_198.data._M_elems[7] = 0;
    local_198.data._M_elems[8] = 0;
    local_198.data._M_elems[9] = 0;
    local_198.data._M_elems[10] = 0;
    local_198.data._M_elems[0xb] = 0;
    local_198.data._M_elems[0xc] = 0;
    local_198.data._M_elems[0xd] = 0;
    local_198.data._M_elems._56_5_ = 0;
    local_198.data._M_elems[0xf]._1_3_ = 0;
    local_198.exp = 0;
    local_198.neg = false;
    local_1a0 = &(this->theShift).m_backend;
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=(local_1a0,0);
    if (this->theType == ENTER) {
      entertol((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)&local_80,this);
      uVar2 = (this->thecovectors->set).thenum;
      uVar24 = (ulong)uVar2;
      if (this->theRep == COLUMN) {
        if (0 < (int)uVar2) {
          uVar23 = uVar24 + 1;
          local_a0 = &(this->
                      super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).
                      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .
                      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .set;
          lVar19 = uVar24 * 0x50;
          do {
            local_f8.data._M_elems._0_8_ =
                 (this->
                 super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).theBaseId.data[uVar23 - 2].super_DataKey;
            pCVar22 = &(this->
                       super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).
                       super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .
                       super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .set;
            if (local_f8.data._M_elems[0] < 1) {
              pCVar22 = local_a0;
            }
            iVar14 = ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
                     ::number(pCVar22,(DataKey *)&local_f8);
            if ((int)local_f8.data._M_elems[0] < 0) {
              pnVar18 = (this->
                        super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).
                        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        .left.val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              local_148.data._M_elems[0] = pnVar18[iVar14].m_backend.data._M_elems[0];
              puVar1 = pnVar18[iVar14].m_backend.data._M_elems + 0xc;
              uVar6 = *(undefined8 *)(puVar1 + 2);
              local_1f8.data._M_elems[0xc] = (uint)((ulong)*(undefined8 *)puVar1 >> 0x20);
              puVar1 = pnVar18[iVar14].m_backend.data._M_elems + 9;
              uVar7 = *(undefined8 *)puVar1;
              uVar8 = *(undefined8 *)(puVar1 + 2);
              local_1f8.data._M_elems[0xb] = (uint)((ulong)uVar8 >> 0x20);
              local_148.data._M_elems[0xc] = local_1f8.data._M_elems[0xb];
              puVar1 = pnVar18[iVar14].m_backend.data._M_elems + 5;
              uVar9 = *(undefined8 *)puVar1;
              uVar10 = *(undefined8 *)(puVar1 + 2);
              puVar1 = pnVar18[iVar14].m_backend.data._M_elems + 1;
              uVar11 = *(undefined8 *)puVar1;
              uVar12 = *(undefined8 *)(puVar1 + 2);
              local_148.exp = pnVar18[iVar14].m_backend.exp;
              fVar15 = pnVar18[iVar14].m_backend.fpclass;
              iVar20 = pnVar18[iVar14].m_backend.prec_elem;
              local_148.neg =
                   (bool)((local_148.data._M_elems[0] != 0 || fVar15 != cpp_dec_float_finite) ^
                         pnVar18[iVar14].m_backend.neg);
              local_148.data._M_elems[0xd] = local_1f8.data._M_elems[0xc];
              local_148.data._M_elems._56_5_ = SUB85(uVar6,0);
              local_148.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar6 >> 0x28);
              local_148.data._M_elems[9] = (uint)uVar7;
              local_148.data._M_elems[10] = (uint)((ulong)uVar7 >> 0x20);
              local_148.data._M_elems[0xb] = (uint)uVar8;
              local_148.data._M_elems[5] = (uint)uVar9;
              local_148.data._M_elems[6] = (uint)((ulong)uVar9 >> 0x20);
              local_148.data._M_elems[7] = (uint)uVar10;
              local_148.data._M_elems[8] = (uint)((ulong)uVar10 >> 0x20);
              local_148.data._M_elems[1] = (uint)uVar11;
              local_148.data._M_elems[2] = (uint)((ulong)uVar11 >> 0x20);
              local_148.data._M_elems[3] = (uint)uVar12;
              local_148.data._M_elems[4] = (uint)((ulong)uVar12 >> 0x20);
              local_148.prec_elem = iVar20;
              local_148.fpclass = fVar15;
              pnVar18 = (this->
                        super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).
                        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        .right.val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              local_198.data._M_elems[0] = pnVar18[iVar14].m_backend.data._M_elems[0];
              puVar1 = pnVar18[iVar14].m_backend.data._M_elems + 0xc;
              uVar6 = *(undefined8 *)(puVar1 + 2);
              local_1f8.data._M_elems[0xc] = (uint)((ulong)*(undefined8 *)puVar1 >> 0x20);
              local_1f8.data._M_elems[0xd] = (uint)uVar6;
              local_1f8.data._M_elems[0xe] = (uint)((ulong)uVar6 >> 0x20);
              puVar1 = pnVar18[iVar14].m_backend.data._M_elems + 9;
              uVar7 = *(undefined8 *)puVar1;
              uVar8 = *(undefined8 *)(puVar1 + 2);
              local_1f8.data._M_elems[8] = (uint)uVar7;
              local_1f8.data._M_elems[9] = (uint)((ulong)uVar7 >> 0x20);
              local_1f8.data._M_elems[10] = (uint)uVar8;
              local_1f8.data._M_elems[0xb] = (uint)((ulong)uVar8 >> 0x20);
              puVar1 = pnVar18[iVar14].m_backend.data._M_elems + 5;
              uVar7 = *(undefined8 *)puVar1;
              uVar8 = *(undefined8 *)(puVar1 + 2);
              local_1f8.data._M_elems[4] = (uint)uVar7;
              local_1f8.data._M_elems[5] = (uint)((ulong)uVar7 >> 0x20);
              local_1f8.data._M_elems[6] = (uint)uVar8;
              local_1f8.data._M_elems[7] = (uint)((ulong)uVar8 >> 0x20);
              puVar1 = pnVar18[iVar14].m_backend.data._M_elems + 1;
              uVar7 = *(undefined8 *)puVar1;
              uVar8 = *(undefined8 *)(puVar1 + 2);
              local_1f8.data._M_elems[0] = (uint)uVar7;
              local_1f8.data._M_elems[1] = (uint)((ulong)uVar7 >> 0x20);
              local_1f8.data._M_elems[2] = (uint)uVar8;
              local_1f8.data._M_elems[3] = (uint)((ulong)uVar8 >> 0x20);
              local_198.exp = pnVar18[iVar14].m_backend.exp;
              local_198.fpclass = pnVar18[iVar14].m_backend.fpclass;
              local_198.prec_elem = pnVar18[iVar14].m_backend.prec_elem;
              local_198.neg =
                   (bool)((local_198.fpclass != cpp_dec_float_finite ||
                          local_198.data._M_elems[0] != 0) ^ pnVar18[iVar14].m_backend.neg);
              local_198.data._M_elems[0xd] = local_1f8.data._M_elems[0xc];
              local_198.data._M_elems._56_5_ = SUB85(uVar6,0);
              local_198.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar6 >> 0x28);
              local_198.data._M_elems[1] = local_1f8.data._M_elems[0];
              local_198.data._M_elems[2] = local_1f8.data._M_elems[1];
              local_198.data._M_elems[3] = local_1f8.data._M_elems[2];
              local_198.data._M_elems[4] = local_1f8.data._M_elems[3];
              local_198.data._M_elems[5] = local_1f8.data._M_elems[4];
              local_198.data._M_elems[6] = local_1f8.data._M_elems[5];
              local_198.data._M_elems[7] = local_1f8.data._M_elems[6];
              local_198.data._M_elems[8] = local_1f8.data._M_elems[7];
              local_198.data._M_elems[9] = local_1f8.data._M_elems[8];
              local_198.data._M_elems[10] = local_1f8.data._M_elems[9];
              local_198.data._M_elems[0xb] = local_1f8.data._M_elems[10];
              local_198.data._M_elems[0xc] = local_1f8.data._M_elems[0xb];
            }
            else {
              pnVar18 = (this->
                        super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).
                        super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        .up.val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              uVar6 = *(undefined8 *)&pnVar18[iVar14].m_backend.data;
              uVar7 = *(undefined8 *)(pnVar18[iVar14].m_backend.data._M_elems + 2);
              puVar1 = pnVar18[iVar14].m_backend.data._M_elems + 4;
              uVar8 = *(undefined8 *)puVar1;
              uVar9 = *(undefined8 *)(puVar1 + 2);
              puVar1 = pnVar18[iVar14].m_backend.data._M_elems + 8;
              uVar10 = *(undefined8 *)puVar1;
              uVar11 = *(undefined8 *)(puVar1 + 2);
              puVar1 = pnVar18[iVar14].m_backend.data._M_elems + 0xc;
              uVar12 = *(undefined8 *)puVar1;
              uVar13 = *(undefined8 *)(puVar1 + 2);
              local_148.data._M_elems[0xc] = (uint)uVar12;
              local_148.data._M_elems[0xd] = (uint)((ulong)uVar12 >> 0x20);
              local_148.data._M_elems._56_5_ = SUB85(uVar13,0);
              local_148.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar13 >> 0x28);
              local_148.data._M_elems[8] = (uint)uVar10;
              local_148.data._M_elems[9] = (uint)((ulong)uVar10 >> 0x20);
              local_148.data._M_elems[10] = (uint)uVar11;
              local_148.data._M_elems[0xb] = (uint)((ulong)uVar11 >> 0x20);
              local_148.data._M_elems[4] = (uint)uVar8;
              local_148.data._M_elems[5] = (uint)((ulong)uVar8 >> 0x20);
              local_148.data._M_elems[6] = (uint)uVar9;
              local_148.data._M_elems[7] = (uint)((ulong)uVar9 >> 0x20);
              local_148.data._M_elems[0] = (uint)uVar6;
              local_148.data._M_elems[1] = (uint)((ulong)uVar6 >> 0x20);
              local_148.data._M_elems[2] = (uint)uVar7;
              local_148.data._M_elems[3] = (uint)((ulong)uVar7 >> 0x20);
              local_148.exp = pnVar18[iVar14].m_backend.exp;
              local_148.neg = pnVar18[iVar14].m_backend.neg;
              fVar15 = pnVar18[iVar14].m_backend.fpclass;
              iVar20 = pnVar18[iVar14].m_backend.prec_elem;
              local_148.prec_elem = iVar20;
              local_148.fpclass = fVar15;
              pnVar18 = (this->
                        super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).
                        super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        .low.val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              uVar6 = *(undefined8 *)&pnVar18[iVar14].m_backend.data;
              uVar7 = *(undefined8 *)(pnVar18[iVar14].m_backend.data._M_elems + 2);
              puVar1 = pnVar18[iVar14].m_backend.data._M_elems + 4;
              uVar8 = *(undefined8 *)puVar1;
              uVar9 = *(undefined8 *)(puVar1 + 2);
              puVar1 = pnVar18[iVar14].m_backend.data._M_elems + 8;
              uVar10 = *(undefined8 *)puVar1;
              uVar11 = *(undefined8 *)(puVar1 + 2);
              puVar1 = pnVar18[iVar14].m_backend.data._M_elems + 0xc;
              uVar12 = *(undefined8 *)puVar1;
              uVar13 = *(undefined8 *)(puVar1 + 2);
              local_198.data._M_elems[0xc] = (uint)uVar12;
              local_198.data._M_elems[0xd] = (uint)((ulong)uVar12 >> 0x20);
              local_198.data._M_elems._56_5_ = SUB85(uVar13,0);
              local_198.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar13 >> 0x28);
              local_198.data._M_elems[8] = (uint)uVar10;
              local_198.data._M_elems[9] = (uint)((ulong)uVar10 >> 0x20);
              local_198.data._M_elems[10] = (uint)uVar11;
              local_198.data._M_elems[0xb] = (uint)((ulong)uVar11 >> 0x20);
              local_198.data._M_elems[4] = (uint)uVar8;
              local_198.data._M_elems[5] = (uint)((ulong)uVar8 >> 0x20);
              local_198.data._M_elems[6] = (uint)uVar9;
              local_198.data._M_elems[7] = (uint)((ulong)uVar9 >> 0x20);
              local_198.data._M_elems[0] = (uint)uVar6;
              local_198.data._M_elems[1] = (uint)((ulong)uVar6 >> 0x20);
              local_198.data._M_elems[2] = (uint)uVar7;
              local_198.data._M_elems[3] = (uint)((ulong)uVar7 >> 0x20);
              local_198.exp = pnVar18[iVar14].m_backend.exp;
              local_198.neg = pnVar18[iVar14].m_backend.neg;
              local_198.fpclass = pnVar18[iVar14].m_backend.fpclass;
              local_198.prec_elem = pnVar18[iVar14].m_backend.prec_elem;
            }
            if ((fVar15 == cpp_dec_float_NaN) || (local_198.fpclass == cpp_dec_float_NaN)) {
LAB_003949e9:
              pnVar18 = (this->theFvec->
                        super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              local_1f8.data._M_elems[0xc] = local_148.data._M_elems[0xc];
              local_1f8.data._M_elems[0xd] = local_148.data._M_elems[0xd];
              local_1f8.data._M_elems[0xe] = local_148.data._M_elems[0xe];
              local_1f8.data._M_elems[0xf] =
                   (uint)(CONCAT35(local_148.data._M_elems[0xf]._1_3_,local_148.data._M_elems._56_5_
                                  ) >> 0x20);
              local_1f8.data._M_elems[8] = local_148.data._M_elems[8];
              local_1f8.data._M_elems[9] = local_148.data._M_elems[9];
              local_1f8.data._M_elems[10] = local_148.data._M_elems[10];
              local_1f8.data._M_elems[0xb] = local_148.data._M_elems[0xb];
              local_1f8.data._M_elems[4] = local_148.data._M_elems[4];
              local_1f8.data._M_elems[5] = local_148.data._M_elems[5];
              local_1f8.data._M_elems[6] = local_148.data._M_elems[6];
              local_1f8.data._M_elems[7] = local_148.data._M_elems[7];
              local_1f8.data._M_elems[0] = local_148.data._M_elems[0];
              local_1f8.data._M_elems[1] = local_148.data._M_elems[1];
              local_1f8.data._M_elems[2] = local_148.data._M_elems[2];
              local_1f8.data._M_elems[3] = local_148.data._M_elems[3];
              local_1f8.prec_elem = iVar20;
              local_1f8.fpclass = fVar15;
              local_1f8.exp = local_148.exp;
              local_1f8.neg = local_148.neg;
              boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=
                        (&local_1f8,&local_80);
              if (((*(int *)((long)(&pnVar18[0xffffffffffffffff].m_backend.data + 1) + lVar19 + 8U)
                    == 2) || (local_1f8.fpclass == cpp_dec_float_NaN)) ||
                 (iVar14 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                     ((cpp_dec_float<100U,_int,_void> *)
                                      ((long)pnVar18[0xffffffffffffffff].m_backend.data._M_elems +
                                      lVar19),&local_1f8), -1 < iVar14)) {
                pnVar18 = (this->theFvec->
                          super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ).val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                if (((*(int *)((long)(&pnVar18[0xffffffffffffffff].m_backend.data + 1) + lVar19 + 8U
                              ) != 2) && (local_148.fpclass != cpp_dec_float_NaN)) &&
                   (iVar14 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::
                             compare((cpp_dec_float<100U,_int,_void> *)
                                     ((long)pnVar18[0xffffffffffffffff].m_backend.data._M_elems +
                                     lVar19),&local_148), 0 < iVar14)) {
                  pnVar18 = (this->theUBbound).val.
                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                  puVar16 = (undefined8 *)((long)pnVar18[-1].m_backend.data._M_elems + lVar19);
                  local_1f8.fpclass = cpp_dec_float_finite;
                  local_1f8.prec_elem = 0x10;
                  local_1f8.data._M_elems[0] = 0;
                  local_1f8.data._M_elems[1] = 0;
                  local_1f8.data._M_elems[2] = 0;
                  local_1f8.data._M_elems[3] = 0;
                  local_1f8.data._M_elems[4] = 0;
                  local_1f8.data._M_elems[5] = 0;
                  local_1f8.data._M_elems[6] = 0;
                  local_1f8.data._M_elems[7] = 0;
                  local_1f8.data._M_elems[8] = 0;
                  local_1f8.data._M_elems[9] = 0;
                  local_1f8.data._M_elems[10] = 0;
                  local_1f8.data._M_elems[0xb] = 0;
                  local_1f8.data._M_elems[0xc] = 0;
                  local_1f8.data._M_elems[0xd] = 0;
                  local_1f8.data._M_elems[0xe] = 0;
                  local_1f8.data._M_elems[0xf] = 0;
                  local_1f8.exp = 0;
                  local_1f8.neg = false;
                  if ((cpp_dec_float<100U,_int,_void> *)puVar16 != &local_1f8) {
                    local_1f8.data._M_elems[0xc] = (uint)puVar16[6];
                    local_1f8.data._M_elems[0xd] = (uint)((ulong)puVar16[6] >> 0x20);
                    local_1f8.data._M_elems[0xe] = (uint)puVar16[7];
                    local_1f8.data._M_elems[0xf] = (uint)((ulong)puVar16[7] >> 0x20);
                    local_1f8.data._M_elems[8] = (uint)puVar16[4];
                    local_1f8.data._M_elems[9] = (uint)((ulong)puVar16[4] >> 0x20);
                    local_1f8.data._M_elems[10] = (uint)puVar16[5];
                    local_1f8.data._M_elems[0xb] = (uint)((ulong)puVar16[5] >> 0x20);
                    local_1f8.data._M_elems[4] = (uint)puVar16[2];
                    local_1f8.data._M_elems[5] = (uint)((ulong)puVar16[2] >> 0x20);
                    local_1f8.data._M_elems[6] = (uint)puVar16[3];
                    local_1f8.data._M_elems[7] = (uint)((ulong)puVar16[3] >> 0x20);
                    local_1f8.data._M_elems[0] = (uint)*puVar16;
                    local_1f8.data._M_elems[1] = (uint)((ulong)*puVar16 >> 0x20);
                    local_1f8.data._M_elems[2] = (uint)puVar16[1];
                    local_1f8.data._M_elems[3] = (uint)((ulong)puVar16[1] >> 0x20);
                    local_1f8.exp = *(int *)((long)(&pnVar18[-1].m_backend.data + 1) + lVar19);
                    local_1f8.neg = *(bool *)((long)(&pnVar18[-1].m_backend.data + 1) + lVar19 + 4U)
                    ;
                    local_1f8._72_8_ =
                         *(undefined8 *)((long)(&pnVar18[-1].m_backend.data + 1) + lVar19 + 8U);
                  }
                  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                            (&local_1f8,&local_148);
                  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=
                            (local_1a0,&local_1f8);
                }
              }
              else {
                pnVar18 = (this->theUBbound).val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                puVar16 = (undefined8 *)((long)pnVar18[-1].m_backend.data._M_elems + lVar19 + 0x30);
                *puVar16 = CONCAT44(local_148.data._M_elems[0xd],local_148.data._M_elems[0xc]);
                puVar16[1] = CONCAT35(local_148.data._M_elems[0xf]._1_3_,
                                      local_148.data._M_elems._56_5_);
                puVar16 = (undefined8 *)((long)pnVar18[-1].m_backend.data._M_elems + lVar19 + 0x20);
                *puVar16 = CONCAT44(local_148.data._M_elems[9],local_148.data._M_elems[8]);
                puVar16[1] = CONCAT44(local_148.data._M_elems[0xb],local_148.data._M_elems[10]);
                puVar16 = (undefined8 *)((long)pnVar18[-1].m_backend.data._M_elems + lVar19 + 0x10);
                *puVar16 = CONCAT44(local_148.data._M_elems[5],local_148.data._M_elems[4]);
                puVar16[1] = CONCAT44(local_148.data._M_elems[7],local_148.data._M_elems[6]);
                puVar16 = (undefined8 *)((long)pnVar18[-1].m_backend.data._M_elems + lVar19);
                *puVar16 = CONCAT44(local_148.data._M_elems[1],local_148.data._M_elems[0]);
                puVar16[1] = CONCAT44(local_148.data._M_elems[3],local_148.data._M_elems[2]);
                *(int *)((long)(&pnVar18[-1].m_backend.data + 1) + lVar19) = local_148.exp;
                *(bool *)((long)(&pnVar18[-1].m_backend.data + 1) + lVar19 + 4U) = local_148.neg;
                *(undefined8 *)((long)(&pnVar18[-1].m_backend.data + 1) + lVar19 + 8U) =
                     local_148._72_8_;
              }
              pnVar18 = (this->theFvec->
                        super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              local_1f8.data._M_elems[0xc] = local_198.data._M_elems[0xc];
              local_1f8.data._M_elems[0xd] = local_198.data._M_elems[0xd];
              local_1f8.data._M_elems[0xe] = local_198.data._M_elems[0xe];
              local_1f8.data._M_elems[0xf] =
                   (uint)(CONCAT35(local_198.data._M_elems[0xf]._1_3_,local_198.data._M_elems._56_5_
                                  ) >> 0x20);
              local_1f8.data._M_elems[8] = local_198.data._M_elems[8];
              local_1f8.data._M_elems[9] = local_198.data._M_elems[9];
              local_1f8.data._M_elems[10] = local_198.data._M_elems[10];
              local_1f8.data._M_elems[0xb] = local_198.data._M_elems[0xb];
              local_1f8.data._M_elems[4] = local_198.data._M_elems[4];
              local_1f8.data._M_elems[5] = local_198.data._M_elems[5];
              local_1f8.data._M_elems[6] = local_198.data._M_elems[6];
              local_1f8.data._M_elems[7] = local_198.data._M_elems[7];
              local_1f8.data._M_elems[0] = local_198.data._M_elems[0];
              local_1f8.data._M_elems[1] = local_198.data._M_elems[1];
              local_1f8.data._M_elems[2] = local_198.data._M_elems[2];
              local_1f8.data._M_elems[3] = local_198.data._M_elems[3];
              local_1f8.exp = local_198.exp;
              local_1f8.neg = local_198.neg;
              local_1f8.fpclass = local_198.fpclass;
              local_1f8.prec_elem = local_198.prec_elem;
              boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                        (&local_1f8,&local_80);
              if (((*(int *)((long)(&pnVar18[0xffffffffffffffff].m_backend.data + 1) + lVar19 + 8U)
                    == 2) || (local_1f8.fpclass == cpp_dec_float_NaN)) ||
                 (iVar14 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                     ((cpp_dec_float<100U,_int,_void> *)
                                      ((long)pnVar18[0xffffffffffffffff].m_backend.data._M_elems +
                                      lVar19),&local_1f8), iVar14 < 1)) {
                pnVar18 = (this->theFvec->
                          super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ).val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                if (((*(int *)((long)(&pnVar18[0xffffffffffffffff].m_backend.data + 1) + lVar19 + 8U
                              ) != 2) && (local_198.fpclass != cpp_dec_float_NaN)) &&
                   (iVar14 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::
                             compare((cpp_dec_float<100U,_int,_void> *)
                                     ((long)pnVar18[0xffffffffffffffff].m_backend.data._M_elems +
                                     lVar19),&local_198), iVar14 < 0)) {
                  pnVar18 = (this->theLBbound).val.
                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                  puVar16 = (undefined8 *)((long)pnVar18[-1].m_backend.data._M_elems + lVar19);
                  local_1f8.fpclass = cpp_dec_float_finite;
                  local_1f8.prec_elem = 0x10;
                  local_1f8.data._M_elems[0] = 0;
                  local_1f8.data._M_elems[1] = 0;
                  local_1f8.data._M_elems[2] = 0;
                  local_1f8.data._M_elems[3] = 0;
                  local_1f8.data._M_elems[4] = 0;
                  local_1f8.data._M_elems[5] = 0;
                  local_1f8.data._M_elems[6] = 0;
                  local_1f8.data._M_elems[7] = 0;
                  local_1f8.data._M_elems[8] = 0;
                  local_1f8.data._M_elems[9] = 0;
                  local_1f8.data._M_elems[10] = 0;
                  local_1f8.data._M_elems[0xb] = 0;
                  local_1f8.data._M_elems[0xc] = 0;
                  local_1f8.data._M_elems[0xd] = 0;
                  local_1f8.data._M_elems[0xe] = 0;
                  local_1f8.data._M_elems[0xf] = 0;
                  local_1f8.exp = 0;
                  local_1f8.neg = false;
                  if ((cpp_dec_float<100U,_int,_void> *)puVar16 != &local_1f8) {
                    local_1f8.data._M_elems[0xc] = (uint)puVar16[6];
                    local_1f8.data._M_elems[0xd] = (uint)((ulong)puVar16[6] >> 0x20);
                    local_1f8.data._M_elems[0xe] = (uint)puVar16[7];
                    local_1f8.data._M_elems[0xf] = (uint)((ulong)puVar16[7] >> 0x20);
                    local_1f8.data._M_elems[8] = (uint)puVar16[4];
                    local_1f8.data._M_elems[9] = (uint)((ulong)puVar16[4] >> 0x20);
                    local_1f8.data._M_elems[10] = (uint)puVar16[5];
                    local_1f8.data._M_elems[0xb] = (uint)((ulong)puVar16[5] >> 0x20);
                    local_1f8.data._M_elems[4] = (uint)puVar16[2];
                    local_1f8.data._M_elems[5] = (uint)((ulong)puVar16[2] >> 0x20);
                    local_1f8.data._M_elems[6] = (uint)puVar16[3];
                    local_1f8.data._M_elems[7] = (uint)((ulong)puVar16[3] >> 0x20);
                    local_1f8.data._M_elems[0] = (uint)*puVar16;
                    local_1f8.data._M_elems[1] = (uint)((ulong)*puVar16 >> 0x20);
                    local_1f8.data._M_elems[2] = (uint)puVar16[1];
                    local_1f8.data._M_elems[3] = (uint)((ulong)puVar16[1] >> 0x20);
                    local_1f8.exp = *(int *)((long)(&pnVar18[-1].m_backend.data + 1) + lVar19);
                    local_1f8.neg = *(bool *)((long)(&pnVar18[-1].m_backend.data + 1) + lVar19 + 4U)
                    ;
                    local_1f8._72_8_ =
                         *(undefined8 *)((long)(&pnVar18[-1].m_backend.data + 1) + lVar19 + 8U);
                  }
                  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                            (&local_1f8,&local_198);
                  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                            (local_1a0,&local_1f8);
                }
              }
              else {
                pnVar18 = (this->theLBbound).val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                puVar16 = (undefined8 *)((long)pnVar18[-1].m_backend.data._M_elems + lVar19 + 0x30);
                *puVar16 = CONCAT44(local_198.data._M_elems[0xd],local_198.data._M_elems[0xc]);
                puVar16[1] = CONCAT35(local_198.data._M_elems[0xf]._1_3_,
                                      local_198.data._M_elems._56_5_);
                puVar16 = (undefined8 *)((long)pnVar18[-1].m_backend.data._M_elems + lVar19 + 0x20);
                *puVar16 = CONCAT44(local_198.data._M_elems[9],local_198.data._M_elems[8]);
                puVar16[1] = CONCAT44(local_198.data._M_elems[0xb],local_198.data._M_elems[10]);
                puVar16 = (undefined8 *)((long)pnVar18[-1].m_backend.data._M_elems + lVar19 + 0x10);
                *puVar16 = CONCAT44(local_198.data._M_elems[5],local_198.data._M_elems[4]);
                puVar16[1] = CONCAT44(local_198.data._M_elems[7],local_198.data._M_elems[6]);
                puVar16 = (undefined8 *)((long)pnVar18[-1].m_backend.data._M_elems + lVar19);
                *puVar16 = CONCAT44(local_198.data._M_elems[1],local_198.data._M_elems[0]);
                puVar16[1] = CONCAT44(local_198.data._M_elems[3],local_198.data._M_elems[2]);
                *(int *)((long)(&pnVar18[-1].m_backend.data + 1) + lVar19) = local_198.exp;
                *(bool *)((long)(&pnVar18[-1].m_backend.data + 1) + lVar19 + 4U) = local_198.neg;
                *(undefined8 *)((long)(&pnVar18[-1].m_backend.data + 1) + lVar19 + 8U) =
                     local_198._72_8_;
              }
            }
            else {
              iVar14 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                 (&local_148,&local_198);
              if (iVar14 != 0) {
                fVar15 = local_148.fpclass;
                iVar20 = local_148.prec_elem;
                goto LAB_003949e9;
              }
              pnVar18 = (this->theUBbound).val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              if (((*(int *)((long)(&pnVar18[-1].m_backend.data + 1) + lVar19 + 8U) == 2) ||
                  (local_148.fpclass == cpp_dec_float_NaN)) ||
                 (iVar14 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                     ((cpp_dec_float<100U,_int,_void> *)
                                      ((long)pnVar18[-1].m_backend.data._M_elems + lVar19),
                                      &local_148), iVar14 < 1)) {
                pnVar18 = (this->theLBbound).val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                if (((*(int *)((long)(&pnVar18[-1].m_backend.data + 1) + lVar19 + 8U) != 2) &&
                    (local_198.fpclass != cpp_dec_float_NaN)) &&
                   (iVar14 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::
                             compare((cpp_dec_float<100U,_int,_void> *)
                                     ((long)pnVar18[-1].m_backend.data._M_elems + lVar19),&local_198
                                    ), iVar14 < 0)) {
                  pcVar21 = (cpp_dec_float<100U,_int,_void> *)
                            ((long)(this->theLBbound).val.
                                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data.
                                   _M_elems + lVar19);
                  local_1f8.fpclass = cpp_dec_float_finite;
                  local_1f8.prec_elem = 0x10;
                  local_1f8.data._M_elems[0] = 0;
                  local_1f8.data._M_elems[1] = 0;
                  local_1f8.data._M_elems[2] = 0;
                  local_1f8.data._M_elems[3] = 0;
                  local_1f8.data._M_elems[4] = 0;
                  local_1f8.data._M_elems[5] = 0;
                  local_1f8.data._M_elems[6] = 0;
                  local_1f8.data._M_elems[7] = 0;
                  local_1f8.data._M_elems[8] = 0;
                  local_1f8.data._M_elems[9] = 0;
                  local_1f8.data._M_elems[10] = 0;
                  local_1f8.data._M_elems[0xb] = 0;
                  local_1f8.data._M_elems[0xc] = 0;
                  local_1f8.data._M_elems[0xd] = 0;
                  local_1f8.data._M_elems[0xe] = 0;
                  local_1f8.data._M_elems[0xf] = 0;
                  local_1f8.exp = 0;
                  local_1f8.neg = false;
                  if (pcVar21 != &local_1f8) {
                    local_1f8.data._M_elems[0xc] = local_198.data._M_elems[0xc];
                    local_1f8.data._M_elems[0xd] = local_198.data._M_elems[0xd];
                    local_1f8.data._M_elems[0xe] = local_198.data._M_elems[0xe];
                    local_1f8.data._M_elems[0xf] =
                         (uint)(CONCAT35(local_198.data._M_elems[0xf]._1_3_,
                                         local_198.data._M_elems._56_5_) >> 0x20);
                    local_1f8.data._M_elems[8] = local_198.data._M_elems[8];
                    local_1f8.data._M_elems[9] = local_198.data._M_elems[9];
                    local_1f8.data._M_elems[10] = local_198.data._M_elems[10];
                    local_1f8.data._M_elems[0xb] = local_198.data._M_elems[0xb];
                    local_1f8.data._M_elems[4] = local_198.data._M_elems[4];
                    local_1f8.data._M_elems[5] = local_198.data._M_elems[5];
                    local_1f8.data._M_elems[6] = local_198.data._M_elems[6];
                    local_1f8.data._M_elems[7] = local_198.data._M_elems[7];
                    local_1f8.data._M_elems[0] = local_198.data._M_elems[0];
                    local_1f8.data._M_elems[1] = local_198.data._M_elems[1];
                    local_1f8.data._M_elems[2] = local_198.data._M_elems[2];
                    local_1f8.data._M_elems[3] = local_198.data._M_elems[3];
                    local_1f8.exp = local_198.exp;
                    local_1f8.neg = local_198.neg;
                    local_1f8.fpclass = local_198.fpclass;
                    local_1f8.prec_elem = local_198.prec_elem;
                    goto LAB_00394ef7;
                  }
                  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                            (&local_1f8,&local_198);
                  if (local_1f8.data._M_elems[0] != 0 || local_1f8.fpclass != cpp_dec_float_finite)
                  {
                    local_1f8.neg = (bool)(local_1f8.neg ^ 1);
                  }
                  goto LAB_00394efc;
                }
              }
              else {
                pnVar18 = (this->theUBbound).val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                puVar16 = (undefined8 *)((long)pnVar18[-1].m_backend.data._M_elems + lVar19);
                local_1f8.fpclass = cpp_dec_float_finite;
                local_1f8.prec_elem = 0x10;
                local_1f8.data._M_elems[0] = 0;
                local_1f8.data._M_elems[1] = 0;
                local_1f8.data._M_elems[2] = 0;
                local_1f8.data._M_elems[3] = 0;
                local_1f8.data._M_elems[4] = 0;
                local_1f8.data._M_elems[5] = 0;
                local_1f8.data._M_elems[6] = 0;
                local_1f8.data._M_elems[7] = 0;
                local_1f8.data._M_elems[8] = 0;
                local_1f8.data._M_elems[9] = 0;
                local_1f8.data._M_elems[10] = 0;
                local_1f8.data._M_elems[0xb] = 0;
                local_1f8.data._M_elems[0xc] = 0;
                local_1f8.data._M_elems[0xd] = 0;
                local_1f8.data._M_elems[0xe] = 0;
                local_1f8.data._M_elems[0xf] = 0;
                local_1f8.exp = 0;
                local_1f8.neg = false;
                if ((cpp_dec_float<100U,_int,_void> *)puVar16 != &local_1f8) {
                  local_1f8.data._M_elems[0xc] = (uint)puVar16[6];
                  local_1f8.data._M_elems[0xd] = (uint)((ulong)puVar16[6] >> 0x20);
                  local_1f8.data._M_elems[0xe] = (uint)puVar16[7];
                  local_1f8.data._M_elems[0xf] = (uint)((ulong)puVar16[7] >> 0x20);
                  local_1f8.data._M_elems[8] = (uint)puVar16[4];
                  local_1f8.data._M_elems[9] = (uint)((ulong)puVar16[4] >> 0x20);
                  local_1f8.data._M_elems[10] = (uint)puVar16[5];
                  local_1f8.data._M_elems[0xb] = (uint)((ulong)puVar16[5] >> 0x20);
                  local_1f8.data._M_elems[4] = (uint)puVar16[2];
                  local_1f8.data._M_elems[5] = (uint)((ulong)puVar16[2] >> 0x20);
                  local_1f8.data._M_elems[6] = (uint)puVar16[3];
                  local_1f8.data._M_elems[7] = (uint)((ulong)puVar16[3] >> 0x20);
                  local_1f8.data._M_elems[0] = (uint)*puVar16;
                  local_1f8.data._M_elems[1] = (uint)((ulong)*puVar16 >> 0x20);
                  local_1f8.data._M_elems[2] = (uint)puVar16[1];
                  local_1f8.data._M_elems[3] = (uint)((ulong)puVar16[1] >> 0x20);
                  local_1f8.exp = *(int *)((long)(&pnVar18[-1].m_backend.data + 1) + lVar19);
                  local_1f8.neg = *(bool *)((long)(&pnVar18[-1].m_backend.data + 1) + lVar19 + 4U);
                  local_1f8._72_8_ =
                       *(undefined8 *)((long)(&pnVar18[-1].m_backend.data + 1) + lVar19 + 8U);
                }
                pcVar21 = &local_148;
LAB_00394ef7:
                boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                          (&local_1f8,pcVar21);
LAB_00394efc:
                boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=
                          (local_1a0,&local_1f8);
              }
            }
            uVar23 = uVar23 - 1;
            lVar19 = lVar19 + -0x50;
          } while (1 < uVar23);
        }
        lVar19 = (long)(this->
                       super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).
                       super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .
                       super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .set.thenum;
        if (0 < lVar19) {
          uVar24 = lVar19 + 1;
          lVar19 = lVar19 * 0x50;
          do {
            if (this->theRep *
                (this->
                super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).thedesc.rowstat.data[uVar24 - 2] < 1) {
              pnVar18 = (this->
                        super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).
                        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        .left.val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              local_148.data._M_elems[0] =
                   *(uint *)((long)pnVar18[-1].m_backend.data._M_elems + lVar19);
              puVar16 = (undefined8 *)((long)pnVar18[-1].m_backend.data._M_elems + lVar19 + 0x30);
              uVar6 = puVar16[1];
              local_1f8.data._M_elems[0xc] = (uint)((ulong)*puVar16 >> 0x20);
              puVar16 = (undefined8 *)((long)pnVar18[-1].m_backend.data._M_elems + lVar19 + 0x24);
              uVar7 = *puVar16;
              uVar8 = puVar16[1];
              local_1f8.data._M_elems[0xb] = (uint)((ulong)uVar8 >> 0x20);
              local_148.data._M_elems[0xc] = local_1f8.data._M_elems[0xb];
              puVar16 = (undefined8 *)((long)pnVar18[-1].m_backend.data._M_elems + lVar19 + 0x14);
              uVar9 = *puVar16;
              uVar10 = puVar16[1];
              puVar16 = (undefined8 *)((long)pnVar18[-1].m_backend.data._M_elems + lVar19 + 4);
              uVar11 = *puVar16;
              uVar12 = puVar16[1];
              local_148.exp = *(int *)((long)(&pnVar18[-1].m_backend.data + 1) + lVar19);
              local_148._72_8_ =
                   *(undefined8 *)((long)(&pnVar18[-1].m_backend.data + 1) + lVar19 + 8U);
              local_148.neg =
                   (bool)((local_148.data._M_elems[0] != 0 ||
                          local_148.fpclass != cpp_dec_float_finite) ^
                         *(byte *)((long)(&pnVar18[-1].m_backend.data + 1) + lVar19 + 4U));
              local_148.data._M_elems[0xd] = local_1f8.data._M_elems[0xc];
              local_148.data._M_elems._56_5_ = SUB85(uVar6,0);
              local_148.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar6 >> 0x28);
              local_148.data._M_elems[9] = (uint)uVar7;
              local_148.data._M_elems[10] = (uint)((ulong)uVar7 >> 0x20);
              local_148.data._M_elems[0xb] = (uint)uVar8;
              local_148.data._M_elems[5] = (uint)uVar9;
              local_148.data._M_elems[6] = (uint)((ulong)uVar9 >> 0x20);
              local_148.data._M_elems[7] = (uint)uVar10;
              local_148.data._M_elems[8] = (uint)((ulong)uVar10 >> 0x20);
              local_148.data._M_elems[1] = (uint)uVar11;
              local_148.data._M_elems[2] = (uint)((ulong)uVar11 >> 0x20);
              local_148.data._M_elems[3] = (uint)uVar12;
              local_148.data._M_elems[4] = (uint)((ulong)uVar12 >> 0x20);
              pnVar18 = (this->
                        super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).
                        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        .right.val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              local_198.data._M_elems[0] =
                   *(uint *)((long)pnVar18[-1].m_backend.data._M_elems + lVar19);
              puVar16 = (undefined8 *)((long)pnVar18[-1].m_backend.data._M_elems + lVar19 + 0x30);
              uVar8 = puVar16[1];
              local_1f8.data._M_elems[0xc] = (uint)((ulong)*puVar16 >> 0x20);
              local_1f8.data._M_elems[0xd] = (uint)uVar8;
              local_1f8.data._M_elems[0xe] = (uint)((ulong)uVar8 >> 0x20);
              puVar16 = (undefined8 *)((long)pnVar18[-1].m_backend.data._M_elems + lVar19 + 0x24);
              uVar6 = *puVar16;
              uVar7 = puVar16[1];
              local_1f8.data._M_elems[8] = (uint)uVar6;
              local_1f8.data._M_elems[9] = (uint)((ulong)uVar6 >> 0x20);
              local_1f8.data._M_elems[10] = (uint)uVar7;
              local_1f8.data._M_elems[0xb] = (uint)((ulong)uVar7 >> 0x20);
              puVar16 = (undefined8 *)((long)pnVar18[-1].m_backend.data._M_elems + lVar19 + 0x14);
              uVar6 = *puVar16;
              uVar7 = puVar16[1];
              local_1f8.data._M_elems[4] = (uint)uVar6;
              local_1f8.data._M_elems[5] = (uint)((ulong)uVar6 >> 0x20);
              local_1f8.data._M_elems[6] = (uint)uVar7;
              local_1f8.data._M_elems[7] = (uint)((ulong)uVar7 >> 0x20);
              puVar16 = (undefined8 *)((long)pnVar18[-1].m_backend.data._M_elems + lVar19 + 4);
              uVar6 = *puVar16;
              uVar7 = puVar16[1];
              local_1f8.data._M_elems[0] = (uint)uVar6;
              local_1f8.data._M_elems[1] = (uint)((ulong)uVar6 >> 0x20);
              local_1f8.data._M_elems[2] = (uint)uVar7;
              local_1f8.data._M_elems[3] = (uint)((ulong)uVar7 >> 0x20);
              local_198.exp = *(int *)((long)(&pnVar18[-1].m_backend.data + 1) + lVar19);
              local_198._72_8_ =
                   *(undefined8 *)((long)(&pnVar18[-1].m_backend.data + 1) + lVar19 + 8U);
              local_198.neg =
                   (bool)((local_198.data._M_elems[0] != 0 ||
                          local_198.fpclass != cpp_dec_float_finite) ^
                         *(byte *)((long)(&pnVar18[-1].m_backend.data + 1) + lVar19 + 4U));
              local_198.data._M_elems[0xd] = local_1f8.data._M_elems[0xc];
              local_198.data._M_elems._56_5_ = SUB85(uVar8,0);
              local_198.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar8 >> 0x28);
              pnVar18 = (this->theURbound).val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              local_198.data._M_elems[1] = local_1f8.data._M_elems[0];
              local_198.data._M_elems[2] = local_1f8.data._M_elems[1];
              local_198.data._M_elems[3] = local_1f8.data._M_elems[2];
              local_198.data._M_elems[4] = local_1f8.data._M_elems[3];
              local_198.data._M_elems[5] = local_1f8.data._M_elems[4];
              local_198.data._M_elems[6] = local_1f8.data._M_elems[5];
              local_198.data._M_elems[7] = local_1f8.data._M_elems[6];
              local_198.data._M_elems[8] = local_1f8.data._M_elems[7];
              local_198.data._M_elems[9] = local_1f8.data._M_elems[8];
              local_198.data._M_elems[10] = local_1f8.data._M_elems[9];
              local_198.data._M_elems[0xb] = local_1f8.data._M_elems[10];
              local_198.data._M_elems[0xc] = local_1f8.data._M_elems[0xb];
              if (((*(int *)((long)(&pnVar18[-1].m_backend.data + 1) + lVar19 + 8U) != 2) &&
                  (local_148.fpclass != cpp_dec_float_NaN)) &&
                 (iVar14 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                     ((cpp_dec_float<100U,_int,_void> *)
                                      ((long)pnVar18[-1].m_backend.data._M_elems + lVar19),
                                      &local_148), 0 < iVar14)) {
                pnVar18 = (this->theURbound).val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                puVar16 = (undefined8 *)((long)pnVar18[-1].m_backend.data._M_elems + lVar19);
                local_1f8.fpclass = cpp_dec_float_finite;
                local_1f8.prec_elem = 0x10;
                local_1f8.data._M_elems[0] = 0;
                local_1f8.data._M_elems[1] = 0;
                local_1f8.data._M_elems[2] = 0;
                local_1f8.data._M_elems[3] = 0;
                local_1f8.data._M_elems[4] = 0;
                local_1f8.data._M_elems[5] = 0;
                local_1f8.data._M_elems[6] = 0;
                local_1f8.data._M_elems[7] = 0;
                local_1f8.data._M_elems[8] = 0;
                local_1f8.data._M_elems[9] = 0;
                local_1f8.data._M_elems[10] = 0;
                local_1f8.data._M_elems[0xb] = 0;
                local_1f8.data._M_elems[0xc] = 0;
                local_1f8.data._M_elems[0xd] = 0;
                local_1f8.data._M_elems[0xe] = 0;
                local_1f8.data._M_elems[0xf] = 0;
                local_1f8.exp = 0;
                local_1f8.neg = false;
                if ((cpp_dec_float<100U,_int,_void> *)puVar16 != &local_1f8) {
                  local_1f8.data._M_elems[0xc] = (uint)puVar16[6];
                  local_1f8.data._M_elems[0xd] = (uint)((ulong)puVar16[6] >> 0x20);
                  local_1f8.data._M_elems[0xe] = (uint)puVar16[7];
                  local_1f8.data._M_elems[0xf] = (uint)((ulong)puVar16[7] >> 0x20);
                  local_1f8.data._M_elems[8] = (uint)puVar16[4];
                  local_1f8.data._M_elems[9] = (uint)((ulong)puVar16[4] >> 0x20);
                  local_1f8.data._M_elems[10] = (uint)puVar16[5];
                  local_1f8.data._M_elems[0xb] = (uint)((ulong)puVar16[5] >> 0x20);
                  local_1f8.data._M_elems[4] = (uint)puVar16[2];
                  local_1f8.data._M_elems[5] = (uint)((ulong)puVar16[2] >> 0x20);
                  local_1f8.data._M_elems[6] = (uint)puVar16[3];
                  local_1f8.data._M_elems[7] = (uint)((ulong)puVar16[3] >> 0x20);
                  local_1f8.data._M_elems[0] = (uint)*puVar16;
                  local_1f8.data._M_elems[1] = (uint)((ulong)*puVar16 >> 0x20);
                  local_1f8.data._M_elems[2] = (uint)puVar16[1];
                  local_1f8.data._M_elems[3] = (uint)((ulong)puVar16[1] >> 0x20);
                  local_1f8.exp = *(int *)((long)(&pnVar18[-1].m_backend.data + 1) + lVar19);
                  local_1f8.neg = *(bool *)((long)(&pnVar18[-1].m_backend.data + 1) + lVar19 + 4U);
                  local_1f8._72_8_ =
                       *(undefined8 *)((long)(&pnVar18[-1].m_backend.data + 1) + lVar19 + 8U);
                }
                boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                          (&local_1f8,&local_148);
                boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=
                          (local_1a0,&local_1f8);
              }
              if (((local_198.fpclass != cpp_dec_float_NaN) &&
                  (pnVar18 = (this->theLRbound).val.
                             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                             ._M_impl.super__Vector_impl_data._M_start,
                  *(int *)((long)(&pnVar18[-1].m_backend.data + 1) + lVar19 + 8U) != 2)) &&
                 (iVar14 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                     (&local_198,
                                      (cpp_dec_float<100U,_int,_void> *)
                                      ((long)pnVar18[-1].m_backend.data._M_elems + lVar19)),
                 0 < iVar14)) {
                pcVar21 = (cpp_dec_float<100U,_int,_void> *)
                          ((long)(this->theLRbound).val.
                                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data.
                                 _M_elems + lVar19);
                local_1f8.fpclass = cpp_dec_float_finite;
                local_1f8.prec_elem = 0x10;
                local_1f8.data._M_elems[0] = 0;
                local_1f8.data._M_elems[1] = 0;
                local_1f8.data._M_elems[2] = 0;
                local_1f8.data._M_elems[3] = 0;
                local_1f8.data._M_elems[4] = 0;
                local_1f8.data._M_elems[5] = 0;
                local_1f8.data._M_elems[6] = 0;
                local_1f8.data._M_elems[7] = 0;
                local_1f8.data._M_elems[8] = 0;
                local_1f8.data._M_elems[9] = 0;
                local_1f8.data._M_elems[10] = 0;
                local_1f8.data._M_elems[0xb] = 0;
                local_1f8.data._M_elems[0xc] = 0;
                local_1f8.data._M_elems[0xd] = 0;
                local_1f8.data._M_elems[0xe] = 0;
                local_1f8.data._M_elems[0xf] = 0;
                local_1f8.exp = 0;
                local_1f8.neg = false;
                if (pcVar21 == &local_1f8) {
                  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                            (&local_1f8,&local_198);
                  if (local_1f8.data._M_elems[0] != 0 || local_1f8.fpclass != cpp_dec_float_finite)
                  {
                    local_1f8.neg = (bool)(local_1f8.neg ^ 1);
                  }
                }
                else {
                  local_1f8.data._M_elems[0xc] = local_198.data._M_elems[0xc];
                  local_1f8.data._M_elems[0xd] = local_198.data._M_elems[0xd];
                  local_1f8.data._M_elems[0xe] = local_198.data._M_elems[0xe];
                  local_1f8.data._M_elems[0xf] =
                       (uint)(CONCAT35(local_198.data._M_elems[0xf]._1_3_,
                                       local_198.data._M_elems._56_5_) >> 0x20);
                  local_1f8.data._M_elems[8] = local_198.data._M_elems[8];
                  local_1f8.data._M_elems[9] = local_198.data._M_elems[9];
                  local_1f8.data._M_elems[10] = local_198.data._M_elems[10];
                  local_1f8.data._M_elems[0xb] = local_198.data._M_elems[0xb];
                  local_1f8.data._M_elems[4] = local_198.data._M_elems[4];
                  local_1f8.data._M_elems[5] = local_198.data._M_elems[5];
                  local_1f8.data._M_elems[6] = local_198.data._M_elems[6];
                  local_1f8.data._M_elems[7] = local_198.data._M_elems[7];
                  local_1f8.data._M_elems[0] = local_198.data._M_elems[0];
                  local_1f8.data._M_elems[1] = local_198.data._M_elems[1];
                  local_1f8.data._M_elems[2] = local_198.data._M_elems[2];
                  local_1f8.data._M_elems[3] = local_198.data._M_elems[3];
                  local_1f8.exp = local_198.exp;
                  local_1f8.neg = local_198.neg;
                  local_1f8.fpclass = local_198.fpclass;
                  local_1f8.prec_elem = local_198.prec_elem;
                  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                            (&local_1f8,pcVar21);
                }
                boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=
                          (local_1a0,&local_1f8);
              }
            }
            uVar24 = uVar24 - 1;
            lVar19 = lVar19 + -0x50;
          } while (1 < uVar24);
        }
        lVar19 = (long)(this->
                       super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).
                       super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .
                       super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .set.thenum;
        if (0 < lVar19) {
          uVar24 = lVar19 + 1;
          lVar19 = lVar19 * 0x50;
          do {
            if (this->theRep *
                (this->
                super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).thedesc.colstat.data[uVar24 - 2] < 1) {
              pnVar18 = (this->
                        super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).
                        super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        .up.val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              puVar16 = (undefined8 *)((long)pnVar18[-1].m_backend.data._M_elems + lVar19);
              uVar6 = *puVar16;
              uVar7 = puVar16[1];
              puVar16 = (undefined8 *)((long)pnVar18[-1].m_backend.data._M_elems + lVar19 + 0x10);
              uVar8 = *puVar16;
              uVar9 = puVar16[1];
              puVar16 = (undefined8 *)((long)pnVar18[-1].m_backend.data._M_elems + lVar19 + 0x20);
              uVar10 = *puVar16;
              uVar11 = puVar16[1];
              puVar16 = (undefined8 *)((long)pnVar18[-1].m_backend.data._M_elems + lVar19 + 0x30);
              uVar12 = *puVar16;
              uVar13 = puVar16[1];
              local_148.data._M_elems[0xc] = (uint)uVar12;
              local_148.data._M_elems[0xd] = (uint)((ulong)uVar12 >> 0x20);
              local_148.data._M_elems._56_5_ = SUB85(uVar13,0);
              local_148.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar13 >> 0x28);
              local_148.data._M_elems[8] = (uint)uVar10;
              local_148.data._M_elems[9] = (uint)((ulong)uVar10 >> 0x20);
              local_148.data._M_elems[10] = (uint)uVar11;
              local_148.data._M_elems[0xb] = (uint)((ulong)uVar11 >> 0x20);
              local_148.data._M_elems[4] = (uint)uVar8;
              local_148.data._M_elems[5] = (uint)((ulong)uVar8 >> 0x20);
              local_148.data._M_elems[6] = (uint)uVar9;
              local_148.data._M_elems[7] = (uint)((ulong)uVar9 >> 0x20);
              local_148.data._M_elems[0] = (uint)uVar6;
              local_148.data._M_elems[1] = (uint)((ulong)uVar6 >> 0x20);
              local_148.data._M_elems[2] = (uint)uVar7;
              local_148.data._M_elems[3] = (uint)((ulong)uVar7 >> 0x20);
              local_148.exp = *(int *)((long)(&pnVar18[-1].m_backend.data + 1) + lVar19);
              local_148.neg = *(bool *)((long)(&pnVar18[-1].m_backend.data + 1) + lVar19 + 4U);
              local_148._72_8_ =
                   *(undefined8 *)((long)(&pnVar18[-1].m_backend.data + 1) + lVar19 + 8U);
              pnVar18 = (this->
                        super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).
                        super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        .low.val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              puVar16 = (undefined8 *)((long)pnVar18[-1].m_backend.data._M_elems + lVar19);
              uVar6 = *puVar16;
              uVar7 = puVar16[1];
              puVar16 = (undefined8 *)((long)pnVar18[-1].m_backend.data._M_elems + lVar19 + 0x10);
              uVar8 = *puVar16;
              uVar9 = puVar16[1];
              puVar16 = (undefined8 *)((long)pnVar18[-1].m_backend.data._M_elems + lVar19 + 0x20);
              uVar10 = *puVar16;
              uVar11 = puVar16[1];
              puVar16 = (undefined8 *)((long)pnVar18[-1].m_backend.data._M_elems + lVar19 + 0x30);
              uVar12 = *puVar16;
              uVar13 = puVar16[1];
              local_198.data._M_elems[0xc] = (uint)uVar12;
              local_198.data._M_elems[0xd] = (uint)((ulong)uVar12 >> 0x20);
              local_198.data._M_elems._56_5_ = SUB85(uVar13,0);
              local_198.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar13 >> 0x28);
              local_198.data._M_elems[8] = (uint)uVar10;
              local_198.data._M_elems[9] = (uint)((ulong)uVar10 >> 0x20);
              local_198.data._M_elems[10] = (uint)uVar11;
              local_198.data._M_elems[0xb] = (uint)((ulong)uVar11 >> 0x20);
              local_198.data._M_elems[4] = (uint)uVar8;
              local_198.data._M_elems[5] = (uint)((ulong)uVar8 >> 0x20);
              local_198.data._M_elems[6] = (uint)uVar9;
              local_198.data._M_elems[7] = (uint)((ulong)uVar9 >> 0x20);
              local_198.data._M_elems[0] = (uint)uVar6;
              local_198.data._M_elems[1] = (uint)((ulong)uVar6 >> 0x20);
              local_198.data._M_elems[2] = (uint)uVar7;
              local_198.data._M_elems[3] = (uint)((ulong)uVar7 >> 0x20);
              local_198.exp = *(int *)((long)(&pnVar18[-1].m_backend.data + 1) + lVar19);
              local_198.neg = *(bool *)((long)(&pnVar18[-1].m_backend.data + 1) + lVar19 + 4U);
              local_198._72_8_ =
                   *(undefined8 *)((long)(&pnVar18[-1].m_backend.data + 1) + lVar19 + 8U);
              pnVar18 = (this->theUCbound).val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              if (((*(int *)((long)(&pnVar18[-1].m_backend.data + 1) + lVar19 + 8U) != 2) &&
                  (local_148.fpclass != cpp_dec_float_NaN)) &&
                 (iVar14 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                     ((cpp_dec_float<100U,_int,_void> *)
                                      ((long)pnVar18[-1].m_backend.data._M_elems + lVar19),
                                      &local_148), 0 < iVar14)) {
                pnVar18 = (this->theUCbound).val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                puVar16 = (undefined8 *)((long)pnVar18[-1].m_backend.data._M_elems + lVar19);
                local_1f8.fpclass = cpp_dec_float_finite;
                local_1f8.prec_elem = 0x10;
                local_1f8.data._M_elems[0] = 0;
                local_1f8.data._M_elems[1] = 0;
                local_1f8.data._M_elems[2] = 0;
                local_1f8.data._M_elems[3] = 0;
                local_1f8.data._M_elems[4] = 0;
                local_1f8.data._M_elems[5] = 0;
                local_1f8.data._M_elems[6] = 0;
                local_1f8.data._M_elems[7] = 0;
                local_1f8.data._M_elems[8] = 0;
                local_1f8.data._M_elems[9] = 0;
                local_1f8.data._M_elems[10] = 0;
                local_1f8.data._M_elems[0xb] = 0;
                local_1f8.data._M_elems[0xc] = 0;
                local_1f8.data._M_elems[0xd] = 0;
                local_1f8.data._M_elems[0xe] = 0;
                local_1f8.data._M_elems[0xf] = 0;
                local_1f8.exp = 0;
                local_1f8.neg = false;
                if ((cpp_dec_float<100U,_int,_void> *)puVar16 != &local_1f8) {
                  local_1f8.data._M_elems[0xc] = (uint)puVar16[6];
                  local_1f8.data._M_elems[0xd] = (uint)((ulong)puVar16[6] >> 0x20);
                  local_1f8.data._M_elems[0xe] = (uint)puVar16[7];
                  local_1f8.data._M_elems[0xf] = (uint)((ulong)puVar16[7] >> 0x20);
                  local_1f8.data._M_elems[8] = (uint)puVar16[4];
                  local_1f8.data._M_elems[9] = (uint)((ulong)puVar16[4] >> 0x20);
                  local_1f8.data._M_elems[10] = (uint)puVar16[5];
                  local_1f8.data._M_elems[0xb] = (uint)((ulong)puVar16[5] >> 0x20);
                  local_1f8.data._M_elems[4] = (uint)puVar16[2];
                  local_1f8.data._M_elems[5] = (uint)((ulong)puVar16[2] >> 0x20);
                  local_1f8.data._M_elems[6] = (uint)puVar16[3];
                  local_1f8.data._M_elems[7] = (uint)((ulong)puVar16[3] >> 0x20);
                  local_1f8.data._M_elems[0] = (uint)*puVar16;
                  local_1f8.data._M_elems[1] = (uint)((ulong)*puVar16 >> 0x20);
                  local_1f8.data._M_elems[2] = (uint)puVar16[1];
                  local_1f8.data._M_elems[3] = (uint)((ulong)puVar16[1] >> 0x20);
                  local_1f8.exp = *(int *)((long)(&pnVar18[-1].m_backend.data + 1) + lVar19);
                  local_1f8.neg = *(bool *)((long)(&pnVar18[-1].m_backend.data + 1) + lVar19 + 4U);
                  local_1f8._72_8_ =
                       *(undefined8 *)((long)(&pnVar18[-1].m_backend.data + 1) + lVar19 + 8U);
                }
                boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                          (&local_1f8,&local_148);
                boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=
                          (local_1a0,&local_1f8);
              }
              if (((local_198.fpclass != cpp_dec_float_NaN) &&
                  (pnVar18 = (this->theLCbound).val.
                             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                             ._M_impl.super__Vector_impl_data._M_start,
                  *(int *)((long)(&pnVar18[-1].m_backend.data + 1) + lVar19 + 8U) != 2)) &&
                 (iVar14 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                     (&local_198,
                                      (cpp_dec_float<100U,_int,_void> *)
                                      ((long)pnVar18[-1].m_backend.data._M_elems + lVar19)),
                 0 < iVar14)) {
                pcVar21 = (cpp_dec_float<100U,_int,_void> *)
                          ((long)(this->theLCbound).val.
                                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data.
                                 _M_elems + lVar19);
                local_1f8.fpclass = cpp_dec_float_finite;
                local_1f8.prec_elem = 0x10;
                local_1f8.data._M_elems[0] = 0;
                local_1f8.data._M_elems[1] = 0;
                local_1f8.data._M_elems[2] = 0;
                local_1f8.data._M_elems[3] = 0;
                local_1f8.data._M_elems[4] = 0;
                local_1f8.data._M_elems[5] = 0;
                local_1f8.data._M_elems[6] = 0;
                local_1f8.data._M_elems[7] = 0;
                local_1f8.data._M_elems[8] = 0;
                local_1f8.data._M_elems[9] = 0;
                local_1f8.data._M_elems[10] = 0;
                local_1f8.data._M_elems[0xb] = 0;
                local_1f8.data._M_elems[0xc] = 0;
                local_1f8.data._M_elems[0xd] = 0;
                local_1f8.data._M_elems[0xe] = 0;
                local_1f8.data._M_elems[0xf] = 0;
                local_1f8.exp = 0;
                local_1f8.neg = false;
                if (pcVar21 == &local_1f8) {
                  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                            (&local_1f8,&local_198);
                  if (local_1f8.data._M_elems[0] != 0 || local_1f8.fpclass != cpp_dec_float_finite)
                  {
                    local_1f8.neg = (bool)(local_1f8.neg ^ 1);
                  }
                }
                else {
                  local_1f8.data._M_elems[0xc] = local_198.data._M_elems[0xc];
                  local_1f8.data._M_elems[0xd] = local_198.data._M_elems[0xd];
                  local_1f8.data._M_elems[0xe] = local_198.data._M_elems[0xe];
                  local_1f8.data._M_elems[0xf] =
                       (uint)(CONCAT35(local_198.data._M_elems[0xf]._1_3_,
                                       local_198.data._M_elems._56_5_) >> 0x20);
                  local_1f8.data._M_elems[8] = local_198.data._M_elems[8];
                  local_1f8.data._M_elems[9] = local_198.data._M_elems[9];
                  local_1f8.data._M_elems[10] = local_198.data._M_elems[10];
                  local_1f8.data._M_elems[0xb] = local_198.data._M_elems[0xb];
                  local_1f8.data._M_elems[4] = local_198.data._M_elems[4];
                  local_1f8.data._M_elems[5] = local_198.data._M_elems[5];
                  local_1f8.data._M_elems[6] = local_198.data._M_elems[6];
                  local_1f8.data._M_elems[7] = local_198.data._M_elems[7];
                  local_1f8.data._M_elems[0] = local_198.data._M_elems[0];
                  local_1f8.data._M_elems[1] = local_198.data._M_elems[1];
                  local_1f8.data._M_elems[2] = local_198.data._M_elems[2];
                  local_1f8.data._M_elems[3] = local_198.data._M_elems[3];
                  local_1f8.exp = local_198.exp;
                  local_1f8.neg = local_198.neg;
                  local_1f8.fpclass = local_198.fpclass;
                  local_1f8.prec_elem = local_198.prec_elem;
                  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                            (&local_1f8,pcVar21);
                }
                boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=
                          (local_1a0,&local_1f8);
              }
            }
            uVar24 = uVar24 - 1;
            lVar19 = lVar19 + -0x50;
          } while (1 < uVar24);
        }
      }
      else {
        if (0 < (int)uVar2) {
          uVar23 = uVar24 + 1;
          lVar19 = uVar24 * 0x50;
          local_98 = &(this->
                      super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).
                      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .
                      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .set;
          local_a0 = &(this->
                      super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).
                      super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .
                      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .set;
          local_88 = &(this->
                      super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).thedesc.colstat.data;
          local_90 = &(this->
                      super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).thedesc.rowstat.data;
          do {
            local_f8.data._M_elems._0_8_ =
                 (this->
                 super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).theBaseId.data[uVar23 - 2].super_DataKey;
            pCVar22 = local_a0;
            if (local_f8.data._M_elems[0] < 1) {
              pCVar22 = local_98;
            }
            iVar14 = ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
                     ::number(pCVar22,(DataKey *)&local_f8);
            boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=(&local_198,0)
            ;
            local_148.data._M_elems[0] = local_198.data._M_elems[0];
            local_148.data._M_elems[1] = local_198.data._M_elems[1];
            local_148.data._M_elems[2] = local_198.data._M_elems[2];
            local_148.data._M_elems[3] = local_198.data._M_elems[3];
            local_148.data._M_elems[4] = local_198.data._M_elems[4];
            local_148.data._M_elems[5] = local_198.data._M_elems[5];
            local_148.data._M_elems[6] = local_198.data._M_elems[6];
            local_148.data._M_elems[7] = local_198.data._M_elems[7];
            local_148.data._M_elems[8] = local_198.data._M_elems[8];
            local_148.data._M_elems[9] = local_198.data._M_elems[9];
            local_148.data._M_elems[10] = local_198.data._M_elems[10];
            local_148.data._M_elems[0xb] = local_198.data._M_elems[0xb];
            local_148.data._M_elems[0xc] = local_198.data._M_elems[0xc];
            local_148.data._M_elems[0xd] = local_198.data._M_elems[0xd];
            local_148.data._M_elems._56_5_ = local_198.data._M_elems._56_5_;
            local_148.data._M_elems[0xf]._1_3_ = local_198.data._M_elems[0xf]._1_3_;
            local_148.exp = local_198.exp;
            local_148.neg = local_198.neg;
            local_148.fpclass = local_198.fpclass;
            local_148.prec_elem = local_198.prec_elem;
            ppSVar17 = local_88;
            if ((int)local_f8.data._M_elems[0] < 0) {
              ppSVar17 = local_90;
            }
            clearDualBounds(this,(*ppSVar17)[iVar14],
                            (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)&local_148,
                            (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)&local_198);
            pnVar18 = (this->theUBbound).val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            iVar14 = *(int *)((long)(pnVar18->m_backend).data._M_elems + lVar19 + -8);
            if ((iVar14 == 2) ||
               (pnVar4 = (this->theLBbound).val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start,
               *(int *)((long)(pnVar4->m_backend).data._M_elems + lVar19 + -8) == 2)) {
LAB_0039689c:
              if ((iVar14 != 2) && (local_148.fpclass != cpp_dec_float_NaN)) {
                iVar14 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                   ((cpp_dec_float<100U,_int,_void> *)
                                    ((long)pnVar18[-1].m_backend.data._M_elems + lVar19),&local_148)
                ;
                pnVar18 = (this->theUBbound).val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                if (0 < iVar14) {
                  puVar16 = (undefined8 *)((long)pnVar18[-1].m_backend.data._M_elems + lVar19);
                  local_1f8.fpclass = cpp_dec_float_finite;
                  local_1f8.prec_elem = 0x10;
                  local_1f8.data._M_elems[0] = 0;
                  local_1f8.data._M_elems[1] = 0;
                  local_1f8.data._M_elems[2] = 0;
                  local_1f8.data._M_elems[3] = 0;
                  local_1f8.data._M_elems[4] = 0;
                  local_1f8.data._M_elems[5] = 0;
                  local_1f8.data._M_elems[6] = 0;
                  local_1f8.data._M_elems[7] = 0;
                  local_1f8.data._M_elems[8] = 0;
                  local_1f8.data._M_elems[9] = 0;
                  local_1f8.data._M_elems[10] = 0;
                  local_1f8.data._M_elems[0xb] = 0;
                  local_1f8.data._M_elems[0xc] = 0;
                  local_1f8.data._M_elems[0xd] = 0;
                  local_1f8.data._M_elems[0xe] = 0;
                  local_1f8.data._M_elems[0xf] = 0;
                  local_1f8.exp = 0;
                  local_1f8.neg = false;
                  if ((cpp_dec_float<100U,_int,_void> *)puVar16 != &local_1f8) {
                    uVar6 = *puVar16;
                    uVar7 = *(undefined8 *)
                             ((long)(pnVar18->m_backend).data._M_elems + lVar19 + -0x48);
                    uVar8 = *(undefined8 *)((long)(&(pnVar18->m_backend).data + -1) + lVar19);
                    uVar9 = *(undefined8 *)
                             ((long)(pnVar18->m_backend).data._M_elems + lVar19 + -0x38);
                    uVar10 = *(undefined8 *)
                              ((long)(pnVar18->m_backend).data._M_elems + lVar19 + -0x30);
                    uVar11 = *(undefined8 *)
                              ((long)(pnVar18->m_backend).data._M_elems + lVar19 + -0x28);
                    uVar12 = *(undefined8 *)
                              ((long)(pnVar18->m_backend).data._M_elems + lVar19 + -0x20);
                    uVar13 = *(undefined8 *)
                              ((long)(pnVar18->m_backend).data._M_elems + lVar19 + -0x18);
                    local_1f8.data._M_elems[0xc] = (uint)uVar12;
                    local_1f8.data._M_elems[0xd] = (uint)((ulong)uVar12 >> 0x20);
                    local_1f8.data._M_elems[0xe] = (uint)uVar13;
                    local_1f8.data._M_elems[0xf] = (uint)((ulong)uVar13 >> 0x20);
                    local_1f8.data._M_elems[8] = (uint)uVar10;
                    local_1f8.data._M_elems[9] = (uint)((ulong)uVar10 >> 0x20);
                    local_1f8.data._M_elems[10] = (uint)uVar11;
                    local_1f8.data._M_elems[0xb] = (uint)((ulong)uVar11 >> 0x20);
                    local_1f8.data._M_elems[4] = (uint)uVar8;
                    local_1f8.data._M_elems[5] = (uint)((ulong)uVar8 >> 0x20);
                    local_1f8.data._M_elems[6] = (uint)uVar9;
                    local_1f8.data._M_elems[7] = (uint)((ulong)uVar9 >> 0x20);
                    local_1f8.data._M_elems[0] = (uint)uVar6;
                    local_1f8.data._M_elems[1] = (uint)((ulong)uVar6 >> 0x20);
                    local_1f8.data._M_elems[2] = (uint)uVar7;
                    local_1f8.data._M_elems[3] = (uint)((ulong)uVar7 >> 0x20);
                    local_1f8.exp =
                         *(int *)((long)(pnVar18->m_backend).data._M_elems + lVar19 + -0x10);
                    local_1f8.neg =
                         *(bool *)((long)(pnVar18->m_backend).data._M_elems + lVar19 + -0xc);
                    local_1f8._72_8_ =
                         *(undefined8 *)((long)(pnVar18->m_backend).data._M_elems + lVar19 + -8);
                  }
                  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                            (&local_1f8,&local_148);
                  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=
                            (local_1a0,&local_1f8);
                  goto LAB_00396a16;
                }
              }
              puVar16 = (undefined8 *)((long)pnVar18[-1].m_backend.data._M_elems + lVar19);
              local_1f8.fpclass = cpp_dec_float_finite;
              local_1f8.prec_elem = 0x10;
              local_1f8.data._M_elems[0] = 0;
              local_1f8.data._M_elems[1] = 0;
              local_1f8.data._M_elems[2] = 0;
              local_1f8.data._M_elems[3] = 0;
              local_1f8.data._M_elems[4] = 0;
              local_1f8.data._M_elems[5] = 0;
              local_1f8.data._M_elems[6] = 0;
              local_1f8.data._M_elems[7] = 0;
              local_1f8.data._M_elems[8] = 0;
              local_1f8.data._M_elems[9] = 0;
              local_1f8.data._M_elems[10] = 0;
              local_1f8.data._M_elems[0xb] = 0;
              local_1f8.data._M_elems[0xc] = 0;
              local_1f8.data._M_elems[0xd] = 0;
              local_1f8.data._M_elems[0xe] = 0;
              local_1f8.data._M_elems[0xf] = 0;
              local_1f8.exp = 0;
              local_1f8.neg = false;
              if ((cpp_dec_float<100U,_int,_void> *)puVar16 != &local_1f8) {
                uVar6 = *puVar16;
                uVar7 = *(undefined8 *)((long)(pnVar18->m_backend).data._M_elems + lVar19 + -0x48);
                uVar8 = *(undefined8 *)((long)(&(pnVar18->m_backend).data + -1) + lVar19);
                uVar9 = *(undefined8 *)((long)(pnVar18->m_backend).data._M_elems + lVar19 + -0x38);
                uVar10 = *(undefined8 *)((long)(pnVar18->m_backend).data._M_elems + lVar19 + -0x30);
                uVar11 = *(undefined8 *)((long)(pnVar18->m_backend).data._M_elems + lVar19 + -0x28);
                uVar12 = *(undefined8 *)((long)(pnVar18->m_backend).data._M_elems + lVar19 + -0x20);
                uVar13 = *(undefined8 *)((long)(pnVar18->m_backend).data._M_elems + lVar19 + -0x18);
                local_1f8.data._M_elems[0xc] = (uint)uVar12;
                local_1f8.data._M_elems[0xd] = (uint)((ulong)uVar12 >> 0x20);
                local_1f8.data._M_elems[0xe] = (uint)uVar13;
                local_1f8.data._M_elems[0xf] = (uint)((ulong)uVar13 >> 0x20);
                local_1f8.data._M_elems[8] = (uint)uVar10;
                local_1f8.data._M_elems[9] = (uint)((ulong)uVar10 >> 0x20);
                local_1f8.data._M_elems[10] = (uint)uVar11;
                local_1f8.data._M_elems[0xb] = (uint)((ulong)uVar11 >> 0x20);
                local_1f8.data._M_elems[4] = (uint)uVar8;
                local_1f8.data._M_elems[5] = (uint)((ulong)uVar8 >> 0x20);
                local_1f8.data._M_elems[6] = (uint)uVar9;
                local_1f8.data._M_elems[7] = (uint)((ulong)uVar9 >> 0x20);
                local_1f8.data._M_elems[0] = (uint)uVar6;
                local_1f8.data._M_elems[1] = (uint)((ulong)uVar6 >> 0x20);
                local_1f8.data._M_elems[2] = (uint)uVar7;
                local_1f8.data._M_elems[3] = (uint)((ulong)uVar7 >> 0x20);
                local_1f8.exp = *(int *)((long)(pnVar18->m_backend).data._M_elems + lVar19 + -0x10);
                local_1f8.neg = *(bool *)((long)(pnVar18->m_backend).data._M_elems + lVar19 + -0xc);
                local_1f8._72_8_ =
                     *(undefined8 *)((long)(pnVar18->m_backend).data._M_elems + lVar19 + -8);
              }
              pcVar21 = &local_148;
LAB_00396a04:
              boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                        (&local_1f8,pcVar21);
              boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                        (local_1a0,&local_1f8);
            }
            else {
              iVar14 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                 ((cpp_dec_float<100U,_int,_void> *)
                                  ((long)pnVar18[-1].m_backend.data._M_elems + lVar19),
                                  (cpp_dec_float<100U,_int,_void> *)
                                  ((long)pnVar4[-1].m_backend.data._M_elems + lVar19));
              if (iVar14 != 0) {
                pnVar18 = (this->theUBbound).val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                iVar14 = *(int *)((long)(pnVar18->m_backend).data._M_elems + lVar19 + -8);
                goto LAB_0039689c;
              }
              pnVar18 = (this->theFvec->
                        super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              local_1f8.data._M_elems[0xc] = local_148.data._M_elems[0xc];
              local_1f8.data._M_elems[0xd] = local_148.data._M_elems[0xd];
              local_1f8.data._M_elems[0xe] = local_148.data._M_elems[0xe];
              local_1f8.data._M_elems[0xf] =
                   (uint)(CONCAT35(local_148.data._M_elems[0xf]._1_3_,local_148.data._M_elems._56_5_
                                  ) >> 0x20);
              local_1f8.data._M_elems[8] = local_148.data._M_elems[8];
              local_1f8.data._M_elems[9] = local_148.data._M_elems[9];
              local_1f8.data._M_elems[10] = local_148.data._M_elems[10];
              local_1f8.data._M_elems[0xb] = local_148.data._M_elems[0xb];
              local_1f8.data._M_elems[4] = local_148.data._M_elems[4];
              local_1f8.data._M_elems[5] = local_148.data._M_elems[5];
              local_1f8.data._M_elems[6] = local_148.data._M_elems[6];
              local_1f8.data._M_elems[7] = local_148.data._M_elems[7];
              local_1f8.data._M_elems[0] = local_148.data._M_elems[0];
              local_1f8.data._M_elems[1] = local_148.data._M_elems[1];
              local_1f8.data._M_elems[2] = local_148.data._M_elems[2];
              local_1f8.data._M_elems[3] = local_148.data._M_elems[3];
              local_1f8.exp = local_148.exp;
              local_1f8.neg = local_148.neg;
              local_1f8.fpclass = local_148.fpclass;
              local_1f8.prec_elem = local_148.prec_elem;
              boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                        (&local_1f8,&local_80);
              if (((*(int *)((long)(pnVar18->m_backend).data._M_elems + lVar19 + -8) == 2) ||
                  (local_1f8.fpclass == cpp_dec_float_NaN)) ||
                 (iVar14 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                     ((cpp_dec_float<100U,_int,_void> *)
                                      ((long)pnVar18[0xffffffffffffffff].m_backend.data._M_elems +
                                      lVar19),&local_1f8), -1 < iVar14)) {
                pnVar18 = (this->theFvec->
                          super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ).val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                if (((*(int *)((long)(pnVar18->m_backend).data._M_elems + lVar19 + -8) != 2) &&
                    (local_148.fpclass != cpp_dec_float_NaN)) &&
                   (iVar14 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::
                             compare((cpp_dec_float<100U,_int,_void> *)
                                     ((long)pnVar18[0xffffffffffffffff].m_backend.data._M_elems +
                                     lVar19),&local_148), 0 < iVar14)) {
                  pnVar18 = (this->theUBbound).val.
                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                  puVar16 = (undefined8 *)((long)pnVar18[-1].m_backend.data._M_elems + lVar19);
                  local_1f8.fpclass = cpp_dec_float_finite;
                  local_1f8.prec_elem = 0x10;
                  local_1f8.data._M_elems[0] = 0;
                  local_1f8.data._M_elems[1] = 0;
                  local_1f8.data._M_elems[2] = 0;
                  local_1f8.data._M_elems[3] = 0;
                  local_1f8.data._M_elems[4] = 0;
                  local_1f8.data._M_elems[5] = 0;
                  local_1f8.data._M_elems[6] = 0;
                  local_1f8.data._M_elems[7] = 0;
                  local_1f8.data._M_elems[8] = 0;
                  local_1f8.data._M_elems[9] = 0;
                  local_1f8.data._M_elems[10] = 0;
                  local_1f8.data._M_elems[0xb] = 0;
                  local_1f8.data._M_elems[0xc] = 0;
                  local_1f8.data._M_elems[0xd] = 0;
                  local_1f8.data._M_elems[0xe] = 0;
                  local_1f8.data._M_elems[0xf] = 0;
                  local_1f8.exp = 0;
                  local_1f8.neg = false;
                  if ((cpp_dec_float<100U,_int,_void> *)puVar16 != &local_1f8) {
                    uVar6 = *puVar16;
                    uVar7 = *(undefined8 *)
                             ((long)(pnVar18->m_backend).data._M_elems + lVar19 + -0x48);
                    uVar8 = *(undefined8 *)((long)(&(pnVar18->m_backend).data + -1) + lVar19);
                    uVar9 = *(undefined8 *)
                             ((long)(pnVar18->m_backend).data._M_elems + lVar19 + -0x38);
                    uVar10 = *(undefined8 *)
                              ((long)(pnVar18->m_backend).data._M_elems + lVar19 + -0x30);
                    uVar11 = *(undefined8 *)
                              ((long)(pnVar18->m_backend).data._M_elems + lVar19 + -0x28);
                    uVar12 = *(undefined8 *)
                              ((long)(pnVar18->m_backend).data._M_elems + lVar19 + -0x20);
                    uVar13 = *(undefined8 *)
                              ((long)(pnVar18->m_backend).data._M_elems + lVar19 + -0x18);
                    local_1f8.data._M_elems[0xc] = (uint)uVar12;
                    local_1f8.data._M_elems[0xd] = (uint)((ulong)uVar12 >> 0x20);
                    local_1f8.data._M_elems[0xe] = (uint)uVar13;
                    local_1f8.data._M_elems[0xf] = (uint)((ulong)uVar13 >> 0x20);
                    local_1f8.data._M_elems[8] = (uint)uVar10;
                    local_1f8.data._M_elems[9] = (uint)((ulong)uVar10 >> 0x20);
                    local_1f8.data._M_elems[10] = (uint)uVar11;
                    local_1f8.data._M_elems[0xb] = (uint)((ulong)uVar11 >> 0x20);
                    local_1f8.data._M_elems[4] = (uint)uVar8;
                    local_1f8.data._M_elems[5] = (uint)((ulong)uVar8 >> 0x20);
                    local_1f8.data._M_elems[6] = (uint)uVar9;
                    local_1f8.data._M_elems[7] = (uint)((ulong)uVar9 >> 0x20);
                    local_1f8.data._M_elems[0] = (uint)uVar6;
                    local_1f8.data._M_elems[1] = (uint)((ulong)uVar6 >> 0x20);
                    local_1f8.data._M_elems[2] = (uint)uVar7;
                    local_1f8.data._M_elems[3] = (uint)((ulong)uVar7 >> 0x20);
                    local_1f8.exp =
                         *(int *)((long)(pnVar18->m_backend).data._M_elems + lVar19 + -0x10);
                    local_1f8.neg =
                         *(bool *)((long)(pnVar18->m_backend).data._M_elems + lVar19 + -0xc);
                    local_1f8._72_8_ =
                         *(undefined8 *)((long)(pnVar18->m_backend).data._M_elems + lVar19 + -8);
                  }
                  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                            (&local_1f8,&local_148);
                  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=
                            (local_1a0,&local_1f8);
                }
              }
              else {
                pnVar18 = (this->theUBbound).val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                puVar16 = (undefined8 *)((long)(pnVar18->m_backend).data._M_elems + lVar19 + -0x20);
                *puVar16 = CONCAT44(local_148.data._M_elems[0xd],local_148.data._M_elems[0xc]);
                puVar16[1] = CONCAT35(local_148.data._M_elems[0xf]._1_3_,
                                      local_148.data._M_elems._56_5_);
                puVar16 = (undefined8 *)((long)(pnVar18->m_backend).data._M_elems + lVar19 + -0x30);
                *puVar16 = CONCAT44(local_148.data._M_elems[9],local_148.data._M_elems[8]);
                puVar16[1] = CONCAT44(local_148.data._M_elems[0xb],local_148.data._M_elems[10]);
                puVar16 = (undefined8 *)((long)(&(pnVar18->m_backend).data + -1) + lVar19);
                *puVar16 = CONCAT44(local_148.data._M_elems[5],local_148.data._M_elems[4]);
                puVar16[1] = CONCAT44(local_148.data._M_elems[7],local_148.data._M_elems[6]);
                puVar16 = (undefined8 *)((long)pnVar18[-1].m_backend.data._M_elems + lVar19);
                *puVar16 = CONCAT44(local_148.data._M_elems[1],local_148.data._M_elems[0]);
                puVar16[1] = CONCAT44(local_148.data._M_elems[3],local_148.data._M_elems[2]);
                *(int *)((long)(pnVar18->m_backend).data._M_elems + lVar19 + -0x10) = local_148.exp;
                *(bool *)((long)(pnVar18->m_backend).data._M_elems + lVar19 + -0xc) = local_148.neg;
                *(undefined8 *)((long)(pnVar18->m_backend).data._M_elems + lVar19 + -8) =
                     local_148._72_8_;
              }
              pnVar18 = (this->theFvec->
                        super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              local_1f8.data._M_elems[0xc] = local_198.data._M_elems[0xc];
              local_1f8.data._M_elems[0xd] = local_198.data._M_elems[0xd];
              local_1f8.data._M_elems[0xe] = local_198.data._M_elems[0xe];
              local_1f8.data._M_elems[0xf] =
                   (uint)(CONCAT35(local_198.data._M_elems[0xf]._1_3_,local_198.data._M_elems._56_5_
                                  ) >> 0x20);
              local_1f8.data._M_elems[8] = local_198.data._M_elems[8];
              local_1f8.data._M_elems[9] = local_198.data._M_elems[9];
              local_1f8.data._M_elems[10] = local_198.data._M_elems[10];
              local_1f8.data._M_elems[0xb] = local_198.data._M_elems[0xb];
              local_1f8.data._M_elems[4] = local_198.data._M_elems[4];
              local_1f8.data._M_elems[5] = local_198.data._M_elems[5];
              local_1f8.data._M_elems[6] = local_198.data._M_elems[6];
              local_1f8.data._M_elems[7] = local_198.data._M_elems[7];
              local_1f8.data._M_elems[0] = local_198.data._M_elems[0];
              local_1f8.data._M_elems[1] = local_198.data._M_elems[1];
              local_1f8.data._M_elems[2] = local_198.data._M_elems[2];
              local_1f8.data._M_elems[3] = local_198.data._M_elems[3];
              local_1f8.exp = local_198.exp;
              local_1f8.neg = local_198.neg;
              local_1f8.fpclass = local_198.fpclass;
              local_1f8.prec_elem = local_198.prec_elem;
              boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=
                        (&local_1f8,&local_80);
              if (((*(int *)((long)(pnVar18->m_backend).data._M_elems + lVar19 + -8) == 2) ||
                  (local_1f8.fpclass == cpp_dec_float_NaN)) ||
                 (iVar14 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                     ((cpp_dec_float<100U,_int,_void> *)
                                      ((long)pnVar18[0xffffffffffffffff].m_backend.data._M_elems +
                                      lVar19),&local_1f8), iVar14 < 1)) {
                pnVar18 = (this->theFvec->
                          super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ).val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                if (((*(int *)((long)(pnVar18->m_backend).data._M_elems + lVar19 + -8) == 2) ||
                    (local_198.fpclass == cpp_dec_float_NaN)) ||
                   (iVar14 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::
                             compare((cpp_dec_float<100U,_int,_void> *)
                                     ((long)pnVar18[0xffffffffffffffff].m_backend.data._M_elems +
                                     lVar19),&local_198), -1 < iVar14)) goto LAB_00396a16;
                pnVar18 = (this->theLBbound).val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                puVar16 = (undefined8 *)((long)pnVar18[-1].m_backend.data._M_elems + lVar19);
                local_1f8.fpclass = cpp_dec_float_finite;
                local_1f8.prec_elem = 0x10;
                local_1f8.data._M_elems[0] = 0;
                local_1f8.data._M_elems[1] = 0;
                local_1f8.data._M_elems[2] = 0;
                local_1f8.data._M_elems[3] = 0;
                local_1f8.data._M_elems[4] = 0;
                local_1f8.data._M_elems[5] = 0;
                local_1f8.data._M_elems[6] = 0;
                local_1f8.data._M_elems[7] = 0;
                local_1f8.data._M_elems[8] = 0;
                local_1f8.data._M_elems[9] = 0;
                local_1f8.data._M_elems[10] = 0;
                local_1f8.data._M_elems[0xb] = 0;
                local_1f8.data._M_elems[0xc] = 0;
                local_1f8.data._M_elems[0xd] = 0;
                local_1f8.data._M_elems[0xe] = 0;
                local_1f8.data._M_elems[0xf] = 0;
                local_1f8.exp = 0;
                local_1f8.neg = false;
                if ((cpp_dec_float<100U,_int,_void> *)puVar16 != &local_1f8) {
                  uVar6 = *puVar16;
                  uVar7 = *(undefined8 *)((long)(pnVar18->m_backend).data._M_elems + lVar19 + -0x48)
                  ;
                  uVar8 = *(undefined8 *)((long)(&(pnVar18->m_backend).data + -1) + lVar19);
                  uVar9 = *(undefined8 *)((long)(pnVar18->m_backend).data._M_elems + lVar19 + -0x38)
                  ;
                  uVar10 = *(undefined8 *)
                            ((long)(pnVar18->m_backend).data._M_elems + lVar19 + -0x30);
                  uVar11 = *(undefined8 *)
                            ((long)(pnVar18->m_backend).data._M_elems + lVar19 + -0x28);
                  uVar12 = *(undefined8 *)
                            ((long)(pnVar18->m_backend).data._M_elems + lVar19 + -0x20);
                  uVar13 = *(undefined8 *)
                            ((long)(pnVar18->m_backend).data._M_elems + lVar19 + -0x18);
                  local_1f8.data._M_elems[0xc] = (uint)uVar12;
                  local_1f8.data._M_elems[0xd] = (uint)((ulong)uVar12 >> 0x20);
                  local_1f8.data._M_elems[0xe] = (uint)uVar13;
                  local_1f8.data._M_elems[0xf] = (uint)((ulong)uVar13 >> 0x20);
                  local_1f8.data._M_elems[8] = (uint)uVar10;
                  local_1f8.data._M_elems[9] = (uint)((ulong)uVar10 >> 0x20);
                  local_1f8.data._M_elems[10] = (uint)uVar11;
                  local_1f8.data._M_elems[0xb] = (uint)((ulong)uVar11 >> 0x20);
                  local_1f8.data._M_elems[4] = (uint)uVar8;
                  local_1f8.data._M_elems[5] = (uint)((ulong)uVar8 >> 0x20);
                  local_1f8.data._M_elems[6] = (uint)uVar9;
                  local_1f8.data._M_elems[7] = (uint)((ulong)uVar9 >> 0x20);
                  local_1f8.data._M_elems[0] = (uint)uVar6;
                  local_1f8.data._M_elems[1] = (uint)((ulong)uVar6 >> 0x20);
                  local_1f8.data._M_elems[2] = (uint)uVar7;
                  local_1f8.data._M_elems[3] = (uint)((ulong)uVar7 >> 0x20);
                  local_1f8.exp =
                       *(int *)((long)(pnVar18->m_backend).data._M_elems + lVar19 + -0x10);
                  local_1f8.neg =
                       *(bool *)((long)(pnVar18->m_backend).data._M_elems + lVar19 + -0xc);
                  local_1f8._72_8_ =
                       *(undefined8 *)((long)(pnVar18->m_backend).data._M_elems + lVar19 + -8);
                }
                pcVar21 = &local_198;
                goto LAB_00396a04;
              }
              pnVar18 = (this->theLBbound).val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              puVar16 = (undefined8 *)((long)(pnVar18->m_backend).data._M_elems + lVar19 + -0x20);
              *puVar16 = CONCAT44(local_198.data._M_elems[0xd],local_198.data._M_elems[0xc]);
              puVar16[1] = CONCAT35(local_198.data._M_elems[0xf]._1_3_,
                                    local_198.data._M_elems._56_5_);
              puVar16 = (undefined8 *)((long)(pnVar18->m_backend).data._M_elems + lVar19 + -0x30);
              *puVar16 = CONCAT44(local_198.data._M_elems[9],local_198.data._M_elems[8]);
              puVar16[1] = CONCAT44(local_198.data._M_elems[0xb],local_198.data._M_elems[10]);
              puVar16 = (undefined8 *)((long)(&(pnVar18->m_backend).data + -1) + lVar19);
              *puVar16 = CONCAT44(local_198.data._M_elems[5],local_198.data._M_elems[4]);
              puVar16[1] = CONCAT44(local_198.data._M_elems[7],local_198.data._M_elems[6]);
              puVar16 = (undefined8 *)((long)pnVar18[-1].m_backend.data._M_elems + lVar19);
              *puVar16 = CONCAT44(local_198.data._M_elems[1],local_198.data._M_elems[0]);
              puVar16[1] = CONCAT44(local_198.data._M_elems[3],local_198.data._M_elems[2]);
              *(int *)((long)(pnVar18->m_backend).data._M_elems + lVar19 + -0x10) = local_198.exp;
              *(bool *)((long)(pnVar18->m_backend).data._M_elems + lVar19 + -0xc) = local_198.neg;
              *(undefined8 *)((long)(pnVar18->m_backend).data._M_elems + lVar19 + -8) =
                   local_198._72_8_;
            }
LAB_00396a16:
            uVar23 = uVar23 - 1;
            lVar19 = lVar19 + -0x50;
          } while (1 < uVar23);
        }
        lVar19 = (long)(this->
                       super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).
                       super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .
                       super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .set.thenum;
        if (0 < lVar19) {
          uVar24 = lVar19 + 1;
          lVar19 = lVar19 * 0x50;
          do {
            if (this->theRep *
                (this->
                super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).thedesc.rowstat.data[uVar24 - 2] < 1) {
              boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
                        (&local_198,0);
              local_148.data._M_elems[0] = local_198.data._M_elems[0];
              local_148.data._M_elems[1] = local_198.data._M_elems[1];
              local_148.data._M_elems[2] = local_198.data._M_elems[2];
              local_148.data._M_elems[3] = local_198.data._M_elems[3];
              local_148.data._M_elems[4] = local_198.data._M_elems[4];
              local_148.data._M_elems[5] = local_198.data._M_elems[5];
              local_148.data._M_elems[6] = local_198.data._M_elems[6];
              local_148.data._M_elems[7] = local_198.data._M_elems[7];
              local_148.data._M_elems[8] = local_198.data._M_elems[8];
              local_148.data._M_elems[9] = local_198.data._M_elems[9];
              local_148.data._M_elems[10] = local_198.data._M_elems[10];
              local_148.data._M_elems[0xb] = local_198.data._M_elems[0xb];
              local_148.data._M_elems[0xc] = local_198.data._M_elems[0xc];
              local_148.data._M_elems[0xd] = local_198.data._M_elems[0xd];
              local_148.data._M_elems._56_5_ = local_198.data._M_elems._56_5_;
              local_148.data._M_elems[0xf]._1_3_ = local_198.data._M_elems[0xf]._1_3_;
              local_148.exp = local_198.exp;
              local_148.neg = local_198.neg;
              local_148.fpclass = local_198.fpclass;
              local_148.prec_elem = local_198.prec_elem;
              clearDualBounds(this,(this->
                                   super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                   ).thedesc.rowstat.data[uVar24 - 2],
                              (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                               *)&local_148,
                              (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                               *)&local_198);
              pnVar18 = (this->theURbound).val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              if (((*(int *)((long)(&pnVar18[-1].m_backend.data + 1) + lVar19 + 8U) != 2) &&
                  (local_148.fpclass != cpp_dec_float_NaN)) &&
                 (iVar14 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                     ((cpp_dec_float<100U,_int,_void> *)
                                      ((long)pnVar18[-1].m_backend.data._M_elems + lVar19),
                                      &local_148), 0 < iVar14)) {
                pnVar18 = (this->theURbound).val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                puVar16 = (undefined8 *)((long)pnVar18[-1].m_backend.data._M_elems + lVar19);
                local_1f8.fpclass = cpp_dec_float_finite;
                local_1f8.prec_elem = 0x10;
                local_1f8.data._M_elems[0] = 0;
                local_1f8.data._M_elems[1] = 0;
                local_1f8.data._M_elems[2] = 0;
                local_1f8.data._M_elems[3] = 0;
                local_1f8.data._M_elems[4] = 0;
                local_1f8.data._M_elems[5] = 0;
                local_1f8.data._M_elems[6] = 0;
                local_1f8.data._M_elems[7] = 0;
                local_1f8.data._M_elems[8] = 0;
                local_1f8.data._M_elems[9] = 0;
                local_1f8.data._M_elems[10] = 0;
                local_1f8.data._M_elems[0xb] = 0;
                local_1f8.data._M_elems[0xc] = 0;
                local_1f8.data._M_elems[0xd] = 0;
                local_1f8.data._M_elems[0xe] = 0;
                local_1f8.data._M_elems[0xf] = 0;
                local_1f8.exp = 0;
                local_1f8.neg = false;
                if ((cpp_dec_float<100U,_int,_void> *)puVar16 != &local_1f8) {
                  local_1f8.data._M_elems[0xc] = (uint)puVar16[6];
                  local_1f8.data._M_elems[0xd] = (uint)((ulong)puVar16[6] >> 0x20);
                  local_1f8.data._M_elems[0xe] = (uint)puVar16[7];
                  local_1f8.data._M_elems[0xf] = (uint)((ulong)puVar16[7] >> 0x20);
                  local_1f8.data._M_elems[8] = (uint)puVar16[4];
                  local_1f8.data._M_elems[9] = (uint)((ulong)puVar16[4] >> 0x20);
                  local_1f8.data._M_elems[10] = (uint)puVar16[5];
                  local_1f8.data._M_elems[0xb] = (uint)((ulong)puVar16[5] >> 0x20);
                  local_1f8.data._M_elems[4] = (uint)puVar16[2];
                  local_1f8.data._M_elems[5] = (uint)((ulong)puVar16[2] >> 0x20);
                  local_1f8.data._M_elems[6] = (uint)puVar16[3];
                  local_1f8.data._M_elems[7] = (uint)((ulong)puVar16[3] >> 0x20);
                  local_1f8.data._M_elems[0] = (uint)*puVar16;
                  local_1f8.data._M_elems[1] = (uint)((ulong)*puVar16 >> 0x20);
                  local_1f8.data._M_elems[2] = (uint)puVar16[1];
                  local_1f8.data._M_elems[3] = (uint)((ulong)puVar16[1] >> 0x20);
                  local_1f8.exp = *(int *)((long)(&pnVar18[-1].m_backend.data + 1) + lVar19);
                  local_1f8.neg = *(bool *)((long)(&pnVar18[-1].m_backend.data + 1) + lVar19 + 4U);
                  local_1f8._72_8_ =
                       *(undefined8 *)((long)(&pnVar18[-1].m_backend.data + 1) + lVar19 + 8U);
                }
                boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                          (&local_1f8,&local_148);
                boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=
                          (local_1a0,&local_1f8);
              }
              if (((local_198.fpclass != cpp_dec_float_NaN) &&
                  (pnVar18 = (this->theLRbound).val.
                             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                             ._M_impl.super__Vector_impl_data._M_start,
                  *(int *)((long)(&pnVar18[-1].m_backend.data + 1) + lVar19 + 8U) != 2)) &&
                 (iVar14 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                     (&local_198,
                                      (cpp_dec_float<100U,_int,_void> *)
                                      ((long)pnVar18[-1].m_backend.data._M_elems + lVar19)),
                 0 < iVar14)) {
                pcVar21 = (cpp_dec_float<100U,_int,_void> *)
                          ((long)(this->theLRbound).val.
                                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data.
                                 _M_elems + lVar19);
                local_1f8.fpclass = cpp_dec_float_finite;
                local_1f8.prec_elem = 0x10;
                local_1f8.data._M_elems[0] = 0;
                local_1f8.data._M_elems[1] = 0;
                local_1f8.data._M_elems[2] = 0;
                local_1f8.data._M_elems[3] = 0;
                local_1f8.data._M_elems[4] = 0;
                local_1f8.data._M_elems[5] = 0;
                local_1f8.data._M_elems[6] = 0;
                local_1f8.data._M_elems[7] = 0;
                local_1f8.data._M_elems[8] = 0;
                local_1f8.data._M_elems[9] = 0;
                local_1f8.data._M_elems[10] = 0;
                local_1f8.data._M_elems[0xb] = 0;
                local_1f8.data._M_elems[0xc] = 0;
                local_1f8.data._M_elems[0xd] = 0;
                local_1f8.data._M_elems[0xe] = 0;
                local_1f8.data._M_elems[0xf] = 0;
                local_1f8.exp = 0;
                local_1f8.neg = false;
                if (pcVar21 == &local_1f8) {
                  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                            (&local_1f8,&local_198);
                  if (local_1f8.data._M_elems[0] != 0 || local_1f8.fpclass != cpp_dec_float_finite)
                  {
                    local_1f8.neg = (bool)(local_1f8.neg ^ 1);
                  }
                }
                else {
                  local_1f8.data._M_elems[0xc] = local_198.data._M_elems[0xc];
                  local_1f8.data._M_elems[0xd] = local_198.data._M_elems[0xd];
                  local_1f8.data._M_elems[0xe] = local_198.data._M_elems[0xe];
                  local_1f8.data._M_elems[0xf] =
                       (uint)(CONCAT35(local_198.data._M_elems[0xf]._1_3_,
                                       local_198.data._M_elems._56_5_) >> 0x20);
                  local_1f8.data._M_elems[8] = local_198.data._M_elems[8];
                  local_1f8.data._M_elems[9] = local_198.data._M_elems[9];
                  local_1f8.data._M_elems[10] = local_198.data._M_elems[10];
                  local_1f8.data._M_elems[0xb] = local_198.data._M_elems[0xb];
                  local_1f8.data._M_elems[4] = local_198.data._M_elems[4];
                  local_1f8.data._M_elems[5] = local_198.data._M_elems[5];
                  local_1f8.data._M_elems[6] = local_198.data._M_elems[6];
                  local_1f8.data._M_elems[7] = local_198.data._M_elems[7];
                  local_1f8.data._M_elems[0] = local_198.data._M_elems[0];
                  local_1f8.data._M_elems[1] = local_198.data._M_elems[1];
                  local_1f8.data._M_elems[2] = local_198.data._M_elems[2];
                  local_1f8.data._M_elems[3] = local_198.data._M_elems[3];
                  local_1f8.exp = local_198.exp;
                  local_1f8.neg = local_198.neg;
                  local_1f8.fpclass = local_198.fpclass;
                  local_1f8.prec_elem = local_198.prec_elem;
                  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                            (&local_1f8,pcVar21);
                }
                boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=
                          (local_1a0,&local_1f8);
              }
            }
            uVar24 = uVar24 - 1;
            lVar19 = lVar19 + -0x50;
          } while (1 < uVar24);
        }
        lVar19 = (long)(this->
                       super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).
                       super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .
                       super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .set.thenum;
        if (0 < lVar19) {
          uVar24 = lVar19 + 1;
          lVar19 = lVar19 * 0x50;
          do {
            if (this->theRep *
                (this->
                super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).thedesc.colstat.data[uVar24 - 2] < 1) {
              boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
                        (&local_198,0);
              local_148.data._M_elems[0] = local_198.data._M_elems[0];
              local_148.data._M_elems[1] = local_198.data._M_elems[1];
              local_148.data._M_elems[2] = local_198.data._M_elems[2];
              local_148.data._M_elems[3] = local_198.data._M_elems[3];
              local_148.data._M_elems[4] = local_198.data._M_elems[4];
              local_148.data._M_elems[5] = local_198.data._M_elems[5];
              local_148.data._M_elems[6] = local_198.data._M_elems[6];
              local_148.data._M_elems[7] = local_198.data._M_elems[7];
              local_148.data._M_elems[8] = local_198.data._M_elems[8];
              local_148.data._M_elems[9] = local_198.data._M_elems[9];
              local_148.data._M_elems[10] = local_198.data._M_elems[10];
              local_148.data._M_elems[0xb] = local_198.data._M_elems[0xb];
              local_148.data._M_elems[0xc] = local_198.data._M_elems[0xc];
              local_148.data._M_elems[0xd] = local_198.data._M_elems[0xd];
              local_148.data._M_elems._56_5_ = local_198.data._M_elems._56_5_;
              local_148.data._M_elems[0xf]._1_3_ = local_198.data._M_elems[0xf]._1_3_;
              local_148.exp = local_198.exp;
              local_148.neg = local_198.neg;
              local_148.fpclass = local_198.fpclass;
              local_148.prec_elem = local_198.prec_elem;
              clearDualBounds(this,(this->
                                   super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                   ).thedesc.colstat.data[uVar24 - 2],
                              (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                               *)&local_148,
                              (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                               *)&local_198);
              pnVar18 = (this->theUCbound).val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              if (((*(int *)((long)(&pnVar18[-1].m_backend.data + 1) + lVar19 + 8U) != 2) &&
                  (local_148.fpclass != cpp_dec_float_NaN)) &&
                 (iVar14 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                     ((cpp_dec_float<100U,_int,_void> *)
                                      ((long)pnVar18[-1].m_backend.data._M_elems + lVar19),
                                      &local_148), 0 < iVar14)) {
                pnVar18 = (this->theUCbound).val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                puVar16 = (undefined8 *)((long)pnVar18[-1].m_backend.data._M_elems + lVar19);
                local_1f8.fpclass = cpp_dec_float_finite;
                local_1f8.prec_elem = 0x10;
                local_1f8.data._M_elems[0] = 0;
                local_1f8.data._M_elems[1] = 0;
                local_1f8.data._M_elems[2] = 0;
                local_1f8.data._M_elems[3] = 0;
                local_1f8.data._M_elems[4] = 0;
                local_1f8.data._M_elems[5] = 0;
                local_1f8.data._M_elems[6] = 0;
                local_1f8.data._M_elems[7] = 0;
                local_1f8.data._M_elems[8] = 0;
                local_1f8.data._M_elems[9] = 0;
                local_1f8.data._M_elems[10] = 0;
                local_1f8.data._M_elems[0xb] = 0;
                local_1f8.data._M_elems[0xc] = 0;
                local_1f8.data._M_elems[0xd] = 0;
                local_1f8.data._M_elems[0xe] = 0;
                local_1f8.data._M_elems[0xf] = 0;
                local_1f8.exp = 0;
                local_1f8.neg = false;
                if ((cpp_dec_float<100U,_int,_void> *)puVar16 != &local_1f8) {
                  local_1f8.data._M_elems[0xc] = (uint)puVar16[6];
                  local_1f8.data._M_elems[0xd] = (uint)((ulong)puVar16[6] >> 0x20);
                  local_1f8.data._M_elems[0xe] = (uint)puVar16[7];
                  local_1f8.data._M_elems[0xf] = (uint)((ulong)puVar16[7] >> 0x20);
                  local_1f8.data._M_elems[8] = (uint)puVar16[4];
                  local_1f8.data._M_elems[9] = (uint)((ulong)puVar16[4] >> 0x20);
                  local_1f8.data._M_elems[10] = (uint)puVar16[5];
                  local_1f8.data._M_elems[0xb] = (uint)((ulong)puVar16[5] >> 0x20);
                  local_1f8.data._M_elems[4] = (uint)puVar16[2];
                  local_1f8.data._M_elems[5] = (uint)((ulong)puVar16[2] >> 0x20);
                  local_1f8.data._M_elems[6] = (uint)puVar16[3];
                  local_1f8.data._M_elems[7] = (uint)((ulong)puVar16[3] >> 0x20);
                  local_1f8.data._M_elems[0] = (uint)*puVar16;
                  local_1f8.data._M_elems[1] = (uint)((ulong)*puVar16 >> 0x20);
                  local_1f8.data._M_elems[2] = (uint)puVar16[1];
                  local_1f8.data._M_elems[3] = (uint)((ulong)puVar16[1] >> 0x20);
                  local_1f8.exp = *(int *)((long)(&pnVar18[-1].m_backend.data + 1) + lVar19);
                  local_1f8.neg = *(bool *)((long)(&pnVar18[-1].m_backend.data + 1) + lVar19 + 4U);
                  local_1f8._72_8_ =
                       *(undefined8 *)((long)(&pnVar18[-1].m_backend.data + 1) + lVar19 + 8U);
                }
                boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                          (&local_1f8,&local_148);
                boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=
                          (local_1a0,&local_1f8);
              }
              if (((local_198.fpclass != cpp_dec_float_NaN) &&
                  (pnVar18 = (this->theLCbound).val.
                             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                             ._M_impl.super__Vector_impl_data._M_start,
                  *(int *)((long)(&pnVar18[-1].m_backend.data + 1) + lVar19 + 8U) != 2)) &&
                 (iVar14 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                     (&local_198,
                                      (cpp_dec_float<100U,_int,_void> *)
                                      ((long)pnVar18[-1].m_backend.data._M_elems + lVar19)),
                 0 < iVar14)) {
                pcVar21 = (cpp_dec_float<100U,_int,_void> *)
                          ((long)(this->theLCbound).val.
                                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data.
                                 _M_elems + lVar19);
                local_1f8.fpclass = cpp_dec_float_finite;
                local_1f8.prec_elem = 0x10;
                local_1f8.data._M_elems[0] = 0;
                local_1f8.data._M_elems[1] = 0;
                local_1f8.data._M_elems[2] = 0;
                local_1f8.data._M_elems[3] = 0;
                local_1f8.data._M_elems[4] = 0;
                local_1f8.data._M_elems[5] = 0;
                local_1f8.data._M_elems[6] = 0;
                local_1f8.data._M_elems[7] = 0;
                local_1f8.data._M_elems[8] = 0;
                local_1f8.data._M_elems[9] = 0;
                local_1f8.data._M_elems[10] = 0;
                local_1f8.data._M_elems[0xb] = 0;
                local_1f8.data._M_elems[0xc] = 0;
                local_1f8.data._M_elems[0xd] = 0;
                local_1f8.data._M_elems[0xe] = 0;
                local_1f8.data._M_elems[0xf] = 0;
                local_1f8.exp = 0;
                local_1f8.neg = false;
                if (pcVar21 == &local_1f8) {
                  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                            (&local_1f8,&local_198);
                  if (local_1f8.data._M_elems[0] != 0 || local_1f8.fpclass != cpp_dec_float_finite)
                  {
                    local_1f8.neg = (bool)(local_1f8.neg ^ 1);
                  }
                }
                else {
                  local_1f8.data._M_elems[0xc] = local_198.data._M_elems[0xc];
                  local_1f8.data._M_elems[0xd] = local_198.data._M_elems[0xd];
                  local_1f8.data._M_elems[0xe] = local_198.data._M_elems[0xe];
                  local_1f8.data._M_elems[0xf] =
                       (uint)(CONCAT35(local_198.data._M_elems[0xf]._1_3_,
                                       local_198.data._M_elems._56_5_) >> 0x20);
                  local_1f8.data._M_elems[8] = local_198.data._M_elems[8];
                  local_1f8.data._M_elems[9] = local_198.data._M_elems[9];
                  local_1f8.data._M_elems[10] = local_198.data._M_elems[10];
                  local_1f8.data._M_elems[0xb] = local_198.data._M_elems[0xb];
                  local_1f8.data._M_elems[4] = local_198.data._M_elems[4];
                  local_1f8.data._M_elems[5] = local_198.data._M_elems[5];
                  local_1f8.data._M_elems[6] = local_198.data._M_elems[6];
                  local_1f8.data._M_elems[7] = local_198.data._M_elems[7];
                  local_1f8.data._M_elems[0] = local_198.data._M_elems[0];
                  local_1f8.data._M_elems[1] = local_198.data._M_elems[1];
                  local_1f8.data._M_elems[2] = local_198.data._M_elems[2];
                  local_1f8.data._M_elems[3] = local_198.data._M_elems[3];
                  local_1f8.exp = local_198.exp;
                  local_1f8.neg = local_198.neg;
                  local_1f8.fpclass = local_198.fpclass;
                  local_1f8.prec_elem = local_198.prec_elem;
                  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                            (&local_1f8,pcVar21);
                }
                boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=
                          (local_1a0,&local_1f8);
              }
            }
            uVar24 = uVar24 - 1;
            lVar19 = lVar19 + -0x50;
          } while (1 < uVar24);
        }
      }
    }
    else {
      leavetol((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)&local_80,this);
      uVar2 = (this->
              super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .
              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .set.thenum;
      uVar24 = (ulong)uVar2;
      if (this->theRep == COLUMN) {
        if (0 < (int)uVar2) {
          uVar23 = uVar24 + 1;
          lVar19 = uVar24 * 0x50;
          do {
            pnVar18 = (this->
                      super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).
                      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .object.val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            puVar16 = (undefined8 *)((long)pnVar18[-1].m_backend.data._M_elems + lVar19);
            uVar6 = *puVar16;
            uVar7 = puVar16[1];
            puVar16 = (undefined8 *)((long)(&(pnVar18->m_backend).data + -1) + lVar19);
            uVar8 = *puVar16;
            uVar9 = puVar16[1];
            puVar16 = (undefined8 *)((long)(pnVar18->m_backend).data._M_elems + lVar19 + -0x30);
            uVar10 = *puVar16;
            uVar11 = puVar16[1];
            puVar16 = (undefined8 *)((long)(pnVar18->m_backend).data._M_elems + lVar19 + -0x20);
            uVar12 = *puVar16;
            uVar13 = puVar16[1];
            local_198.data._M_elems[0xc] = (uint)uVar12;
            local_198.data._M_elems[0xd] = (uint)((ulong)uVar12 >> 0x20);
            local_198.data._M_elems._56_5_ = SUB85(uVar13,0);
            local_198.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar13 >> 0x28);
            local_198.data._M_elems[8] = (uint)uVar10;
            local_198.data._M_elems[9] = (uint)((ulong)uVar10 >> 0x20);
            local_198.data._M_elems[10] = (uint)uVar11;
            local_198.data._M_elems[0xb] = (uint)((ulong)uVar11 >> 0x20);
            local_198.data._M_elems[4] = (uint)uVar8;
            local_198.data._M_elems[5] = (uint)((ulong)uVar8 >> 0x20);
            local_198.data._M_elems[6] = (uint)uVar9;
            local_198.data._M_elems[7] = (uint)((ulong)uVar9 >> 0x20);
            local_198.data._M_elems[0] = (uint)uVar6;
            local_198.data._M_elems[1] = (uint)((ulong)uVar6 >> 0x20);
            local_198.data._M_elems[2] = (uint)uVar7;
            local_198.data._M_elems[3] = (uint)((ulong)uVar7 >> 0x20);
            local_198.exp = *(int *)((long)(pnVar18->m_backend).data._M_elems + lVar19 + -0x10);
            local_198.neg = *(bool *)((long)(pnVar18->m_backend).data._M_elems + lVar19 + -0xc);
            local_198.fpclass =
                 *(fpclass_type *)((long)(pnVar18->m_backend).data._M_elems + lVar19 + -8);
            local_198.prec_elem =
                 *(int32_t *)((long)(pnVar18->m_backend).data._M_elems + lVar19 + -4);
            local_148.prec_elem = local_198.prec_elem;
            local_148.fpclass = local_198.fpclass;
            local_148.data._M_elems[0] = local_198.data._M_elems[0];
            local_148.data._M_elems[1] = local_198.data._M_elems[1];
            local_148.data._M_elems[2] = local_198.data._M_elems[2];
            local_148.data._M_elems[3] = local_198.data._M_elems[3];
            local_148.data._M_elems[4] = local_198.data._M_elems[4];
            local_148.data._M_elems[5] = local_198.data._M_elems[5];
            local_148.data._M_elems[6] = local_198.data._M_elems[6];
            local_148.data._M_elems[7] = local_198.data._M_elems[7];
            local_148.data._M_elems[8] = local_198.data._M_elems[8];
            local_148.data._M_elems[9] = local_198.data._M_elems[9];
            local_148.data._M_elems[10] = local_198.data._M_elems[10];
            local_148.data._M_elems[0xb] = local_198.data._M_elems[0xb];
            local_148.data._M_elems[0xc] = local_198.data._M_elems[0xc];
            local_148.data._M_elems[0xd] = local_198.data._M_elems[0xd];
            local_148.data._M_elems._56_5_ = local_198.data._M_elems._56_5_;
            local_148.data._M_elems[0xf]._1_3_ = local_198.data._M_elems[0xf]._1_3_;
            local_148.exp = local_198.exp;
            local_148.neg = local_198.neg;
            clearDualBounds(this,(this->
                                 super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 ).thedesc.rowstat.data[uVar23 - 2],
                            (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)&local_148,
                            (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)&local_198);
            if (this->theRep *
                (this->
                super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).thedesc.rowstat.data[uVar23 - 2] < 1) {
              pnVar18 = (this->theCoPvec->
                        super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              local_1f8.data._M_elems[0xc] = local_148.data._M_elems[0xc];
              local_1f8.data._M_elems[0xd] = local_148.data._M_elems[0xd];
              local_1f8.data._M_elems[0xe] = local_148.data._M_elems[0xe];
              local_1f8.data._M_elems[0xf] =
                   (uint)(CONCAT35(local_148.data._M_elems[0xf]._1_3_,local_148.data._M_elems._56_5_
                                  ) >> 0x20);
              local_1f8.data._M_elems[8] = local_148.data._M_elems[8];
              local_1f8.data._M_elems[9] = local_148.data._M_elems[9];
              local_1f8.data._M_elems[10] = local_148.data._M_elems[10];
              local_1f8.data._M_elems[0xb] = local_148.data._M_elems[0xb];
              local_1f8.data._M_elems[4] = local_148.data._M_elems[4];
              local_1f8.data._M_elems[5] = local_148.data._M_elems[5];
              local_1f8.data._M_elems[6] = local_148.data._M_elems[6];
              local_1f8.data._M_elems[7] = local_148.data._M_elems[7];
              local_1f8.data._M_elems[0] = local_148.data._M_elems[0];
              local_1f8.data._M_elems[1] = local_148.data._M_elems[1];
              local_1f8.data._M_elems[2] = local_148.data._M_elems[2];
              local_1f8.data._M_elems[3] = local_148.data._M_elems[3];
              local_1f8.exp = local_148.exp;
              local_1f8.neg = local_148.neg;
              local_1f8.fpclass = local_148.fpclass;
              local_1f8.prec_elem = local_148.prec_elem;
              boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=
                        (&local_1f8,&local_80);
              if (((*(int *)((long)(pnVar18->m_backend).data._M_elems + lVar19 + -8) == 2) ||
                  (local_1f8.fpclass == cpp_dec_float_NaN)) ||
                 (iVar14 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                     ((cpp_dec_float<100U,_int,_void> *)
                                      ((long)pnVar18[0xffffffffffffffff].m_backend.data._M_elems +
                                      lVar19),&local_1f8), -1 < iVar14)) {
                pnVar18 = (this->theURbound).val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                puVar16 = (undefined8 *)((long)pnVar18[-1].m_backend.data._M_elems + lVar19);
                local_1f8.fpclass = cpp_dec_float_finite;
                local_1f8.prec_elem = 0x10;
                local_1f8.data._M_elems[0] = 0;
                local_1f8.data._M_elems[1] = 0;
                local_1f8.data._M_elems[2] = 0;
                local_1f8.data._M_elems[3] = 0;
                local_1f8.data._M_elems[4] = 0;
                local_1f8.data._M_elems[5] = 0;
                local_1f8.data._M_elems[6] = 0;
                local_1f8.data._M_elems[7] = 0;
                local_1f8.data._M_elems[8] = 0;
                local_1f8.data._M_elems[9] = 0;
                local_1f8.data._M_elems[10] = 0;
                local_1f8.data._M_elems[0xb] = 0;
                local_1f8.data._M_elems[0xc] = 0;
                local_1f8.data._M_elems[0xd] = 0;
                local_1f8.data._M_elems[0xe] = 0;
                local_1f8.data._M_elems[0xf] = 0;
                local_1f8.exp = 0;
                local_1f8.neg = false;
                if ((cpp_dec_float<100U,_int,_void> *)puVar16 != &local_1f8) {
                  uVar6 = *puVar16;
                  uVar7 = *(undefined8 *)((long)(pnVar18->m_backend).data._M_elems + lVar19 + -0x48)
                  ;
                  uVar8 = *(undefined8 *)((long)(&(pnVar18->m_backend).data + -1) + lVar19);
                  uVar9 = *(undefined8 *)((long)(pnVar18->m_backend).data._M_elems + lVar19 + -0x38)
                  ;
                  uVar10 = *(undefined8 *)
                            ((long)(pnVar18->m_backend).data._M_elems + lVar19 + -0x30);
                  uVar11 = *(undefined8 *)
                            ((long)(pnVar18->m_backend).data._M_elems + lVar19 + -0x28);
                  uVar12 = *(undefined8 *)
                            ((long)(pnVar18->m_backend).data._M_elems + lVar19 + -0x20);
                  uVar13 = *(undefined8 *)
                            ((long)(pnVar18->m_backend).data._M_elems + lVar19 + -0x18);
                  local_1f8.data._M_elems[0xc] = (uint)uVar12;
                  local_1f8.data._M_elems[0xd] = (uint)((ulong)uVar12 >> 0x20);
                  local_1f8.data._M_elems[0xe] = (uint)uVar13;
                  local_1f8.data._M_elems[0xf] = (uint)((ulong)uVar13 >> 0x20);
                  local_1f8.data._M_elems[8] = (uint)uVar10;
                  local_1f8.data._M_elems[9] = (uint)((ulong)uVar10 >> 0x20);
                  local_1f8.data._M_elems[10] = (uint)uVar11;
                  local_1f8.data._M_elems[0xb] = (uint)((ulong)uVar11 >> 0x20);
                  local_1f8.data._M_elems[4] = (uint)uVar8;
                  local_1f8.data._M_elems[5] = (uint)((ulong)uVar8 >> 0x20);
                  local_1f8.data._M_elems[6] = (uint)uVar9;
                  local_1f8.data._M_elems[7] = (uint)((ulong)uVar9 >> 0x20);
                  local_1f8.data._M_elems[0] = (uint)uVar6;
                  local_1f8.data._M_elems[1] = (uint)((ulong)uVar6 >> 0x20);
                  local_1f8.data._M_elems[2] = (uint)uVar7;
                  local_1f8.data._M_elems[3] = (uint)((ulong)uVar7 >> 0x20);
                  local_1f8.exp =
                       *(int *)((long)(pnVar18->m_backend).data._M_elems + lVar19 + -0x10);
                  local_1f8.neg =
                       *(bool *)((long)(pnVar18->m_backend).data._M_elems + lVar19 + -0xc);
                  local_1f8._72_8_ =
                       *(undefined8 *)((long)(pnVar18->m_backend).data._M_elems + lVar19 + -8);
                }
                boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                          (&local_1f8,&local_148);
                boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=
                          (local_1a0,&local_1f8);
              }
              else {
                pnVar18 = (this->theURbound).val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                puVar16 = (undefined8 *)((long)(pnVar18->m_backend).data._M_elems + lVar19 + -0x20);
                *puVar16 = CONCAT44(local_148.data._M_elems[0xd],local_148.data._M_elems[0xc]);
                puVar16[1] = CONCAT35(local_148.data._M_elems[0xf]._1_3_,
                                      local_148.data._M_elems._56_5_);
                puVar16 = (undefined8 *)((long)(pnVar18->m_backend).data._M_elems + lVar19 + -0x30);
                *puVar16 = CONCAT44(local_148.data._M_elems[9],local_148.data._M_elems[8]);
                puVar16[1] = CONCAT44(local_148.data._M_elems[0xb],local_148.data._M_elems[10]);
                puVar16 = (undefined8 *)((long)(&(pnVar18->m_backend).data + -1) + lVar19);
                *puVar16 = CONCAT44(local_148.data._M_elems[5],local_148.data._M_elems[4]);
                puVar16[1] = CONCAT44(local_148.data._M_elems[7],local_148.data._M_elems[6]);
                puVar16 = (undefined8 *)((long)pnVar18[-1].m_backend.data._M_elems + lVar19);
                *puVar16 = CONCAT44(local_148.data._M_elems[1],local_148.data._M_elems[0]);
                puVar16[1] = CONCAT44(local_148.data._M_elems[3],local_148.data._M_elems[2]);
                *(int *)((long)(pnVar18->m_backend).data._M_elems + lVar19 + -0x10) = local_148.exp;
                *(bool *)((long)(pnVar18->m_backend).data._M_elems + lVar19 + -0xc) = local_148.neg;
                *(undefined8 *)((long)(pnVar18->m_backend).data._M_elems + lVar19 + -8) =
                     local_148._72_8_;
                if (((local_148.fpclass != cpp_dec_float_NaN) &&
                    (local_198.fpclass != cpp_dec_float_NaN)) &&
                   (iVar14 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::
                             compare(&local_148,&local_198), iVar14 == 0)) {
                  pnVar18 = (this->theLRbound).val.
                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                  puVar16 = (undefined8 *)
                            ((long)(pnVar18->m_backend).data._M_elems + lVar19 + -0x20);
                  *puVar16 = CONCAT44(local_198.data._M_elems[0xd],local_198.data._M_elems[0xc]);
                  puVar16[1] = CONCAT35(local_198.data._M_elems[0xf]._1_3_,
                                        local_198.data._M_elems._56_5_);
                  puVar16 = (undefined8 *)
                            ((long)(pnVar18->m_backend).data._M_elems + lVar19 + -0x30);
                  *puVar16 = CONCAT44(local_198.data._M_elems[9],local_198.data._M_elems[8]);
                  puVar16[1] = CONCAT44(local_198.data._M_elems[0xb],local_198.data._M_elems[10]);
                  puVar16 = (undefined8 *)((long)(&(pnVar18->m_backend).data + -1) + lVar19);
                  *puVar16 = CONCAT44(local_198.data._M_elems[5],local_198.data._M_elems[4]);
                  puVar16[1] = CONCAT44(local_198.data._M_elems[7],local_198.data._M_elems[6]);
                  puVar16 = (undefined8 *)((long)pnVar18[-1].m_backend.data._M_elems + lVar19);
                  *puVar16 = CONCAT44(local_198.data._M_elems[1],local_198.data._M_elems[0]);
                  puVar16[1] = CONCAT44(local_198.data._M_elems[3],local_198.data._M_elems[2]);
                  *(int *)((long)(pnVar18->m_backend).data._M_elems + lVar19 + -0x10) =
                       local_198.exp;
                  *(bool *)((long)(pnVar18->m_backend).data._M_elems + lVar19 + -0xc) =
                       local_198.neg;
                  *(undefined8 *)((long)(pnVar18->m_backend).data._M_elems + lVar19 + -8) =
                       local_198._72_8_;
                }
              }
              pnVar18 = (this->theCoPvec->
                        super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              local_1f8.data._M_elems[0xc] = local_198.data._M_elems[0xc];
              local_1f8.data._M_elems[0xd] = local_198.data._M_elems[0xd];
              local_1f8.data._M_elems[0xe] = local_198.data._M_elems[0xe];
              local_1f8.data._M_elems[0xf] =
                   (uint)(CONCAT35(local_198.data._M_elems[0xf]._1_3_,local_198.data._M_elems._56_5_
                                  ) >> 0x20);
              local_1f8.data._M_elems[8] = local_198.data._M_elems[8];
              local_1f8.data._M_elems[9] = local_198.data._M_elems[9];
              local_1f8.data._M_elems[10] = local_198.data._M_elems[10];
              local_1f8.data._M_elems[0xb] = local_198.data._M_elems[0xb];
              local_1f8.data._M_elems[4] = local_198.data._M_elems[4];
              local_1f8.data._M_elems[5] = local_198.data._M_elems[5];
              local_1f8.data._M_elems[6] = local_198.data._M_elems[6];
              local_1f8.data._M_elems[7] = local_198.data._M_elems[7];
              local_1f8.data._M_elems[0] = local_198.data._M_elems[0];
              local_1f8.data._M_elems[1] = local_198.data._M_elems[1];
              local_1f8.data._M_elems[2] = local_198.data._M_elems[2];
              local_1f8.data._M_elems[3] = local_198.data._M_elems[3];
              local_1f8.exp = local_198.exp;
              local_1f8.neg = local_198.neg;
              local_1f8.fpclass = local_198.fpclass;
              local_1f8.prec_elem = local_198.prec_elem;
              boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                        (&local_1f8,&local_80);
              if (((*(int *)((long)(pnVar18->m_backend).data._M_elems + lVar19 + -8) == 2) ||
                  (local_1f8.fpclass == cpp_dec_float_NaN)) ||
                 (iVar14 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                     ((cpp_dec_float<100U,_int,_void> *)
                                      ((long)pnVar18[0xffffffffffffffff].m_backend.data._M_elems +
                                      lVar19),&local_1f8), iVar14 < 1)) {
                pcVar21 = (cpp_dec_float<100U,_int,_void> *)
                          ((long)(this->theLRbound).val.
                                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data.
                                 _M_elems + lVar19);
                if (pcVar21 == &local_1f8) goto LAB_00394285;
LAB_003945b2:
                local_1f8.data._M_elems[0xc] = local_198.data._M_elems[0xc];
                local_1f8.data._M_elems[0xd] = local_198.data._M_elems[0xd];
                local_1f8.data._M_elems[0xe] = local_198.data._M_elems[0xe];
                local_1f8.data._M_elems[0xf] =
                     (uint)(CONCAT35(local_198.data._M_elems[0xf]._1_3_,
                                     local_198.data._M_elems._56_5_) >> 0x20);
                local_1f8.data._M_elems[8] = local_198.data._M_elems[8];
                local_1f8.data._M_elems[9] = local_198.data._M_elems[9];
                local_1f8.data._M_elems[10] = local_198.data._M_elems[10];
                local_1f8.data._M_elems[0xb] = local_198.data._M_elems[0xb];
                local_1f8.data._M_elems[4] = local_198.data._M_elems[4];
                local_1f8.data._M_elems[5] = local_198.data._M_elems[5];
                local_1f8.data._M_elems[6] = local_198.data._M_elems[6];
                local_1f8.data._M_elems[7] = local_198.data._M_elems[7];
                local_1f8.data._M_elems[0] = local_198.data._M_elems[0];
                local_1f8.data._M_elems[1] = local_198.data._M_elems[1];
                local_1f8.data._M_elems[2] = local_198.data._M_elems[2];
                local_1f8.data._M_elems[3] = local_198.data._M_elems[3];
                local_1f8.exp = local_198.exp;
                local_1f8.neg = local_198.neg;
                local_1f8.fpclass = local_198.fpclass;
                local_1f8.prec_elem = local_198.prec_elem;
                goto LAB_00394607;
              }
              pnVar18 = (this->theLRbound).val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              puVar16 = (undefined8 *)((long)(pnVar18->m_backend).data._M_elems + lVar19 + -0x20);
              *puVar16 = CONCAT44(local_198.data._M_elems[0xd],local_198.data._M_elems[0xc]);
              puVar16[1] = CONCAT35(local_198.data._M_elems[0xf]._1_3_,
                                    local_198.data._M_elems._56_5_);
              puVar16 = (undefined8 *)((long)(pnVar18->m_backend).data._M_elems + lVar19 + -0x30);
              *puVar16 = CONCAT44(local_198.data._M_elems[9],local_198.data._M_elems[8]);
              puVar16[1] = CONCAT44(local_198.data._M_elems[0xb],local_198.data._M_elems[10]);
              puVar16 = (undefined8 *)((long)(&(pnVar18->m_backend).data + -1) + lVar19);
              *puVar16 = CONCAT44(local_198.data._M_elems[5],local_198.data._M_elems[4]);
              puVar16[1] = CONCAT44(local_198.data._M_elems[7],local_198.data._M_elems[6]);
              puVar16 = (undefined8 *)((long)pnVar18[-1].m_backend.data._M_elems + lVar19);
              *puVar16 = CONCAT44(local_198.data._M_elems[1],local_198.data._M_elems[0]);
              puVar16[1] = CONCAT44(local_198.data._M_elems[3],local_198.data._M_elems[2]);
              *(int *)((long)(pnVar18->m_backend).data._M_elems + lVar19 + -0x10) = local_198.exp;
              *(bool *)((long)(pnVar18->m_backend).data._M_elems + lVar19 + -0xc) = local_198.neg;
              *(undefined8 *)((long)(pnVar18->m_backend).data._M_elems + lVar19 + -8) =
                   local_198._72_8_;
              if (((local_148.fpclass != cpp_dec_float_NaN) &&
                  (local_198.fpclass != cpp_dec_float_NaN)) &&
                 (iVar14 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                     (&local_148,&local_198), iVar14 == 0)) {
                pnVar18 = (this->theURbound).val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                puVar16 = (undefined8 *)((long)(pnVar18->m_backend).data._M_elems + lVar19 + -0x20);
                *puVar16 = CONCAT44(local_148.data._M_elems[0xd],local_148.data._M_elems[0xc]);
                puVar16[1] = CONCAT35(local_148.data._M_elems[0xf]._1_3_,
                                      local_148.data._M_elems._56_5_);
                puVar16 = (undefined8 *)((long)(pnVar18->m_backend).data._M_elems + lVar19 + -0x30);
                *puVar16 = CONCAT44(local_148.data._M_elems[9],local_148.data._M_elems[8]);
                puVar16[1] = CONCAT44(local_148.data._M_elems[0xb],local_148.data._M_elems[10]);
                puVar16 = (undefined8 *)((long)(&(pnVar18->m_backend).data + -1) + lVar19);
                *puVar16 = CONCAT44(local_148.data._M_elems[5],local_148.data._M_elems[4]);
                puVar16[1] = CONCAT44(local_148.data._M_elems[7],local_148.data._M_elems[6]);
                puVar16 = (undefined8 *)((long)pnVar18[-1].m_backend.data._M_elems + lVar19);
                *puVar16 = CONCAT44(local_148.data._M_elems[1],local_148.data._M_elems[0]);
                puVar16[1] = CONCAT44(local_148.data._M_elems[3],local_148.data._M_elems[2]);
                *(int *)((long)(pnVar18->m_backend).data._M_elems + lVar19 + -0x10) = local_148.exp;
                *(bool *)((long)(pnVar18->m_backend).data._M_elems + lVar19 + -0xc) = local_148.neg;
                *(undefined8 *)((long)(pnVar18->m_backend).data._M_elems + lVar19 + -8) =
                     local_148._72_8_;
              }
            }
            else {
              pnVar18 = (this->theURbound).val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              if (((*(int *)((long)(pnVar18->m_backend).data._M_elems + lVar19 + -8) == 2) ||
                  (local_148.fpclass == cpp_dec_float_NaN)) ||
                 (iVar14 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                     ((cpp_dec_float<100U,_int,_void> *)
                                      ((long)pnVar18[-1].m_backend.data._M_elems + lVar19),
                                      &local_148), iVar14 < 1)) {
                pnVar18 = (this->theLRbound).val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                if (((*(int *)((long)(pnVar18->m_backend).data._M_elems + lVar19 + -8) == 2) ||
                    (local_198.fpclass == cpp_dec_float_NaN)) ||
                   (iVar14 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::
                             compare((cpp_dec_float<100U,_int,_void> *)
                                     ((long)pnVar18[-1].m_backend.data._M_elems + lVar19),&local_198
                                    ), -1 < iVar14)) goto LAB_00394619;
                pcVar21 = (cpp_dec_float<100U,_int,_void> *)
                          ((long)(this->theLRbound).val.
                                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data.
                                 _M_elems + lVar19);
                if (pcVar21 != &local_1f8) goto LAB_003945b2;
LAB_00394285:
                local_1f8.neg = false;
                local_1f8.exp = 0;
                local_1f8.data._M_elems[0xe] = 0;
                local_1f8.data._M_elems[0xd] = 0;
                local_1f8.data._M_elems[0xc] = 0;
                local_1f8.data._M_elems[0xb] = 0;
                local_1f8.data._M_elems[10] = 0;
                local_1f8.data._M_elems[9] = 0;
                local_1f8.data._M_elems[8] = 0;
                local_1f8.data._M_elems[7] = 0;
                local_1f8.data._M_elems[6] = 0;
                local_1f8.data._M_elems[5] = 0;
                local_1f8.data._M_elems[4] = 0;
                local_1f8.data._M_elems[3] = 0;
                local_1f8.data._M_elems[2] = 0;
                local_1f8.data._M_elems[1] = 0;
                local_1f8.data._M_elems[0] = 0;
                local_1f8.data._M_elems[0xf] = 0;
                local_1f8.fpclass = cpp_dec_float_finite;
                local_1f8.prec_elem = 0x10;
                boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                          (&local_1f8,&local_198);
                if (local_1f8.data._M_elems[0] != 0 || local_1f8.fpclass != cpp_dec_float_finite) {
                  local_1f8.neg = (bool)(local_1f8.neg ^ 1);
                }
              }
              else {
                pnVar18 = (this->theURbound).val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                puVar16 = (undefined8 *)((long)pnVar18[-1].m_backend.data._M_elems + lVar19);
                local_1f8.fpclass = cpp_dec_float_finite;
                local_1f8.prec_elem = 0x10;
                local_1f8.data._M_elems[0] = 0;
                local_1f8.data._M_elems[1] = 0;
                local_1f8.data._M_elems[2] = 0;
                local_1f8.data._M_elems[3] = 0;
                local_1f8.data._M_elems[4] = 0;
                local_1f8.data._M_elems[5] = 0;
                local_1f8.data._M_elems[6] = 0;
                local_1f8.data._M_elems[7] = 0;
                local_1f8.data._M_elems[8] = 0;
                local_1f8.data._M_elems[9] = 0;
                local_1f8.data._M_elems[10] = 0;
                local_1f8.data._M_elems[0xb] = 0;
                local_1f8.data._M_elems[0xc] = 0;
                local_1f8.data._M_elems[0xd] = 0;
                local_1f8.data._M_elems[0xe] = 0;
                local_1f8.data._M_elems[0xf] = 0;
                local_1f8.exp = 0;
                local_1f8.neg = false;
                pcVar21 = &local_148;
                if ((cpp_dec_float<100U,_int,_void> *)puVar16 != &local_1f8) {
                  uVar6 = *puVar16;
                  uVar7 = *(undefined8 *)((long)(pnVar18->m_backend).data._M_elems + lVar19 + -0x48)
                  ;
                  uVar8 = *(undefined8 *)((long)(&(pnVar18->m_backend).data + -1) + lVar19);
                  uVar9 = *(undefined8 *)((long)(pnVar18->m_backend).data._M_elems + lVar19 + -0x38)
                  ;
                  uVar10 = *(undefined8 *)
                            ((long)(pnVar18->m_backend).data._M_elems + lVar19 + -0x30);
                  uVar11 = *(undefined8 *)
                            ((long)(pnVar18->m_backend).data._M_elems + lVar19 + -0x28);
                  uVar12 = *(undefined8 *)
                            ((long)(pnVar18->m_backend).data._M_elems + lVar19 + -0x20);
                  uVar13 = *(undefined8 *)
                            ((long)(pnVar18->m_backend).data._M_elems + lVar19 + -0x18);
                  local_1f8.data._M_elems[0xc] = (uint)uVar12;
                  local_1f8.data._M_elems[0xd] = (uint)((ulong)uVar12 >> 0x20);
                  local_1f8.data._M_elems[0xe] = (uint)uVar13;
                  local_1f8.data._M_elems[0xf] = (uint)((ulong)uVar13 >> 0x20);
                  local_1f8.data._M_elems[8] = (uint)uVar10;
                  local_1f8.data._M_elems[9] = (uint)((ulong)uVar10 >> 0x20);
                  local_1f8.data._M_elems[10] = (uint)uVar11;
                  local_1f8.data._M_elems[0xb] = (uint)((ulong)uVar11 >> 0x20);
                  local_1f8.data._M_elems[4] = (uint)uVar8;
                  local_1f8.data._M_elems[5] = (uint)((ulong)uVar8 >> 0x20);
                  local_1f8.data._M_elems[6] = (uint)uVar9;
                  local_1f8.data._M_elems[7] = (uint)((ulong)uVar9 >> 0x20);
                  local_1f8.data._M_elems[0] = (uint)uVar6;
                  local_1f8.data._M_elems[1] = (uint)((ulong)uVar6 >> 0x20);
                  local_1f8.data._M_elems[2] = (uint)uVar7;
                  local_1f8.data._M_elems[3] = (uint)((ulong)uVar7 >> 0x20);
                  local_1f8.exp =
                       *(int *)((long)(pnVar18->m_backend).data._M_elems + lVar19 + -0x10);
                  local_1f8.neg =
                       *(bool *)((long)(pnVar18->m_backend).data._M_elems + lVar19 + -0xc);
                  local_1f8._72_8_ =
                       *(undefined8 *)((long)(pnVar18->m_backend).data._M_elems + lVar19 + -8);
                }
LAB_00394607:
                boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                          (&local_1f8,pcVar21);
              }
              boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=
                        (local_1a0,&local_1f8);
            }
LAB_00394619:
            uVar23 = uVar23 - 1;
            lVar19 = lVar19 + -0x50;
          } while (1 < uVar23);
        }
        lVar19 = (long)(this->
                       super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).
                       super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .
                       super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .set.thenum;
        if (0 < lVar19) {
          uVar24 = lVar19 + 1;
          lVar19 = lVar19 * 0x50;
          do {
            pnVar18 = (this->
                      super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).
                      super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .object.val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            local_198.data._M_elems[0] =
                 *(uint *)((long)pnVar18[-1].m_backend.data._M_elems + lVar19);
            puVar16 = (undefined8 *)((long)(pnVar18->m_backend).data._M_elems + lVar19 + -0x20);
            uVar6 = puVar16[1];
            local_1f8.data._M_elems[0xc] = (uint)((ulong)*puVar16 >> 0x20);
            local_1f8.data._M_elems[0xd] = (uint)uVar6;
            local_1f8.data._M_elems[0xe] = (uint)((ulong)uVar6 >> 0x20);
            puVar16 = (undefined8 *)((long)(pnVar18->m_backend).data._M_elems + lVar19 + -0x2c);
            uVar7 = *puVar16;
            uVar8 = puVar16[1];
            local_1f8.data._M_elems[8] = (uint)uVar7;
            local_1f8.data._M_elems[9] = (uint)((ulong)uVar7 >> 0x20);
            local_1f8.data._M_elems[10] = (uint)uVar8;
            local_1f8.data._M_elems[0xb] = (uint)((ulong)uVar8 >> 0x20);
            puVar16 = (undefined8 *)((long)(pnVar18->m_backend).data._M_elems + lVar19 + -0x3c);
            uVar7 = *puVar16;
            uVar8 = puVar16[1];
            local_1f8.data._M_elems[4] = (uint)uVar7;
            local_1f8.data._M_elems[5] = (uint)((ulong)uVar7 >> 0x20);
            local_1f8.data._M_elems[6] = (uint)uVar8;
            local_1f8.data._M_elems[7] = (uint)((ulong)uVar8 >> 0x20);
            puVar16 = (undefined8 *)((long)(pnVar18->m_backend).data._M_elems + lVar19 + -0x4c);
            uVar7 = *puVar16;
            uVar8 = puVar16[1];
            local_1f8.data._M_elems[0] = (uint)uVar7;
            local_1f8.data._M_elems[1] = (uint)((ulong)uVar7 >> 0x20);
            local_1f8.data._M_elems[2] = (uint)uVar8;
            local_1f8.data._M_elems[3] = (uint)((ulong)uVar8 >> 0x20);
            local_198.exp = *(int *)((long)(pnVar18->m_backend).data._M_elems + lVar19 + -0x10);
            local_198.fpclass =
                 *(fpclass_type *)((long)(pnVar18->m_backend).data._M_elems + lVar19 + -8);
            local_198.prec_elem =
                 *(int32_t *)((long)(pnVar18->m_backend).data._M_elems + lVar19 + -4);
            local_198.neg =
                 (bool)((local_198.data._M_elems[0] != 0 ||
                        local_198.fpclass != cpp_dec_float_finite) ^
                       *(byte *)((long)(pnVar18->m_backend).data._M_elems + lVar19 + -0xc));
            local_198.data._M_elems[0xd] = local_1f8.data._M_elems[0xc];
            local_198.data._M_elems._56_5_ = SUB85(uVar6,0);
            local_198.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar6 >> 0x28);
            local_148.data._M_elems[3] = local_1f8.data._M_elems[2];
            local_148.data._M_elems[4] = local_1f8.data._M_elems[3];
            local_148.data._M_elems[5] = local_1f8.data._M_elems[4];
            local_148.data._M_elems[6] = local_1f8.data._M_elems[5];
            local_148.data._M_elems[7] = local_1f8.data._M_elems[6];
            local_148.data._M_elems[8] = local_1f8.data._M_elems[7];
            local_148.data._M_elems[9] = local_1f8.data._M_elems[8];
            local_148.data._M_elems[10] = local_1f8.data._M_elems[9];
            local_148.data._M_elems[0xb] = local_1f8.data._M_elems[10];
            local_148.data._M_elems[0xc] = local_1f8.data._M_elems[0xb];
            local_148.data._M_elems[0xd] = local_1f8.data._M_elems[0xc];
            local_148.prec_elem = local_198.prec_elem;
            local_148.fpclass = local_198.fpclass;
            local_198.data._M_elems[1] = local_1f8.data._M_elems[0];
            local_198.data._M_elems[2] = local_1f8.data._M_elems[1];
            local_198.data._M_elems[3] = local_1f8.data._M_elems[2];
            local_198.data._M_elems[4] = local_1f8.data._M_elems[3];
            local_198.data._M_elems[5] = local_1f8.data._M_elems[4];
            local_198.data._M_elems[6] = local_1f8.data._M_elems[5];
            local_198.data._M_elems[7] = local_1f8.data._M_elems[6];
            local_198.data._M_elems[8] = local_1f8.data._M_elems[7];
            local_198.data._M_elems[9] = local_1f8.data._M_elems[8];
            local_198.data._M_elems[10] = local_1f8.data._M_elems[9];
            local_198.data._M_elems[0xb] = local_1f8.data._M_elems[10];
            local_198.data._M_elems[0xc] = local_1f8.data._M_elems[0xb];
            local_148.data._M_elems[0] = local_198.data._M_elems[0];
            local_148.data._M_elems[1] = local_1f8.data._M_elems[0];
            local_148.data._M_elems[2] = local_1f8.data._M_elems[1];
            local_148.data._M_elems._56_5_ = local_198.data._M_elems._56_5_;
            local_148.data._M_elems[0xf]._1_3_ = local_198.data._M_elems[0xf]._1_3_;
            local_148.exp = local_198.exp;
            local_148.neg = local_198.neg;
            clearDualBounds(this,(this->
                                 super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 ).thedesc.colstat.data[uVar24 - 2],
                            (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)&local_198,
                            (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)&local_148);
            local_1f8.data._M_elems[0xe] = local_148.data._M_elems[0xe];
            fVar15 = local_148.fpclass;
            if (this->theRep *
                (this->
                super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).thedesc.colstat.data[uVar24 - 2] < 1) {
              pnVar18 = (this->thePvec->
                        super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              local_1f8.data._M_elems[0] = local_148.data._M_elems[0];
              local_1f8.data._M_elems[0xd] = local_148.data._M_elems[0xd];
              local_1f8.data._M_elems[0xf] =
                   (uint)(CONCAT35(local_148.data._M_elems[0xf]._1_3_,local_148.data._M_elems._56_5_
                                  ) >> 0x20);
              local_1f8.data._M_elems[9] = local_148.data._M_elems[9];
              local_1f8.data._M_elems[10] = local_148.data._M_elems[10];
              local_1f8.data._M_elems[0xb] = local_148.data._M_elems[0xb];
              local_1f8.data._M_elems[0xc] = local_148.data._M_elems[0xc];
              local_1f8.data._M_elems[5] = local_148.data._M_elems[5];
              local_1f8.data._M_elems[6] = local_148.data._M_elems[6];
              local_1f8.data._M_elems[7] = local_148.data._M_elems[7];
              local_1f8.data._M_elems[8] = local_148.data._M_elems[8];
              local_1f8.data._M_elems[1] = local_148.data._M_elems[1];
              local_1f8.data._M_elems[2] = local_148.data._M_elems[2];
              local_1f8.data._M_elems[3] = local_148.data._M_elems[3];
              local_1f8.data._M_elems[4] = local_148.data._M_elems[4];
              local_1f8.exp = local_148.exp;
              local_1f8.neg =
                   (bool)((local_148.data._M_elems[0] != 0 || fVar15 != cpp_dec_float_finite) ^
                         local_148.neg);
              local_1f8.fpclass = local_148.fpclass;
              local_1f8.prec_elem = local_148.prec_elem;
              boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=
                        (&local_1f8,&local_80);
              if (((*(int *)((long)(pnVar18->m_backend).data._M_elems + lVar19 + -8) == 2) ||
                  (local_1f8.fpclass == cpp_dec_float_NaN)) ||
                 (iVar14 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                     ((cpp_dec_float<100U,_int,_void> *)
                                      ((long)pnVar18[0xffffffffffffffff].m_backend.data._M_elems +
                                      lVar19),&local_1f8), -1 < iVar14)) {
                pnVar18 = (this->theUCbound).val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                local_f8.data._M_elems[1] = local_148.data._M_elems[1];
                local_f8.data._M_elems[0] = local_148.data._M_elems[0];
                local_f8.data._M_elems[3] = local_148.data._M_elems[3];
                local_f8.data._M_elems[2] = local_148.data._M_elems[2];
                local_f8.data._M_elems[5] = local_148.data._M_elems[5];
                local_f8.data._M_elems[4] = local_148.data._M_elems[4];
                local_f8.data._M_elems[7] = local_148.data._M_elems[7];
                local_f8.data._M_elems[6] = local_148.data._M_elems[6];
                local_f8.data._M_elems[9] = local_148.data._M_elems[9];
                local_f8.data._M_elems[8] = local_148.data._M_elems[8];
                local_f8.data._M_elems[0xb] = local_148.data._M_elems[0xb];
                local_f8.data._M_elems[10] = local_148.data._M_elems[10];
                local_f8.data._M_elems[0xd] = local_148.data._M_elems[0xd];
                local_f8.data._M_elems[0xc] = local_148.data._M_elems[0xc];
                local_f8.data._M_elems[0xf]._1_3_ = local_148.data._M_elems[0xf]._1_3_;
                local_f8.data._M_elems._56_5_ = local_148.data._M_elems._56_5_;
                local_f8.exp = local_148.exp;
                local_f8.neg = local_148.neg;
                local_f8.fpclass = local_148.fpclass;
                local_f8.prec_elem = local_148.prec_elem;
                if (local_148.fpclass != cpp_dec_float_finite || local_148.data._M_elems[0] != 0) {
                  local_f8.neg = (bool)(local_148.neg ^ 1);
                }
                puVar16 = (undefined8 *)((long)pnVar18[-1].m_backend.data._M_elems + lVar19);
                local_1f8.fpclass = cpp_dec_float_finite;
                local_1f8.prec_elem = 0x10;
                local_1f8.data._M_elems[0] = 0;
                local_1f8.data._M_elems[1] = 0;
                local_1f8.data._M_elems[2] = 0;
                local_1f8.data._M_elems[3] = 0;
                local_1f8.data._M_elems[4] = 0;
                local_1f8.data._M_elems[5] = 0;
                local_1f8.data._M_elems[6] = 0;
                local_1f8.data._M_elems[7] = 0;
                local_1f8.data._M_elems[8] = 0;
                local_1f8.data._M_elems[9] = 0;
                local_1f8.data._M_elems[10] = 0;
                local_1f8.data._M_elems[0xb] = 0;
                local_1f8.data._M_elems[0xc] = 0;
                local_1f8.data._M_elems[0xd] = 0;
                local_1f8.data._M_elems[0xe] = 0;
                local_1f8.data._M_elems[0xf] = 0;
                local_1f8.exp = 0;
                local_1f8.neg = false;
                if ((cpp_dec_float<100U,_int,_void> *)puVar16 != &local_1f8) {
                  uVar6 = *puVar16;
                  uVar7 = *(undefined8 *)((long)(pnVar18->m_backend).data._M_elems + lVar19 + -0x48)
                  ;
                  uVar8 = *(undefined8 *)((long)(&(pnVar18->m_backend).data + -1) + lVar19);
                  uVar9 = *(undefined8 *)((long)(pnVar18->m_backend).data._M_elems + lVar19 + -0x38)
                  ;
                  uVar10 = *(undefined8 *)
                            ((long)(pnVar18->m_backend).data._M_elems + lVar19 + -0x30);
                  uVar11 = *(undefined8 *)
                            ((long)(pnVar18->m_backend).data._M_elems + lVar19 + -0x28);
                  uVar12 = *(undefined8 *)
                            ((long)(pnVar18->m_backend).data._M_elems + lVar19 + -0x20);
                  uVar13 = *(undefined8 *)
                            ((long)(pnVar18->m_backend).data._M_elems + lVar19 + -0x18);
                  local_1f8.data._M_elems[0xc] = (uint)uVar12;
                  local_1f8.data._M_elems[0xd] = (uint)((ulong)uVar12 >> 0x20);
                  local_1f8.data._M_elems[0xe] = (uint)uVar13;
                  local_1f8.data._M_elems[0xf] = (uint)((ulong)uVar13 >> 0x20);
                  local_1f8.data._M_elems[8] = (uint)uVar10;
                  local_1f8.data._M_elems[9] = (uint)((ulong)uVar10 >> 0x20);
                  local_1f8.data._M_elems[10] = (uint)uVar11;
                  local_1f8.data._M_elems[0xb] = (uint)((ulong)uVar11 >> 0x20);
                  local_1f8.data._M_elems[4] = (uint)uVar8;
                  local_1f8.data._M_elems[5] = (uint)((ulong)uVar8 >> 0x20);
                  local_1f8.data._M_elems[6] = (uint)uVar9;
                  local_1f8.data._M_elems[7] = (uint)((ulong)uVar9 >> 0x20);
                  local_1f8.data._M_elems[0] = (uint)uVar6;
                  local_1f8.data._M_elems[1] = (uint)((ulong)uVar6 >> 0x20);
                  local_1f8.data._M_elems[2] = (uint)uVar7;
                  local_1f8.data._M_elems[3] = (uint)((ulong)uVar7 >> 0x20);
                  local_1f8.exp =
                       *(int *)((long)(pnVar18->m_backend).data._M_elems + lVar19 + -0x10);
                  local_1f8.neg =
                       *(bool *)((long)(pnVar18->m_backend).data._M_elems + lVar19 + -0xc);
                  local_1f8._72_8_ =
                       *(undefined8 *)((long)(pnVar18->m_backend).data._M_elems + lVar19 + -8);
                }
                boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                          (&local_1f8,&local_f8);
                boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=
                          (local_1a0,&local_1f8);
              }
              else {
                local_1f8.data._M_elems[0] = local_148.data._M_elems[1];
                local_1f8.data._M_elems[1] = local_148.data._M_elems[2];
                local_1f8.data._M_elems[2] = local_148.data._M_elems[3];
                local_1f8.data._M_elems[3] = local_148.data._M_elems[4];
                local_1f8.data._M_elems[4] = local_148.data._M_elems[5];
                local_1f8.data._M_elems[5] = local_148.data._M_elems[6];
                local_1f8.data._M_elems[6] = local_148.data._M_elems[7];
                local_1f8.data._M_elems[7] = local_148.data._M_elems[8];
                local_1f8.data._M_elems[8] = local_148.data._M_elems[9];
                local_1f8.data._M_elems[9] = local_148.data._M_elems[10];
                local_1f8.data._M_elems[10] = local_148.data._M_elems[0xb];
                local_1f8.data._M_elems[0xb] = local_148.data._M_elems[0xc];
                local_1f8.data._M_elems[0xc] = local_148.data._M_elems[0xd];
                local_1f8.data._M_elems[0xd] = local_148.data._M_elems[0xe];
                local_1f8.data._M_elems[0xe] =
                     (uint)(CONCAT35(local_148.data._M_elems[0xf]._1_3_,
                                     local_148.data._M_elems._56_5_) >> 0x20);
                pnVar18 = (this->theUCbound).val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                *(uint *)((long)pnVar18[-1].m_backend.data._M_elems + lVar19) =
                     local_148.data._M_elems[0];
                puVar16 = (undefined8 *)((long)(pnVar18->m_backend).data._M_elems + lVar19 + -0x4c);
                *puVar16 = CONCAT44(local_148.data._M_elems[2],local_148.data._M_elems[1]);
                puVar16[1] = CONCAT44(local_148.data._M_elems[4],local_148.data._M_elems[3]);
                puVar16 = (undefined8 *)((long)(pnVar18->m_backend).data._M_elems + lVar19 + -0x3c);
                *puVar16 = CONCAT44(local_148.data._M_elems[6],local_148.data._M_elems[5]);
                puVar16[1] = CONCAT44(local_148.data._M_elems[8],local_148.data._M_elems[7]);
                puVar16 = (undefined8 *)((long)(pnVar18->m_backend).data._M_elems + lVar19 + -0x2c);
                *puVar16 = CONCAT44(local_148.data._M_elems[10],local_148.data._M_elems[9]);
                puVar16[1] = CONCAT44(local_148.data._M_elems[0xc],local_148.data._M_elems[0xb]);
                puVar16 = (undefined8 *)((long)(pnVar18->m_backend).data._M_elems + lVar19 + -0x20);
                *puVar16 = CONCAT44(local_148.data._M_elems[0xd],local_148.data._M_elems[0xc]);
                puVar16[1] = CONCAT44(local_1f8.data._M_elems[0xe],local_1f8.data._M_elems[0xd]);
                *(int *)((long)(pnVar18->m_backend).data._M_elems + lVar19 + -0x10) = local_148.exp;
                *(char *)((long)(pnVar18->m_backend).data._M_elems + lVar19 + -0xc) =
                     (local_148.data._M_elems[0] != 0 || local_148.fpclass != cpp_dec_float_finite)
                     ^ local_148.neg;
                *(undefined8 *)((long)(pnVar18->m_backend).data._M_elems + lVar19 + -8) =
                     local_148._72_8_;
                if (((local_148.fpclass != cpp_dec_float_NaN) &&
                    (local_198.fpclass != cpp_dec_float_NaN)) &&
                   (iVar14 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::
                             compare(&local_148,&local_198), iVar14 == 0)) {
                  local_1f8.data._M_elems[0xd] = local_198.data._M_elems[0xe];
                  local_1f8.data._M_elems[0xe] =
                       (uint)(CONCAT35(local_198.data._M_elems[0xf]._1_3_,
                                       local_198.data._M_elems._56_5_) >> 0x20);
                  pnVar18 = (this->theLCbound).val.
                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                  *(uint *)((long)pnVar18[-1].m_backend.data._M_elems + lVar19) =
                       local_198.data._M_elems[0];
                  puVar16 = (undefined8 *)
                            ((long)(pnVar18->m_backend).data._M_elems + lVar19 + -0x4c);
                  *puVar16 = CONCAT44(local_198.data._M_elems[2],local_198.data._M_elems[1]);
                  puVar16[1] = CONCAT44(local_198.data._M_elems[4],local_198.data._M_elems[3]);
                  puVar16 = (undefined8 *)
                            ((long)(pnVar18->m_backend).data._M_elems + lVar19 + -0x3c);
                  *puVar16 = CONCAT44(local_198.data._M_elems[6],local_198.data._M_elems[5]);
                  puVar16[1] = CONCAT44(local_198.data._M_elems[8],local_198.data._M_elems[7]);
                  puVar16 = (undefined8 *)
                            ((long)(pnVar18->m_backend).data._M_elems + lVar19 + -0x2c);
                  *puVar16 = CONCAT44(local_198.data._M_elems[10],local_198.data._M_elems[9]);
                  puVar16[1] = CONCAT44(local_198.data._M_elems[0xc],local_198.data._M_elems[0xb]);
                  puVar16 = (undefined8 *)
                            ((long)(pnVar18->m_backend).data._M_elems + lVar19 + -0x20);
                  *puVar16 = CONCAT44(local_198.data._M_elems[0xd],local_198.data._M_elems[0xc]);
                  puVar16[1] = CONCAT44(local_1f8.data._M_elems[0xe],local_1f8.data._M_elems[0xd]);
                  *(int *)((long)(pnVar18->m_backend).data._M_elems + lVar19 + -0x10) =
                       local_198.exp;
                  *(char *)((long)(pnVar18->m_backend).data._M_elems + lVar19 + -0xc) =
                       (local_198.data._M_elems[0] != 0 || local_198.fpclass != cpp_dec_float_finite
                       ) ^ local_198.neg;
                  *(undefined8 *)((long)(pnVar18->m_backend).data._M_elems + lVar19 + -8) =
                       local_198._72_8_;
                }
              }
              pnVar18 = (this->thePvec->
                        super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              local_1f8.data._M_elems[0] = local_198.data._M_elems[0];
              local_1f8.data._M_elems[0xd] = local_198.data._M_elems[0xd];
              local_1f8.data._M_elems[0xe] = local_198.data._M_elems[0xe];
              local_1f8.data._M_elems[0xf] =
                   (uint)(CONCAT35(local_198.data._M_elems[0xf]._1_3_,local_198.data._M_elems._56_5_
                                  ) >> 0x20);
              local_1f8.data._M_elems[9] = local_198.data._M_elems[9];
              local_1f8.data._M_elems[10] = local_198.data._M_elems[10];
              local_1f8.data._M_elems[0xb] = local_198.data._M_elems[0xb];
              local_1f8.data._M_elems[0xc] = local_198.data._M_elems[0xc];
              local_1f8.data._M_elems[5] = local_198.data._M_elems[5];
              local_1f8.data._M_elems[6] = local_198.data._M_elems[6];
              local_1f8.data._M_elems[7] = local_198.data._M_elems[7];
              local_1f8.data._M_elems[8] = local_198.data._M_elems[8];
              local_1f8.data._M_elems[1] = local_198.data._M_elems[1];
              local_1f8.data._M_elems[2] = local_198.data._M_elems[2];
              local_1f8.data._M_elems[3] = local_198.data._M_elems[3];
              local_1f8.data._M_elems[4] = local_198.data._M_elems[4];
              local_1f8.exp = local_198.exp;
              local_1f8.neg =
                   (bool)((local_198.data._M_elems[0] != 0 ||
                          local_198.fpclass != cpp_dec_float_finite) ^ local_198.neg);
              local_1f8.fpclass = local_198.fpclass;
              local_1f8.prec_elem = local_198.prec_elem;
              boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                        (&local_1f8,&local_80);
              if (((*(int *)((long)(pnVar18->m_backend).data._M_elems + lVar19 + -8) == 2) ||
                  (local_1f8.fpclass == cpp_dec_float_NaN)) ||
                 (iVar14 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                     ((cpp_dec_float<100U,_int,_void> *)
                                      ((long)pnVar18[0xffffffffffffffff].m_backend.data._M_elems +
                                      lVar19),&local_1f8), iVar14 < 1)) {
                local_f8.data._M_elems[1] = local_198.data._M_elems[1];
                local_f8.data._M_elems[0] = local_198.data._M_elems[0];
                local_f8.data._M_elems[3] = local_198.data._M_elems[3];
                local_f8.data._M_elems[2] = local_198.data._M_elems[2];
                local_f8.data._M_elems[5] = local_198.data._M_elems[5];
                local_f8.data._M_elems[4] = local_198.data._M_elems[4];
                local_f8.data._M_elems[7] = local_198.data._M_elems[7];
                local_f8.data._M_elems[6] = local_198.data._M_elems[6];
                local_f8.data._M_elems[9] = local_198.data._M_elems[9];
                local_f8.data._M_elems[8] = local_198.data._M_elems[8];
                local_f8.data._M_elems[0xb] = local_198.data._M_elems[0xb];
                local_f8.data._M_elems[10] = local_198.data._M_elems[10];
                local_f8.data._M_elems[0xd] = local_198.data._M_elems[0xd];
                local_f8.data._M_elems[0xc] = local_198.data._M_elems[0xc];
                local_f8.data._M_elems[0xf]._1_3_ = local_198.data._M_elems[0xf]._1_3_;
                local_f8.data._M_elems._56_5_ = local_198.data._M_elems._56_5_;
                local_f8.exp = local_198.exp;
                local_f8.neg = local_198.neg;
                fVar15 = local_198.fpclass;
                iVar20 = local_198.prec_elem;
                local_f8.fpclass = local_198.fpclass;
                local_f8.prec_elem = local_198.prec_elem;
                if (local_198.data._M_elems[0] != 0 || fVar15 != cpp_dec_float_finite) {
LAB_00395e44:
                  local_f8.neg = (bool)(local_198.neg ^ 1);
                  local_f8.exp = local_198.exp;
                  local_f8._72_8_ = local_198._72_8_;
                }
LAB_00395e4e:
                pcVar21 = (cpp_dec_float<100U,_int,_void> *)
                          ((long)(this->theLCbound).val.
                                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data.
                                 _M_elems + lVar19);
                local_1f8.fpclass = cpp_dec_float_finite;
                local_1f8.prec_elem = 0x10;
                local_1f8.data._M_elems[0] = 0;
                local_1f8.data._M_elems[1] = 0;
                local_1f8.data._M_elems[2] = 0;
                local_1f8.data._M_elems[3] = 0;
                local_1f8.data._M_elems[4] = 0;
                local_1f8.data._M_elems[5] = 0;
                local_1f8.data._M_elems[6] = 0;
                local_1f8.data._M_elems[7] = 0;
                local_1f8.data._M_elems[8] = 0;
                local_1f8.data._M_elems[9] = 0;
                local_1f8.data._M_elems[10] = 0;
                local_1f8.data._M_elems[0xb] = 0;
                local_1f8.data._M_elems[0xc] = 0;
                local_1f8.data._M_elems[0xd] = 0;
                local_1f8.data._M_elems[0xe] = 0;
                local_1f8.data._M_elems[0xf] = 0;
                local_1f8.exp = 0;
                local_1f8.neg = false;
                local_198.exp = local_f8.exp;
                local_198._72_8_ = local_f8._72_8_;
                if (pcVar21 != &local_1f8) {
                  local_1f8.data._M_elems[0xc] = local_198.data._M_elems[0xc];
                  local_1f8.data._M_elems[0xd] = local_198.data._M_elems[0xd];
                  local_1f8.data._M_elems[0xe] = local_198.data._M_elems[0xe];
                  local_1f8.data._M_elems[0xf] =
                       (uint)(CONCAT35(local_198.data._M_elems[0xf]._1_3_,
                                       local_198.data._M_elems._56_5_) >> 0x20);
                  local_1f8.data._M_elems[8] = local_198.data._M_elems[8];
                  local_1f8.data._M_elems[9] = local_198.data._M_elems[9];
                  local_1f8.data._M_elems[10] = local_198.data._M_elems[10];
                  local_1f8.data._M_elems[0xb] = local_198.data._M_elems[0xb];
                  local_1f8.data._M_elems[4] = local_198.data._M_elems[4];
                  local_1f8.data._M_elems[5] = local_198.data._M_elems[5];
                  local_1f8.data._M_elems[6] = local_198.data._M_elems[6];
                  local_1f8.data._M_elems[7] = local_198.data._M_elems[7];
                  local_1f8.data._M_elems[0] = local_198.data._M_elems[0];
                  local_1f8.data._M_elems[1] = local_198.data._M_elems[1];
                  local_1f8.data._M_elems[2] = local_198.data._M_elems[2];
                  local_1f8.data._M_elems[3] = local_198.data._M_elems[3];
                  local_1f8.prec_elem = iVar20;
                  local_1f8.fpclass = fVar15;
                  local_1f8.exp = local_f8.exp;
                  local_1f8.neg = local_f8.neg;
                  goto LAB_00395ed6;
                }
                boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                          (&local_1f8,&local_f8);
                if (local_1f8.data._M_elems[0] != 0 || local_1f8.fpclass != cpp_dec_float_finite) {
                  local_1f8.neg = (bool)(local_1f8.neg ^ 1);
                }
                goto LAB_00395edb;
              }
              local_1f8.data._M_elems[0] = local_198.data._M_elems[1];
              local_1f8.data._M_elems[1] = local_198.data._M_elems[2];
              local_1f8.data._M_elems[2] = local_198.data._M_elems[3];
              local_1f8.data._M_elems[3] = local_198.data._M_elems[4];
              local_1f8.data._M_elems[4] = local_198.data._M_elems[5];
              local_1f8.data._M_elems[5] = local_198.data._M_elems[6];
              local_1f8.data._M_elems[6] = local_198.data._M_elems[7];
              local_1f8.data._M_elems[7] = local_198.data._M_elems[8];
              local_1f8.data._M_elems[8] = local_198.data._M_elems[9];
              local_1f8.data._M_elems[9] = local_198.data._M_elems[10];
              local_1f8.data._M_elems[10] = local_198.data._M_elems[0xb];
              local_1f8.data._M_elems[0xb] = local_198.data._M_elems[0xc];
              local_1f8.data._M_elems[0xc] = local_198.data._M_elems[0xd];
              local_1f8.data._M_elems[0xd] = local_198.data._M_elems[0xe];
              local_1f8.data._M_elems[0xe] =
                   (uint)(CONCAT35(local_198.data._M_elems[0xf]._1_3_,local_198.data._M_elems._56_5_
                                  ) >> 0x20);
              pnVar18 = (this->theLCbound).val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              *(uint *)((long)pnVar18[-1].m_backend.data._M_elems + lVar19) =
                   local_198.data._M_elems[0];
              puVar16 = (undefined8 *)((long)(pnVar18->m_backend).data._M_elems + lVar19 + -0x4c);
              *puVar16 = CONCAT44(local_198.data._M_elems[2],local_198.data._M_elems[1]);
              puVar16[1] = CONCAT44(local_198.data._M_elems[4],local_198.data._M_elems[3]);
              puVar16 = (undefined8 *)((long)(pnVar18->m_backend).data._M_elems + lVar19 + -0x3c);
              *puVar16 = CONCAT44(local_198.data._M_elems[6],local_198.data._M_elems[5]);
              puVar16[1] = CONCAT44(local_198.data._M_elems[8],local_198.data._M_elems[7]);
              puVar16 = (undefined8 *)((long)(pnVar18->m_backend).data._M_elems + lVar19 + -0x2c);
              *puVar16 = CONCAT44(local_198.data._M_elems[10],local_198.data._M_elems[9]);
              puVar16[1] = CONCAT44(local_198.data._M_elems[0xc],local_198.data._M_elems[0xb]);
              puVar16 = (undefined8 *)((long)(pnVar18->m_backend).data._M_elems + lVar19 + -0x20);
              *puVar16 = CONCAT44(local_198.data._M_elems[0xd],local_198.data._M_elems[0xc]);
              puVar16[1] = CONCAT44(local_1f8.data._M_elems[0xe],local_1f8.data._M_elems[0xd]);
              *(int *)((long)(pnVar18->m_backend).data._M_elems + lVar19 + -0x10) = local_198.exp;
              *(char *)((long)(pnVar18->m_backend).data._M_elems + lVar19 + -0xc) =
                   (local_198.data._M_elems[0] != 0 || local_198.fpclass != cpp_dec_float_finite) ^
                   local_198.neg;
              *(undefined8 *)((long)(pnVar18->m_backend).data._M_elems + lVar19 + -8) =
                   local_198._72_8_;
              if (((local_148.fpclass != cpp_dec_float_NaN) &&
                  (local_198.fpclass != cpp_dec_float_NaN)) &&
                 (iVar14 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                     (&local_148,&local_198), iVar14 == 0)) {
                local_1f8.data._M_elems[0xd] = local_148.data._M_elems[0xe];
                local_1f8.data._M_elems[0xe] =
                     (uint)(CONCAT35(local_148.data._M_elems[0xf]._1_3_,
                                     local_148.data._M_elems._56_5_) >> 0x20);
                pnVar18 = (this->theUCbound).val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                *(uint *)((long)pnVar18[-1].m_backend.data._M_elems + lVar19) =
                     local_148.data._M_elems[0];
                puVar16 = (undefined8 *)((long)(pnVar18->m_backend).data._M_elems + lVar19 + -0x4c);
                *puVar16 = CONCAT44(local_148.data._M_elems[2],local_148.data._M_elems[1]);
                puVar16[1] = CONCAT44(local_148.data._M_elems[4],local_148.data._M_elems[3]);
                puVar16 = (undefined8 *)((long)(pnVar18->m_backend).data._M_elems + lVar19 + -0x3c);
                *puVar16 = CONCAT44(local_148.data._M_elems[6],local_148.data._M_elems[5]);
                puVar16[1] = CONCAT44(local_148.data._M_elems[8],local_148.data._M_elems[7]);
                puVar16 = (undefined8 *)((long)(pnVar18->m_backend).data._M_elems + lVar19 + -0x2c);
                *puVar16 = CONCAT44(local_148.data._M_elems[10],local_148.data._M_elems[9]);
                puVar16[1] = CONCAT44(local_148.data._M_elems[0xc],local_148.data._M_elems[0xb]);
                puVar16 = (undefined8 *)((long)(pnVar18->m_backend).data._M_elems + lVar19 + -0x20);
                *puVar16 = CONCAT44(local_148.data._M_elems[0xd],local_148.data._M_elems[0xc]);
                puVar16[1] = CONCAT44(local_1f8.data._M_elems[0xe],local_1f8.data._M_elems[0xd]);
                *(int *)((long)(pnVar18->m_backend).data._M_elems + lVar19 + -0x10) = local_148.exp;
                *(char *)((long)(pnVar18->m_backend).data._M_elems + lVar19 + -0xc) =
                     (local_148.data._M_elems[0] != 0 || local_148.fpclass != cpp_dec_float_finite)
                     ^ local_148.neg;
                *(undefined8 *)((long)(pnVar18->m_backend).data._M_elems + lVar19 + -8) =
                     local_148._72_8_;
              }
            }
            else {
              pnVar18 = (this->theUCbound).val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              local_1f8.data._M_elems[0] = local_148.data._M_elems[0];
              local_1f8.data._M_elems[1] = local_148.data._M_elems[1];
              local_1f8.data._M_elems[2] = local_148.data._M_elems[2];
              local_1f8.data._M_elems[3] = local_148.data._M_elems[3];
              local_1f8.data._M_elems[0xc] = local_148.data._M_elems[0xc];
              local_1f8.data._M_elems[0xd] = local_148.data._M_elems[0xd];
              local_1f8.data._M_elems[0xf] =
                   (uint)(CONCAT35(local_148.data._M_elems[0xf]._1_3_,local_148.data._M_elems._56_5_
                                  ) >> 0x20);
              local_1f8.data._M_elems[8] = local_148.data._M_elems[8];
              local_1f8.data._M_elems[9] = local_148.data._M_elems[9];
              local_1f8.data._M_elems[10] = local_148.data._M_elems[10];
              local_1f8.data._M_elems[0xb] = local_148.data._M_elems[0xb];
              local_1f8.data._M_elems[4] = local_148.data._M_elems[4];
              local_1f8.data._M_elems[5] = local_148.data._M_elems[5];
              local_1f8.data._M_elems[6] = local_148.data._M_elems[6];
              local_1f8.data._M_elems[7] = local_148.data._M_elems[7];
              local_1f8.exp = local_148.exp;
              local_1f8.neg = local_148.neg;
              local_1f8.fpclass = local_148.fpclass;
              local_1f8.prec_elem = local_148.prec_elem;
              if (local_148.data._M_elems[0] != 0 || fVar15 != cpp_dec_float_finite) {
                local_1f8.neg = (bool)(local_148.neg ^ 1);
              }
              if (((fVar15 == cpp_dec_float_NaN) ||
                  (*(int *)((long)(pnVar18->m_backend).data._M_elems + lVar19 + -8) == 2)) ||
                 (iVar14 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                     ((cpp_dec_float<100U,_int,_void> *)
                                      ((long)pnVar18[-1].m_backend.data._M_elems + lVar19),
                                      &local_1f8), iVar14 < 1)) {
                pnVar18 = (this->theLCbound).val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                local_1f8.data._M_elems[0] = local_198.data._M_elems[0];
                local_1f8.data._M_elems[1] = local_198.data._M_elems[1];
                local_1f8.data._M_elems[2] = local_198.data._M_elems[2];
                local_1f8.data._M_elems[3] = local_198.data._M_elems[3];
                local_1f8.data._M_elems[0xc] = local_198.data._M_elems[0xc];
                local_1f8.data._M_elems[0xd] = local_198.data._M_elems[0xd];
                local_1f8.data._M_elems[0xe] = local_198.data._M_elems[0xe];
                local_1f8.data._M_elems[0xf] =
                     (uint)(CONCAT35(local_198.data._M_elems[0xf]._1_3_,
                                     local_198.data._M_elems._56_5_) >> 0x20);
                local_1f8.data._M_elems[8] = local_198.data._M_elems[8];
                local_1f8.data._M_elems[9] = local_198.data._M_elems[9];
                local_1f8.data._M_elems[10] = local_198.data._M_elems[10];
                local_1f8.data._M_elems[0xb] = local_198.data._M_elems[0xb];
                local_1f8.data._M_elems[4] = local_198.data._M_elems[4];
                local_1f8.data._M_elems[5] = local_198.data._M_elems[5];
                local_1f8.data._M_elems[6] = local_198.data._M_elems[6];
                local_1f8.data._M_elems[7] = local_198.data._M_elems[7];
                local_1f8.exp = local_198.exp;
                local_1f8.neg = local_198.neg;
                local_1f8.fpclass = local_198.fpclass;
                local_1f8.prec_elem = local_198.prec_elem;
                if (local_198.data._M_elems[0] != 0 || local_198.fpclass != cpp_dec_float_finite) {
                  local_1f8.neg = (bool)(local_198.neg ^ 1);
                }
                if (((local_198.fpclass != cpp_dec_float_NaN) &&
                    (*(int *)((long)(pnVar18->m_backend).data._M_elems + lVar19 + -8) != 2)) &&
                   (iVar14 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::
                             compare((cpp_dec_float<100U,_int,_void> *)
                                     ((long)pnVar18[-1].m_backend.data._M_elems + lVar19),&local_1f8
                                    ), iVar14 < 0)) {
                  local_f8.data._M_elems[1] = local_198.data._M_elems[1];
                  local_f8.data._M_elems[0] = local_198.data._M_elems[0];
                  local_f8.data._M_elems[3] = local_198.data._M_elems[3];
                  local_f8.data._M_elems[2] = local_198.data._M_elems[2];
                  local_f8.data._M_elems[5] = local_198.data._M_elems[5];
                  local_f8.data._M_elems[4] = local_198.data._M_elems[4];
                  local_f8.data._M_elems[7] = local_198.data._M_elems[7];
                  local_f8.data._M_elems[6] = local_198.data._M_elems[6];
                  local_f8.data._M_elems[9] = local_198.data._M_elems[9];
                  local_f8.data._M_elems[8] = local_198.data._M_elems[8];
                  local_f8.data._M_elems[0xb] = local_198.data._M_elems[0xb];
                  local_f8.data._M_elems[10] = local_198.data._M_elems[10];
                  local_f8.data._M_elems[0xd] = local_198.data._M_elems[0xd];
                  local_f8.data._M_elems[0xc] = local_198.data._M_elems[0xc];
                  local_f8.data._M_elems[0xf]._1_3_ = local_198.data._M_elems[0xf]._1_3_;
                  local_f8.data._M_elems._56_5_ = local_198.data._M_elems._56_5_;
                  local_f8.exp = local_198.exp;
                  local_f8.neg = local_198.neg;
                  fVar15 = local_198.fpclass;
                  iVar20 = local_198.prec_elem;
                  local_f8.fpclass = local_198.fpclass;
                  local_f8.prec_elem = local_198.prec_elem;
                  if (local_198.data._M_elems[0] != 0 || fVar15 != cpp_dec_float_finite)
                  goto LAB_00395e44;
                  goto LAB_00395e4e;
                }
              }
              else {
                pnVar18 = (this->theUCbound).val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                local_f8.data._M_elems[1] = local_148.data._M_elems[1];
                local_f8.data._M_elems[0] = local_148.data._M_elems[0];
                local_f8.data._M_elems[3] = local_148.data._M_elems[3];
                local_f8.data._M_elems[2] = local_148.data._M_elems[2];
                local_f8.data._M_elems[5] = local_148.data._M_elems[5];
                local_f8.data._M_elems[4] = local_148.data._M_elems[4];
                local_f8.data._M_elems[7] = local_148.data._M_elems[7];
                local_f8.data._M_elems[6] = local_148.data._M_elems[6];
                local_f8.data._M_elems[9] = local_148.data._M_elems[9];
                local_f8.data._M_elems[8] = local_148.data._M_elems[8];
                local_f8.data._M_elems[0xb] = local_148.data._M_elems[0xb];
                local_f8.data._M_elems[10] = local_148.data._M_elems[10];
                local_f8.data._M_elems[0xd] = local_148.data._M_elems[0xd];
                local_f8.data._M_elems[0xc] = local_148.data._M_elems[0xc];
                local_f8.data._M_elems[0xf]._1_3_ = local_148.data._M_elems[0xf]._1_3_;
                local_f8.data._M_elems._56_5_ = local_148.data._M_elems._56_5_;
                local_f8.exp = local_148.exp;
                local_f8.neg = local_148.neg;
                local_f8.fpclass = local_148.fpclass;
                local_f8.prec_elem = local_148.prec_elem;
                if (local_148.fpclass != cpp_dec_float_finite || local_148.data._M_elems[0] != 0) {
                  local_f8.neg = (bool)(local_148.neg ^ 1);
                }
                puVar16 = (undefined8 *)((long)pnVar18[-1].m_backend.data._M_elems + lVar19);
                local_1f8.fpclass = cpp_dec_float_finite;
                local_1f8.prec_elem = 0x10;
                local_1f8.data._M_elems[0] = 0;
                local_1f8.data._M_elems[1] = 0;
                local_1f8.data._M_elems[2] = 0;
                local_1f8.data._M_elems[3] = 0;
                local_1f8.data._M_elems[4] = 0;
                local_1f8.data._M_elems[5] = 0;
                local_1f8.data._M_elems[6] = 0;
                local_1f8.data._M_elems[7] = 0;
                local_1f8.data._M_elems[8] = 0;
                local_1f8.data._M_elems[9] = 0;
                local_1f8.data._M_elems[10] = 0;
                local_1f8.data._M_elems[0xb] = 0;
                local_1f8.data._M_elems[0xc] = 0;
                local_1f8.data._M_elems[0xd] = 0;
                local_1f8.data._M_elems[0xe] = 0;
                local_1f8.data._M_elems[0xf] = 0;
                local_1f8.exp = 0;
                local_1f8.neg = false;
                if ((cpp_dec_float<100U,_int,_void> *)puVar16 != &local_1f8) {
                  uVar6 = *puVar16;
                  uVar7 = *(undefined8 *)((long)(pnVar18->m_backend).data._M_elems + lVar19 + -0x48)
                  ;
                  uVar8 = *(undefined8 *)((long)(&(pnVar18->m_backend).data + -1) + lVar19);
                  uVar9 = *(undefined8 *)((long)(pnVar18->m_backend).data._M_elems + lVar19 + -0x38)
                  ;
                  uVar10 = *(undefined8 *)
                            ((long)(pnVar18->m_backend).data._M_elems + lVar19 + -0x30);
                  uVar11 = *(undefined8 *)
                            ((long)(pnVar18->m_backend).data._M_elems + lVar19 + -0x28);
                  uVar12 = *(undefined8 *)
                            ((long)(pnVar18->m_backend).data._M_elems + lVar19 + -0x20);
                  uVar13 = *(undefined8 *)
                            ((long)(pnVar18->m_backend).data._M_elems + lVar19 + -0x18);
                  local_1f8.data._M_elems[0xc] = (uint)uVar12;
                  local_1f8.data._M_elems[0xd] = (uint)((ulong)uVar12 >> 0x20);
                  local_1f8.data._M_elems[0xe] = (uint)uVar13;
                  local_1f8.data._M_elems[0xf] = (uint)((ulong)uVar13 >> 0x20);
                  local_1f8.data._M_elems[8] = (uint)uVar10;
                  local_1f8.data._M_elems[9] = (uint)((ulong)uVar10 >> 0x20);
                  local_1f8.data._M_elems[10] = (uint)uVar11;
                  local_1f8.data._M_elems[0xb] = (uint)((ulong)uVar11 >> 0x20);
                  local_1f8.data._M_elems[4] = (uint)uVar8;
                  local_1f8.data._M_elems[5] = (uint)((ulong)uVar8 >> 0x20);
                  local_1f8.data._M_elems[6] = (uint)uVar9;
                  local_1f8.data._M_elems[7] = (uint)((ulong)uVar9 >> 0x20);
                  local_1f8.data._M_elems[0] = (uint)uVar6;
                  local_1f8.data._M_elems[1] = (uint)((ulong)uVar6 >> 0x20);
                  local_1f8.data._M_elems[2] = (uint)uVar7;
                  local_1f8.data._M_elems[3] = (uint)((ulong)uVar7 >> 0x20);
                  local_1f8.exp =
                       *(int *)((long)(pnVar18->m_backend).data._M_elems + lVar19 + -0x10);
                  local_1f8.neg =
                       *(bool *)((long)(pnVar18->m_backend).data._M_elems + lVar19 + -0xc);
                  local_1f8._72_8_ =
                       *(undefined8 *)((long)(pnVar18->m_backend).data._M_elems + lVar19 + -8);
                }
                pcVar21 = &local_f8;
LAB_00395ed6:
                boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                          (&local_1f8,pcVar21);
LAB_00395edb:
                boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=
                          (local_1a0,&local_1f8);
              }
            }
            uVar24 = uVar24 - 1;
            lVar19 = lVar19 + -0x50;
          } while (1 < uVar24);
        }
      }
      else {
        if (0 < (int)uVar2) {
          uVar23 = uVar24 + 1;
          lVar19 = uVar24 * 0x50;
          do {
            pnVar18 = (this->
                      super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).
                      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .right.val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            puVar16 = (undefined8 *)((long)pnVar18[-1].m_backend.data._M_elems + lVar19);
            uVar6 = *puVar16;
            uVar7 = puVar16[1];
            puVar16 = (undefined8 *)((long)(&(pnVar18->m_backend).data + -1) + lVar19);
            uVar8 = *puVar16;
            uVar9 = puVar16[1];
            puVar16 = (undefined8 *)((long)(pnVar18->m_backend).data._M_elems + lVar19 + -0x30);
            uVar10 = *puVar16;
            uVar11 = puVar16[1];
            puVar16 = (undefined8 *)((long)(pnVar18->m_backend).data._M_elems + lVar19 + -0x20);
            uVar12 = *puVar16;
            uVar13 = puVar16[1];
            local_148.data._M_elems[0xc] = (uint)uVar12;
            local_148.data._M_elems[0xd] = (uint)((ulong)uVar12 >> 0x20);
            local_148.data._M_elems._56_5_ = SUB85(uVar13,0);
            local_148.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar13 >> 0x28);
            local_148.data._M_elems[8] = (uint)uVar10;
            local_148.data._M_elems[9] = (uint)((ulong)uVar10 >> 0x20);
            local_148.data._M_elems[10] = (uint)uVar11;
            local_148.data._M_elems[0xb] = (uint)((ulong)uVar11 >> 0x20);
            local_148.data._M_elems[4] = (uint)uVar8;
            local_148.data._M_elems[5] = (uint)((ulong)uVar8 >> 0x20);
            local_148.data._M_elems[6] = (uint)uVar9;
            local_148.data._M_elems[7] = (uint)((ulong)uVar9 >> 0x20);
            pcVar21 = &local_148;
            local_148.data._M_elems[0] = (uint)uVar6;
            local_148.data._M_elems[1] = (uint)((ulong)uVar6 >> 0x20);
            local_148.data._M_elems[2] = (uint)uVar7;
            local_148.data._M_elems[3] = (uint)((ulong)uVar7 >> 0x20);
            local_148.exp = *(int *)((long)(pnVar18->m_backend).data._M_elems + lVar19 + -0x10);
            local_148.neg = *(bool *)((long)(pnVar18->m_backend).data._M_elems + lVar19 + -0xc);
            local_148._72_8_ =
                 *(undefined8 *)((long)(pnVar18->m_backend).data._M_elems + lVar19 + -8);
            pnVar18 = (this->
                      super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).
                      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .left.val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            puVar16 = (undefined8 *)((long)pnVar18[-1].m_backend.data._M_elems + lVar19);
            uVar6 = *puVar16;
            uVar7 = puVar16[1];
            puVar16 = (undefined8 *)((long)(&(pnVar18->m_backend).data + -1) + lVar19);
            uVar8 = *puVar16;
            uVar9 = puVar16[1];
            puVar16 = (undefined8 *)((long)(pnVar18->m_backend).data._M_elems + lVar19 + -0x30);
            uVar10 = *puVar16;
            uVar11 = puVar16[1];
            puVar16 = (undefined8 *)((long)(pnVar18->m_backend).data._M_elems + lVar19 + -0x20);
            uVar12 = *puVar16;
            uVar13 = puVar16[1];
            local_198.data._M_elems[0xc] = (uint)uVar12;
            local_198.data._M_elems[0xd] = (uint)((ulong)uVar12 >> 0x20);
            local_198.data._M_elems._56_5_ = SUB85(uVar13,0);
            local_198.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar13 >> 0x28);
            local_198.data._M_elems[8] = (uint)uVar10;
            local_198.data._M_elems[9] = (uint)((ulong)uVar10 >> 0x20);
            local_198.data._M_elems[10] = (uint)uVar11;
            local_198.data._M_elems[0xb] = (uint)((ulong)uVar11 >> 0x20);
            local_198.data._M_elems[4] = (uint)uVar8;
            local_198.data._M_elems[5] = (uint)((ulong)uVar8 >> 0x20);
            local_198.data._M_elems[6] = (uint)uVar9;
            local_198.data._M_elems[7] = (uint)((ulong)uVar9 >> 0x20);
            local_198.data._M_elems[0] = (uint)uVar6;
            local_198.data._M_elems[1] = (uint)((ulong)uVar6 >> 0x20);
            local_198.data._M_elems[2] = (uint)uVar7;
            local_198.data._M_elems[3] = (uint)((ulong)uVar7 >> 0x20);
            local_198.exp = *(int *)((long)(pnVar18->m_backend).data._M_elems + lVar19 + -0x10);
            local_198.neg = *(bool *)((long)(pnVar18->m_backend).data._M_elems + lVar19 + -0xc);
            local_198._72_8_ =
                 *(undefined8 *)((long)(pnVar18->m_backend).data._M_elems + lVar19 + -8);
            if (((local_148.fpclass == cpp_dec_float_NaN) ||
                (local_198.fpclass == cpp_dec_float_NaN)) ||
               (iVar14 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                   (pcVar21,&local_198), iVar14 != 0)) {
              if (this->theRep *
                  (this->
                  super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).thedesc.rowstat.data[uVar23 - 2] < 1) {
                pnVar18 = (this->thePvec->
                          super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ).val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                local_1f8.data._M_elems[0xc] = local_148.data._M_elems[0xc];
                local_1f8.data._M_elems[0xd] = local_148.data._M_elems[0xd];
                local_1f8.data._M_elems[0xe] = local_148.data._M_elems[0xe];
                local_1f8.data._M_elems[0xf] =
                     (uint)(CONCAT35(local_148.data._M_elems[0xf]._1_3_,
                                     local_148.data._M_elems._56_5_) >> 0x20);
                local_1f8.data._M_elems[8] = local_148.data._M_elems[8];
                local_1f8.data._M_elems[9] = local_148.data._M_elems[9];
                local_1f8.data._M_elems[10] = local_148.data._M_elems[10];
                local_1f8.data._M_elems[0xb] = local_148.data._M_elems[0xb];
                local_1f8.data._M_elems[4] = local_148.data._M_elems[4];
                local_1f8.data._M_elems[5] = local_148.data._M_elems[5];
                local_1f8.data._M_elems[6] = local_148.data._M_elems[6];
                local_1f8.data._M_elems[7] = local_148.data._M_elems[7];
                local_1f8.data._M_elems[0] = local_148.data._M_elems[0];
                local_1f8.data._M_elems[1] = local_148.data._M_elems[1];
                local_1f8.data._M_elems[2] = local_148.data._M_elems[2];
                local_1f8.data._M_elems[3] = local_148.data._M_elems[3];
                local_1f8.exp = local_148.exp;
                local_1f8.neg = local_148.neg;
                local_1f8.fpclass = local_148.fpclass;
                local_1f8.prec_elem = local_148.prec_elem;
                boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=
                          (&local_1f8,&local_80);
                if (((*(int *)((long)(pnVar18->m_backend).data._M_elems + lVar19 + -8) == 2) ||
                    (local_1f8.fpclass == cpp_dec_float_NaN)) ||
                   (iVar14 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::
                             compare((cpp_dec_float<100U,_int,_void> *)
                                     ((long)pnVar18[0xffffffffffffffff].m_backend.data._M_elems +
                                     lVar19),&local_1f8), -1 < iVar14)) {
                  pnVar18 = (this->theURbound).val.
                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                  puVar16 = (undefined8 *)((long)pnVar18[-1].m_backend.data._M_elems + lVar19);
                  local_1f8.fpclass = cpp_dec_float_finite;
                  local_1f8.prec_elem = 0x10;
                  local_1f8.data._M_elems[0] = 0;
                  local_1f8.data._M_elems[1] = 0;
                  local_1f8.data._M_elems[2] = 0;
                  local_1f8.data._M_elems[3] = 0;
                  local_1f8.data._M_elems[4] = 0;
                  local_1f8.data._M_elems[5] = 0;
                  local_1f8.data._M_elems[6] = 0;
                  local_1f8.data._M_elems[7] = 0;
                  local_1f8.data._M_elems[8] = 0;
                  local_1f8.data._M_elems[9] = 0;
                  local_1f8.data._M_elems[10] = 0;
                  local_1f8.data._M_elems[0xb] = 0;
                  local_1f8.data._M_elems[0xc] = 0;
                  local_1f8.data._M_elems[0xd] = 0;
                  local_1f8.data._M_elems[0xe] = 0;
                  local_1f8.data._M_elems[0xf] = 0;
                  local_1f8.exp = 0;
                  local_1f8.neg = false;
                  if ((cpp_dec_float<100U,_int,_void> *)puVar16 != &local_1f8) {
                    uVar6 = *puVar16;
                    uVar7 = *(undefined8 *)
                             ((long)(pnVar18->m_backend).data._M_elems + lVar19 + -0x48);
                    uVar8 = *(undefined8 *)((long)(&(pnVar18->m_backend).data + -1) + lVar19);
                    uVar9 = *(undefined8 *)
                             ((long)(pnVar18->m_backend).data._M_elems + lVar19 + -0x38);
                    uVar10 = *(undefined8 *)
                              ((long)(pnVar18->m_backend).data._M_elems + lVar19 + -0x30);
                    uVar11 = *(undefined8 *)
                              ((long)(pnVar18->m_backend).data._M_elems + lVar19 + -0x28);
                    uVar12 = *(undefined8 *)
                              ((long)(pnVar18->m_backend).data._M_elems + lVar19 + -0x20);
                    uVar13 = *(undefined8 *)
                              ((long)(pnVar18->m_backend).data._M_elems + lVar19 + -0x18);
                    local_1f8.data._M_elems[0xc] = (uint)uVar12;
                    local_1f8.data._M_elems[0xd] = (uint)((ulong)uVar12 >> 0x20);
                    local_1f8.data._M_elems[0xe] = (uint)uVar13;
                    local_1f8.data._M_elems[0xf] = (uint)((ulong)uVar13 >> 0x20);
                    local_1f8.data._M_elems[8] = (uint)uVar10;
                    local_1f8.data._M_elems[9] = (uint)((ulong)uVar10 >> 0x20);
                    local_1f8.data._M_elems[10] = (uint)uVar11;
                    local_1f8.data._M_elems[0xb] = (uint)((ulong)uVar11 >> 0x20);
                    local_1f8.data._M_elems[4] = (uint)uVar8;
                    local_1f8.data._M_elems[5] = (uint)((ulong)uVar8 >> 0x20);
                    local_1f8.data._M_elems[6] = (uint)uVar9;
                    local_1f8.data._M_elems[7] = (uint)((ulong)uVar9 >> 0x20);
                    local_1f8.data._M_elems[0] = (uint)uVar6;
                    local_1f8.data._M_elems[1] = (uint)((ulong)uVar6 >> 0x20);
                    local_1f8.data._M_elems[2] = (uint)uVar7;
                    local_1f8.data._M_elems[3] = (uint)((ulong)uVar7 >> 0x20);
                    local_1f8.exp =
                         *(int *)((long)(pnVar18->m_backend).data._M_elems + lVar19 + -0x10);
                    local_1f8.neg =
                         *(bool *)((long)(pnVar18->m_backend).data._M_elems + lVar19 + -0xc);
                    local_1f8._72_8_ =
                         *(undefined8 *)((long)(pnVar18->m_backend).data._M_elems + lVar19 + -8);
                  }
                  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                            (&local_1f8,&local_148);
                  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=
                            (local_1a0,&local_1f8);
                }
                else {
                  pnVar18 = (this->theURbound).val.
                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                  puVar16 = (undefined8 *)
                            ((long)(pnVar18->m_backend).data._M_elems + lVar19 + -0x20);
                  *puVar16 = CONCAT44(local_148.data._M_elems[0xd],local_148.data._M_elems[0xc]);
                  puVar16[1] = CONCAT35(local_148.data._M_elems[0xf]._1_3_,
                                        local_148.data._M_elems._56_5_);
                  puVar16 = (undefined8 *)
                            ((long)(pnVar18->m_backend).data._M_elems + lVar19 + -0x30);
                  *puVar16 = CONCAT44(local_148.data._M_elems[9],local_148.data._M_elems[8]);
                  puVar16[1] = CONCAT44(local_148.data._M_elems[0xb],local_148.data._M_elems[10]);
                  puVar16 = (undefined8 *)((long)(&(pnVar18->m_backend).data + -1) + lVar19);
                  *puVar16 = CONCAT44(local_148.data._M_elems[5],local_148.data._M_elems[4]);
                  puVar16[1] = CONCAT44(local_148.data._M_elems[7],local_148.data._M_elems[6]);
                  puVar16 = (undefined8 *)((long)pnVar18[-1].m_backend.data._M_elems + lVar19);
                  *puVar16 = CONCAT44(local_148.data._M_elems[1],local_148.data._M_elems[0]);
                  puVar16[1] = CONCAT44(local_148.data._M_elems[3],local_148.data._M_elems[2]);
                  *(int *)((long)(pnVar18->m_backend).data._M_elems + lVar19 + -0x10) =
                       local_148.exp;
                  *(bool *)((long)(pnVar18->m_backend).data._M_elems + lVar19 + -0xc) =
                       local_148.neg;
                  *(undefined8 *)((long)(pnVar18->m_backend).data._M_elems + lVar19 + -8) =
                       local_148._72_8_;
                }
                pnVar18 = (this->thePvec->
                          super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ).val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                local_1f8.data._M_elems[0xc] = local_198.data._M_elems[0xc];
                local_1f8.data._M_elems[0xd] = local_198.data._M_elems[0xd];
                local_1f8.data._M_elems[0xe] = local_198.data._M_elems[0xe];
                local_1f8.data._M_elems[0xf] =
                     (uint)(CONCAT35(local_198.data._M_elems[0xf]._1_3_,
                                     local_198.data._M_elems._56_5_) >> 0x20);
                local_1f8.data._M_elems[8] = local_198.data._M_elems[8];
                local_1f8.data._M_elems[9] = local_198.data._M_elems[9];
                local_1f8.data._M_elems[10] = local_198.data._M_elems[10];
                local_1f8.data._M_elems[0xb] = local_198.data._M_elems[0xb];
                local_1f8.data._M_elems[4] = local_198.data._M_elems[4];
                local_1f8.data._M_elems[5] = local_198.data._M_elems[5];
                local_1f8.data._M_elems[6] = local_198.data._M_elems[6];
                local_1f8.data._M_elems[7] = local_198.data._M_elems[7];
                local_1f8.data._M_elems[0] = local_198.data._M_elems[0];
                local_1f8.data._M_elems[1] = local_198.data._M_elems[1];
                local_1f8.data._M_elems[2] = local_198.data._M_elems[2];
                local_1f8.data._M_elems[3] = local_198.data._M_elems[3];
                local_1f8.exp = local_198.exp;
                local_1f8.neg = local_198.neg;
                local_1f8.fpclass = local_198.fpclass;
                local_1f8.prec_elem = local_198.prec_elem;
                boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                          (&local_1f8,&local_80);
                if (((*(int *)((long)(pnVar18->m_backend).data._M_elems + lVar19 + -8) == 2) ||
                    (local_1f8.fpclass == cpp_dec_float_NaN)) ||
                   (iVar14 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::
                             compare((cpp_dec_float<100U,_int,_void> *)
                                     ((long)pnVar18[0xffffffffffffffff].m_backend.data._M_elems +
                                     lVar19),&local_1f8), iVar14 < 1)) {
                  pcVar21 = (cpp_dec_float<100U,_int,_void> *)
                            ((long)(this->theLRbound).val.
                                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data.
                                   _M_elems + lVar19);
                  local_1f8.fpclass = cpp_dec_float_finite;
                  local_1f8.prec_elem = 0x10;
                  local_1f8.data._M_elems[0] = 0;
                  local_1f8.data._M_elems[1] = 0;
                  local_1f8.data._M_elems[2] = 0;
                  local_1f8.data._M_elems[3] = 0;
                  local_1f8.data._M_elems[4] = 0;
                  local_1f8.data._M_elems[5] = 0;
                  local_1f8.data._M_elems[6] = 0;
                  local_1f8.data._M_elems[7] = 0;
                  local_1f8.data._M_elems[8] = 0;
                  local_1f8.data._M_elems[9] = 0;
                  local_1f8.data._M_elems[10] = 0;
                  local_1f8.data._M_elems[0xb] = 0;
                  local_1f8.data._M_elems[0xc] = 0;
                  local_1f8.data._M_elems[0xd] = 0;
                  local_1f8.data._M_elems[0xe] = 0;
                  local_1f8.data._M_elems[0xf] = 0;
                  local_1f8.exp = 0;
                  local_1f8.neg = false;
                  if (pcVar21 == &local_1f8) {
                    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                              (&local_1f8,&local_198);
                    if (local_1f8.data._M_elems[0] != 0 || local_1f8.fpclass != cpp_dec_float_finite
                       ) goto LAB_00395530;
                  }
                  else {
                    local_1f8.data._M_elems[0xc] = local_198.data._M_elems[0xc];
                    local_1f8.data._M_elems[0xd] = local_198.data._M_elems[0xd];
                    local_1f8.data._M_elems[0xe] = local_198.data._M_elems[0xe];
                    local_1f8.data._M_elems[0xf] =
                         (uint)(CONCAT35(local_198.data._M_elems[0xf]._1_3_,
                                         local_198.data._M_elems._56_5_) >> 0x20);
                    local_1f8.data._M_elems[8] = local_198.data._M_elems[8];
                    local_1f8.data._M_elems[9] = local_198.data._M_elems[9];
                    local_1f8.data._M_elems[10] = local_198.data._M_elems[10];
                    local_1f8.data._M_elems[0xb] = local_198.data._M_elems[0xb];
                    local_1f8.data._M_elems[4] = local_198.data._M_elems[4];
                    local_1f8.data._M_elems[5] = local_198.data._M_elems[5];
                    local_1f8.data._M_elems[6] = local_198.data._M_elems[6];
                    local_1f8.data._M_elems[7] = local_198.data._M_elems[7];
                    local_1f8.data._M_elems[0] = local_198.data._M_elems[0];
                    local_1f8.data._M_elems[1] = local_198.data._M_elems[1];
                    local_1f8.data._M_elems[2] = local_198.data._M_elems[2];
                    local_1f8.data._M_elems[3] = local_198.data._M_elems[3];
                    local_1f8.exp = local_198.exp;
                    local_1f8.neg = local_198.neg;
                    local_1f8.fpclass = local_198.fpclass;
                    local_1f8.prec_elem = local_198.prec_elem;
                    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                              (&local_1f8,pcVar21);
                  }
                  goto LAB_00395535;
                }
                pnVar18 = (this->theLRbound).val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                puVar16 = (undefined8 *)((long)(pnVar18->m_backend).data._M_elems + lVar19 + -0x20);
                *puVar16 = CONCAT44(local_198.data._M_elems[0xd],local_198.data._M_elems[0xc]);
                puVar16[1] = CONCAT35(local_198.data._M_elems[0xf]._1_3_,
                                      local_198.data._M_elems._56_5_);
                puVar16 = (undefined8 *)((long)(pnVar18->m_backend).data._M_elems + lVar19 + -0x30);
                *puVar16 = CONCAT44(local_198.data._M_elems[9],local_198.data._M_elems[8]);
                puVar16[1] = CONCAT44(local_198.data._M_elems[0xb],local_198.data._M_elems[10]);
                puVar16 = (undefined8 *)((long)(&(pnVar18->m_backend).data + -1) + lVar19);
                *puVar16 = CONCAT44(local_198.data._M_elems[5],local_198.data._M_elems[4]);
                puVar16[1] = CONCAT44(local_198.data._M_elems[7],local_198.data._M_elems[6]);
                puVar16 = (undefined8 *)((long)pnVar18[-1].m_backend.data._M_elems + lVar19);
                *puVar16 = CONCAT44(local_198.data._M_elems[1],local_198.data._M_elems[0]);
                puVar16[1] = CONCAT44(local_198.data._M_elems[3],local_198.data._M_elems[2]);
                *(int *)((long)(pnVar18->m_backend).data._M_elems + lVar19 + -0x10) = local_198.exp;
                *(bool *)((long)(pnVar18->m_backend).data._M_elems + lVar19 + -0xc) = local_198.neg;
                *(undefined8 *)((long)(pnVar18->m_backend).data._M_elems + lVar19 + -8) =
                     local_198._72_8_;
              }
              else {
                pnVar18 = (this->theURbound).val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                if (((*(int *)((long)(pnVar18->m_backend).data._M_elems + lVar19 + -8) != 2) &&
                    (local_148.fpclass != cpp_dec_float_NaN)) &&
                   (iVar14 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::
                             compare((cpp_dec_float<100U,_int,_void> *)
                                     ((long)pnVar18[-1].m_backend.data._M_elems + lVar19),pcVar21),
                   0 < iVar14)) goto LAB_0039532a;
                pnVar18 = (this->theLRbound).val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                if (((*(int *)((long)(pnVar18->m_backend).data._M_elems + lVar19 + -8) != 2) &&
                    (local_198.fpclass != cpp_dec_float_NaN)) &&
                   (iVar14 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::
                             compare((cpp_dec_float<100U,_int,_void> *)
                                     ((long)pnVar18[-1].m_backend.data._M_elems + lVar19),&local_198
                                    ), iVar14 < 0)) goto LAB_003953ba;
              }
            }
            else {
              pnVar18 = (this->theURbound).val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              if (((*(int *)((long)(pnVar18->m_backend).data._M_elems + lVar19 + -8) == 2) ||
                  (local_148.fpclass == cpp_dec_float_NaN)) ||
                 (iVar14 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                     ((cpp_dec_float<100U,_int,_void> *)
                                      ((long)pnVar18[-1].m_backend.data._M_elems + lVar19),pcVar21),
                 iVar14 < 1)) {
LAB_003953ba:
                pcVar21 = (cpp_dec_float<100U,_int,_void> *)
                          ((long)(this->theLRbound).val.
                                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data.
                                 _M_elems + lVar19);
                local_1f8.fpclass = cpp_dec_float_finite;
                local_1f8.prec_elem = 0x10;
                local_1f8.data._M_elems[0] = 0;
                local_1f8.data._M_elems[1] = 0;
                local_1f8.data._M_elems[2] = 0;
                local_1f8.data._M_elems[3] = 0;
                local_1f8.data._M_elems[4] = 0;
                local_1f8.data._M_elems[5] = 0;
                local_1f8.data._M_elems[6] = 0;
                local_1f8.data._M_elems[7] = 0;
                local_1f8.data._M_elems[8] = 0;
                local_1f8.data._M_elems[9] = 0;
                local_1f8.data._M_elems[10] = 0;
                local_1f8.data._M_elems[0xb] = 0;
                local_1f8.data._M_elems[0xc] = 0;
                local_1f8.data._M_elems[0xd] = 0;
                local_1f8.data._M_elems[0xe] = 0;
                local_1f8.data._M_elems[0xf] = 0;
                local_1f8.exp = 0;
                local_1f8.neg = false;
                if (pcVar21 != &local_1f8) {
                  local_1f8.data._M_elems[0xc] = local_198.data._M_elems[0xc];
                  local_1f8.data._M_elems[0xd] = local_198.data._M_elems[0xd];
                  local_1f8.data._M_elems[0xe] = local_198.data._M_elems[0xe];
                  local_1f8.data._M_elems[0xf] =
                       (uint)(CONCAT35(local_198.data._M_elems[0xf]._1_3_,
                                       local_198.data._M_elems._56_5_) >> 0x20);
                  local_1f8.data._M_elems[8] = local_198.data._M_elems[8];
                  local_1f8.data._M_elems[9] = local_198.data._M_elems[9];
                  local_1f8.data._M_elems[10] = local_198.data._M_elems[10];
                  local_1f8.data._M_elems[0xb] = local_198.data._M_elems[0xb];
                  local_1f8.data._M_elems[4] = local_198.data._M_elems[4];
                  local_1f8.data._M_elems[5] = local_198.data._M_elems[5];
                  local_1f8.data._M_elems[6] = local_198.data._M_elems[6];
                  local_1f8.data._M_elems[7] = local_198.data._M_elems[7];
                  local_1f8.data._M_elems[0] = local_198.data._M_elems[0];
                  local_1f8.data._M_elems[1] = local_198.data._M_elems[1];
                  local_1f8.data._M_elems[2] = local_198.data._M_elems[2];
                  local_1f8.data._M_elems[3] = local_198.data._M_elems[3];
                  local_1f8.exp = local_198.exp;
                  local_1f8.neg = local_198.neg;
                  local_1f8.fpclass = local_198.fpclass;
                  local_1f8.prec_elem = local_198.prec_elem;
                  goto LAB_0039545a;
                }
                boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                          (&local_1f8,&local_198);
                if (local_1f8.data._M_elems[0] != 0 || local_1f8.fpclass != cpp_dec_float_finite) {
LAB_00395530:
                  local_1f8.neg = (bool)(local_1f8.neg ^ 1);
                }
              }
              else {
LAB_0039532a:
                pnVar18 = (this->theURbound).val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                puVar16 = (undefined8 *)((long)pnVar18[-1].m_backend.data._M_elems + lVar19);
                local_1f8.fpclass = cpp_dec_float_finite;
                local_1f8.prec_elem = 0x10;
                local_1f8.data._M_elems[0] = 0;
                local_1f8.data._M_elems[1] = 0;
                local_1f8.data._M_elems[2] = 0;
                local_1f8.data._M_elems[3] = 0;
                local_1f8.data._M_elems[4] = 0;
                local_1f8.data._M_elems[5] = 0;
                local_1f8.data._M_elems[6] = 0;
                local_1f8.data._M_elems[7] = 0;
                local_1f8.data._M_elems[8] = 0;
                local_1f8.data._M_elems[9] = 0;
                local_1f8.data._M_elems[10] = 0;
                local_1f8.data._M_elems[0xb] = 0;
                local_1f8.data._M_elems[0xc] = 0;
                local_1f8.data._M_elems[0xd] = 0;
                local_1f8.data._M_elems[0xe] = 0;
                local_1f8.data._M_elems[0xf] = 0;
                local_1f8.exp = 0;
                local_1f8.neg = false;
                if ((cpp_dec_float<100U,_int,_void> *)puVar16 != &local_1f8) {
                  uVar6 = *puVar16;
                  uVar7 = *(undefined8 *)((long)(pnVar18->m_backend).data._M_elems + lVar19 + -0x48)
                  ;
                  uVar8 = *(undefined8 *)((long)(&(pnVar18->m_backend).data + -1) + lVar19);
                  uVar9 = *(undefined8 *)((long)(pnVar18->m_backend).data._M_elems + lVar19 + -0x38)
                  ;
                  uVar10 = *(undefined8 *)
                            ((long)(pnVar18->m_backend).data._M_elems + lVar19 + -0x30);
                  uVar11 = *(undefined8 *)
                            ((long)(pnVar18->m_backend).data._M_elems + lVar19 + -0x28);
                  uVar12 = *(undefined8 *)
                            ((long)(pnVar18->m_backend).data._M_elems + lVar19 + -0x20);
                  uVar13 = *(undefined8 *)
                            ((long)(pnVar18->m_backend).data._M_elems + lVar19 + -0x18);
                  local_1f8.data._M_elems[0xc] = (uint)uVar12;
                  local_1f8.data._M_elems[0xd] = (uint)((ulong)uVar12 >> 0x20);
                  local_1f8.data._M_elems[0xe] = (uint)uVar13;
                  local_1f8.data._M_elems[0xf] = (uint)((ulong)uVar13 >> 0x20);
                  local_1f8.data._M_elems[8] = (uint)uVar10;
                  local_1f8.data._M_elems[9] = (uint)((ulong)uVar10 >> 0x20);
                  local_1f8.data._M_elems[10] = (uint)uVar11;
                  local_1f8.data._M_elems[0xb] = (uint)((ulong)uVar11 >> 0x20);
                  local_1f8.data._M_elems[4] = (uint)uVar8;
                  local_1f8.data._M_elems[5] = (uint)((ulong)uVar8 >> 0x20);
                  local_1f8.data._M_elems[6] = (uint)uVar9;
                  local_1f8.data._M_elems[7] = (uint)((ulong)uVar9 >> 0x20);
                  local_1f8.data._M_elems[0] = (uint)uVar6;
                  local_1f8.data._M_elems[1] = (uint)((ulong)uVar6 >> 0x20);
                  local_1f8.data._M_elems[2] = (uint)uVar7;
                  local_1f8.data._M_elems[3] = (uint)((ulong)uVar7 >> 0x20);
                  local_1f8.exp =
                       *(int *)((long)(pnVar18->m_backend).data._M_elems + lVar19 + -0x10);
                  local_1f8.neg =
                       *(bool *)((long)(pnVar18->m_backend).data._M_elems + lVar19 + -0xc);
                  local_1f8._72_8_ =
                       *(undefined8 *)((long)(pnVar18->m_backend).data._M_elems + lVar19 + -8);
                }
LAB_0039545a:
                boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                          (&local_1f8,pcVar21);
              }
LAB_00395535:
              boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=
                        (local_1a0,&local_1f8);
            }
            uVar23 = uVar23 - 1;
            lVar19 = lVar19 + -0x50;
          } while (1 < uVar23);
        }
        lVar19 = (long)(this->
                       super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).
                       super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .
                       super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .set.thenum;
        if (0 < lVar19) {
          uVar24 = lVar19 + 1;
          lVar19 = lVar19 * 0x50;
          do {
            pnVar18 = (this->
                      super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).
                      super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .up.val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            puVar16 = (undefined8 *)((long)pnVar18[-1].m_backend.data._M_elems + lVar19);
            uVar6 = *puVar16;
            uVar7 = puVar16[1];
            puVar16 = (undefined8 *)((long)(&(pnVar18->m_backend).data + -1) + lVar19);
            uVar8 = *puVar16;
            uVar9 = puVar16[1];
            puVar16 = (undefined8 *)((long)(pnVar18->m_backend).data._M_elems + lVar19 + -0x30);
            uVar10 = *puVar16;
            uVar11 = puVar16[1];
            puVar16 = (undefined8 *)((long)(pnVar18->m_backend).data._M_elems + lVar19 + -0x20);
            uVar12 = *puVar16;
            uVar13 = puVar16[1];
            local_148.data._M_elems[0xc] = (uint)uVar12;
            local_148.data._M_elems[0xd] = (uint)((ulong)uVar12 >> 0x20);
            local_148.data._M_elems._56_5_ = SUB85(uVar13,0);
            local_148.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar13 >> 0x28);
            local_148.data._M_elems[8] = (uint)uVar10;
            local_148.data._M_elems[9] = (uint)((ulong)uVar10 >> 0x20);
            local_148.data._M_elems[10] = (uint)uVar11;
            local_148.data._M_elems[0xb] = (uint)((ulong)uVar11 >> 0x20);
            local_148.data._M_elems[4] = (uint)uVar8;
            local_148.data._M_elems[5] = (uint)((ulong)uVar8 >> 0x20);
            local_148.data._M_elems[6] = (uint)uVar9;
            local_148.data._M_elems[7] = (uint)((ulong)uVar9 >> 0x20);
            pcVar21 = &local_148;
            local_148.data._M_elems[0] = (uint)uVar6;
            local_148.data._M_elems[1] = (uint)((ulong)uVar6 >> 0x20);
            local_148.data._M_elems[2] = (uint)uVar7;
            local_148.data._M_elems[3] = (uint)((ulong)uVar7 >> 0x20);
            local_148.exp = *(int *)((long)(pnVar18->m_backend).data._M_elems + lVar19 + -0x10);
            local_148.neg = *(bool *)((long)(pnVar18->m_backend).data._M_elems + lVar19 + -0xc);
            local_148._72_8_ =
                 *(undefined8 *)((long)(pnVar18->m_backend).data._M_elems + lVar19 + -8);
            pnVar18 = (this->
                      super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).
                      super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .low.val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            puVar16 = (undefined8 *)((long)pnVar18[-1].m_backend.data._M_elems + lVar19);
            uVar6 = *puVar16;
            uVar7 = puVar16[1];
            puVar16 = (undefined8 *)((long)(&(pnVar18->m_backend).data + -1) + lVar19);
            uVar8 = *puVar16;
            uVar9 = puVar16[1];
            puVar16 = (undefined8 *)((long)(pnVar18->m_backend).data._M_elems + lVar19 + -0x30);
            uVar10 = *puVar16;
            uVar11 = puVar16[1];
            puVar16 = (undefined8 *)((long)(pnVar18->m_backend).data._M_elems + lVar19 + -0x20);
            uVar12 = *puVar16;
            uVar13 = puVar16[1];
            local_198.data._M_elems[0xc] = (uint)uVar12;
            local_198.data._M_elems[0xd] = (uint)((ulong)uVar12 >> 0x20);
            local_198.data._M_elems._56_5_ = SUB85(uVar13,0);
            local_198.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar13 >> 0x28);
            local_198.data._M_elems[8] = (uint)uVar10;
            local_198.data._M_elems[9] = (uint)((ulong)uVar10 >> 0x20);
            local_198.data._M_elems[10] = (uint)uVar11;
            local_198.data._M_elems[0xb] = (uint)((ulong)uVar11 >> 0x20);
            local_198.data._M_elems[4] = (uint)uVar8;
            local_198.data._M_elems[5] = (uint)((ulong)uVar8 >> 0x20);
            local_198.data._M_elems[6] = (uint)uVar9;
            local_198.data._M_elems[7] = (uint)((ulong)uVar9 >> 0x20);
            local_198.data._M_elems[0] = (uint)uVar6;
            local_198.data._M_elems[1] = (uint)((ulong)uVar6 >> 0x20);
            local_198.data._M_elems[2] = (uint)uVar7;
            local_198.data._M_elems[3] = (uint)((ulong)uVar7 >> 0x20);
            local_198.exp = *(int *)((long)(pnVar18->m_backend).data._M_elems + lVar19 + -0x10);
            local_198.neg = *(bool *)((long)(pnVar18->m_backend).data._M_elems + lVar19 + -0xc);
            local_198._72_8_ =
                 *(undefined8 *)((long)(pnVar18->m_backend).data._M_elems + lVar19 + -8);
            if (((local_148.fpclass == cpp_dec_float_NaN) ||
                (local_198.fpclass == cpp_dec_float_NaN)) ||
               (iVar14 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                   (pcVar21,&local_198), iVar14 != 0)) {
              if (this->theRep *
                  (this->
                  super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).thedesc.colstat.data[uVar24 - 2] < 1) {
                pnVar18 = (this->theCoPvec->
                          super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ).val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                local_1f8.data._M_elems[0xc] = local_148.data._M_elems[0xc];
                local_1f8.data._M_elems[0xd] = local_148.data._M_elems[0xd];
                local_1f8.data._M_elems[0xe] = local_148.data._M_elems[0xe];
                local_1f8.data._M_elems[0xf] =
                     (uint)(CONCAT35(local_148.data._M_elems[0xf]._1_3_,
                                     local_148.data._M_elems._56_5_) >> 0x20);
                local_1f8.data._M_elems[8] = local_148.data._M_elems[8];
                local_1f8.data._M_elems[9] = local_148.data._M_elems[9];
                local_1f8.data._M_elems[10] = local_148.data._M_elems[10];
                local_1f8.data._M_elems[0xb] = local_148.data._M_elems[0xb];
                local_1f8.data._M_elems[4] = local_148.data._M_elems[4];
                local_1f8.data._M_elems[5] = local_148.data._M_elems[5];
                local_1f8.data._M_elems[6] = local_148.data._M_elems[6];
                local_1f8.data._M_elems[7] = local_148.data._M_elems[7];
                local_1f8.data._M_elems[0] = local_148.data._M_elems[0];
                local_1f8.data._M_elems[1] = local_148.data._M_elems[1];
                local_1f8.data._M_elems[2] = local_148.data._M_elems[2];
                local_1f8.data._M_elems[3] = local_148.data._M_elems[3];
                local_1f8.exp = local_148.exp;
                local_1f8.neg = local_148.neg;
                local_1f8.fpclass = local_148.fpclass;
                local_1f8.prec_elem = local_148.prec_elem;
                boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=
                          (&local_1f8,&local_80);
                if (((*(int *)((long)(pnVar18->m_backend).data._M_elems + lVar19 + -8) == 2) ||
                    (local_1f8.fpclass == cpp_dec_float_NaN)) ||
                   (iVar14 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::
                             compare((cpp_dec_float<100U,_int,_void> *)
                                     ((long)pnVar18[0xffffffffffffffff].m_backend.data._M_elems +
                                     lVar19),&local_1f8), -1 < iVar14)) {
                  pnVar18 = (this->theUCbound).val.
                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                  puVar16 = (undefined8 *)((long)pnVar18[-1].m_backend.data._M_elems + lVar19);
                  local_1f8.fpclass = cpp_dec_float_finite;
                  local_1f8.prec_elem = 0x10;
                  local_1f8.data._M_elems[0] = 0;
                  local_1f8.data._M_elems[1] = 0;
                  local_1f8.data._M_elems[2] = 0;
                  local_1f8.data._M_elems[3] = 0;
                  local_1f8.data._M_elems[4] = 0;
                  local_1f8.data._M_elems[5] = 0;
                  local_1f8.data._M_elems[6] = 0;
                  local_1f8.data._M_elems[7] = 0;
                  local_1f8.data._M_elems[8] = 0;
                  local_1f8.data._M_elems[9] = 0;
                  local_1f8.data._M_elems[10] = 0;
                  local_1f8.data._M_elems[0xb] = 0;
                  local_1f8.data._M_elems[0xc] = 0;
                  local_1f8.data._M_elems[0xd] = 0;
                  local_1f8.data._M_elems[0xe] = 0;
                  local_1f8.data._M_elems[0xf] = 0;
                  local_1f8.exp = 0;
                  local_1f8.neg = false;
                  if ((cpp_dec_float<100U,_int,_void> *)puVar16 != &local_1f8) {
                    uVar6 = *puVar16;
                    uVar7 = *(undefined8 *)
                             ((long)(pnVar18->m_backend).data._M_elems + lVar19 + -0x48);
                    uVar8 = *(undefined8 *)((long)(&(pnVar18->m_backend).data + -1) + lVar19);
                    uVar9 = *(undefined8 *)
                             ((long)(pnVar18->m_backend).data._M_elems + lVar19 + -0x38);
                    uVar10 = *(undefined8 *)
                              ((long)(pnVar18->m_backend).data._M_elems + lVar19 + -0x30);
                    uVar11 = *(undefined8 *)
                              ((long)(pnVar18->m_backend).data._M_elems + lVar19 + -0x28);
                    uVar12 = *(undefined8 *)
                              ((long)(pnVar18->m_backend).data._M_elems + lVar19 + -0x20);
                    uVar13 = *(undefined8 *)
                              ((long)(pnVar18->m_backend).data._M_elems + lVar19 + -0x18);
                    local_1f8.data._M_elems[0xc] = (uint)uVar12;
                    local_1f8.data._M_elems[0xd] = (uint)((ulong)uVar12 >> 0x20);
                    local_1f8.data._M_elems[0xe] = (uint)uVar13;
                    local_1f8.data._M_elems[0xf] = (uint)((ulong)uVar13 >> 0x20);
                    local_1f8.data._M_elems[8] = (uint)uVar10;
                    local_1f8.data._M_elems[9] = (uint)((ulong)uVar10 >> 0x20);
                    local_1f8.data._M_elems[10] = (uint)uVar11;
                    local_1f8.data._M_elems[0xb] = (uint)((ulong)uVar11 >> 0x20);
                    local_1f8.data._M_elems[4] = (uint)uVar8;
                    local_1f8.data._M_elems[5] = (uint)((ulong)uVar8 >> 0x20);
                    local_1f8.data._M_elems[6] = (uint)uVar9;
                    local_1f8.data._M_elems[7] = (uint)((ulong)uVar9 >> 0x20);
                    local_1f8.data._M_elems[0] = (uint)uVar6;
                    local_1f8.data._M_elems[1] = (uint)((ulong)uVar6 >> 0x20);
                    local_1f8.data._M_elems[2] = (uint)uVar7;
                    local_1f8.data._M_elems[3] = (uint)((ulong)uVar7 >> 0x20);
                    local_1f8.exp =
                         *(int *)((long)(pnVar18->m_backend).data._M_elems + lVar19 + -0x10);
                    local_1f8.neg =
                         *(bool *)((long)(pnVar18->m_backend).data._M_elems + lVar19 + -0xc);
                    local_1f8._72_8_ =
                         *(undefined8 *)((long)(pnVar18->m_backend).data._M_elems + lVar19 + -8);
                  }
                  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                            (&local_1f8,&local_148);
                  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=
                            (local_1a0,&local_1f8);
                }
                else {
                  pnVar18 = (this->theUCbound).val.
                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                  puVar16 = (undefined8 *)
                            ((long)(pnVar18->m_backend).data._M_elems + lVar19 + -0x20);
                  *puVar16 = CONCAT44(local_148.data._M_elems[0xd],local_148.data._M_elems[0xc]);
                  puVar16[1] = CONCAT35(local_148.data._M_elems[0xf]._1_3_,
                                        local_148.data._M_elems._56_5_);
                  puVar16 = (undefined8 *)
                            ((long)(pnVar18->m_backend).data._M_elems + lVar19 + -0x30);
                  *puVar16 = CONCAT44(local_148.data._M_elems[9],local_148.data._M_elems[8]);
                  puVar16[1] = CONCAT44(local_148.data._M_elems[0xb],local_148.data._M_elems[10]);
                  puVar16 = (undefined8 *)((long)(&(pnVar18->m_backend).data + -1) + lVar19);
                  *puVar16 = CONCAT44(local_148.data._M_elems[5],local_148.data._M_elems[4]);
                  puVar16[1] = CONCAT44(local_148.data._M_elems[7],local_148.data._M_elems[6]);
                  puVar16 = (undefined8 *)((long)pnVar18[-1].m_backend.data._M_elems + lVar19);
                  *puVar16 = CONCAT44(local_148.data._M_elems[1],local_148.data._M_elems[0]);
                  puVar16[1] = CONCAT44(local_148.data._M_elems[3],local_148.data._M_elems[2]);
                  *(int *)((long)(pnVar18->m_backend).data._M_elems + lVar19 + -0x10) =
                       local_148.exp;
                  *(bool *)((long)(pnVar18->m_backend).data._M_elems + lVar19 + -0xc) =
                       local_148.neg;
                  *(undefined8 *)((long)(pnVar18->m_backend).data._M_elems + lVar19 + -8) =
                       local_148._72_8_;
                }
                pnVar18 = (this->theCoPvec->
                          super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ).val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                local_1f8.data._M_elems[0xc] = local_198.data._M_elems[0xc];
                local_1f8.data._M_elems[0xd] = local_198.data._M_elems[0xd];
                local_1f8.data._M_elems[0xe] = local_198.data._M_elems[0xe];
                local_1f8.data._M_elems[0xf] =
                     (uint)(CONCAT35(local_198.data._M_elems[0xf]._1_3_,
                                     local_198.data._M_elems._56_5_) >> 0x20);
                local_1f8.data._M_elems[8] = local_198.data._M_elems[8];
                local_1f8.data._M_elems[9] = local_198.data._M_elems[9];
                local_1f8.data._M_elems[10] = local_198.data._M_elems[10];
                local_1f8.data._M_elems[0xb] = local_198.data._M_elems[0xb];
                local_1f8.data._M_elems[4] = local_198.data._M_elems[4];
                local_1f8.data._M_elems[5] = local_198.data._M_elems[5];
                local_1f8.data._M_elems[6] = local_198.data._M_elems[6];
                local_1f8.data._M_elems[7] = local_198.data._M_elems[7];
                local_1f8.data._M_elems[0] = local_198.data._M_elems[0];
                local_1f8.data._M_elems[1] = local_198.data._M_elems[1];
                local_1f8.data._M_elems[2] = local_198.data._M_elems[2];
                local_1f8.data._M_elems[3] = local_198.data._M_elems[3];
                local_1f8.exp = local_198.exp;
                local_1f8.neg = local_198.neg;
                local_1f8.fpclass = local_198.fpclass;
                local_1f8.prec_elem = local_198.prec_elem;
                boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                          (&local_1f8,&local_80);
                if (((*(int *)((long)(pnVar18->m_backend).data._M_elems + lVar19 + -8) == 2) ||
                    (local_1f8.fpclass == cpp_dec_float_NaN)) ||
                   (iVar14 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::
                             compare((cpp_dec_float<100U,_int,_void> *)
                                     ((long)pnVar18[0xffffffffffffffff].m_backend.data._M_elems +
                                     lVar19),&local_1f8), iVar14 < 1)) {
                  pcVar21 = (cpp_dec_float<100U,_int,_void> *)
                            ((long)(this->theLCbound).val.
                                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data.
                                   _M_elems + lVar19);
                  local_1f8.fpclass = cpp_dec_float_finite;
                  local_1f8.prec_elem = 0x10;
                  local_1f8.data._M_elems[0] = 0;
                  local_1f8.data._M_elems[1] = 0;
                  local_1f8.data._M_elems[2] = 0;
                  local_1f8.data._M_elems[3] = 0;
                  local_1f8.data._M_elems[4] = 0;
                  local_1f8.data._M_elems[5] = 0;
                  local_1f8.data._M_elems[6] = 0;
                  local_1f8.data._M_elems[7] = 0;
                  local_1f8.data._M_elems[8] = 0;
                  local_1f8.data._M_elems[9] = 0;
                  local_1f8.data._M_elems[10] = 0;
                  local_1f8.data._M_elems[0xb] = 0;
                  local_1f8.data._M_elems[0xc] = 0;
                  local_1f8.data._M_elems[0xd] = 0;
                  local_1f8.data._M_elems[0xe] = 0;
                  local_1f8.data._M_elems[0xf] = 0;
                  local_1f8.exp = 0;
                  local_1f8.neg = false;
                  if (pcVar21 == &local_1f8) {
                    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                              (&local_1f8,&local_198);
                    if (local_1f8.data._M_elems[0] != 0 || local_1f8.fpclass != cpp_dec_float_finite
                       ) goto LAB_0039667a;
                  }
                  else {
                    local_1f8.data._M_elems[0xc] = local_198.data._M_elems[0xc];
                    local_1f8.data._M_elems[0xd] = local_198.data._M_elems[0xd];
                    local_1f8.data._M_elems[0xe] = local_198.data._M_elems[0xe];
                    local_1f8.data._M_elems[0xf] =
                         (uint)(CONCAT35(local_198.data._M_elems[0xf]._1_3_,
                                         local_198.data._M_elems._56_5_) >> 0x20);
                    local_1f8.data._M_elems[8] = local_198.data._M_elems[8];
                    local_1f8.data._M_elems[9] = local_198.data._M_elems[9];
                    local_1f8.data._M_elems[10] = local_198.data._M_elems[10];
                    local_1f8.data._M_elems[0xb] = local_198.data._M_elems[0xb];
                    local_1f8.data._M_elems[4] = local_198.data._M_elems[4];
                    local_1f8.data._M_elems[5] = local_198.data._M_elems[5];
                    local_1f8.data._M_elems[6] = local_198.data._M_elems[6];
                    local_1f8.data._M_elems[7] = local_198.data._M_elems[7];
                    local_1f8.data._M_elems[0] = local_198.data._M_elems[0];
                    local_1f8.data._M_elems[1] = local_198.data._M_elems[1];
                    local_1f8.data._M_elems[2] = local_198.data._M_elems[2];
                    local_1f8.data._M_elems[3] = local_198.data._M_elems[3];
                    local_1f8.exp = local_198.exp;
                    local_1f8.neg = local_198.neg;
                    local_1f8.fpclass = local_198.fpclass;
                    local_1f8.prec_elem = local_198.prec_elem;
                    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                              (&local_1f8,pcVar21);
                  }
                  goto LAB_0039667f;
                }
                pnVar18 = (this->theLCbound).val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                puVar16 = (undefined8 *)((long)(pnVar18->m_backend).data._M_elems + lVar19 + -0x20);
                *puVar16 = CONCAT44(local_198.data._M_elems[0xd],local_198.data._M_elems[0xc]);
                puVar16[1] = CONCAT35(local_198.data._M_elems[0xf]._1_3_,
                                      local_198.data._M_elems._56_5_);
                puVar16 = (undefined8 *)((long)(pnVar18->m_backend).data._M_elems + lVar19 + -0x30);
                *puVar16 = CONCAT44(local_198.data._M_elems[9],local_198.data._M_elems[8]);
                puVar16[1] = CONCAT44(local_198.data._M_elems[0xb],local_198.data._M_elems[10]);
                puVar16 = (undefined8 *)((long)(&(pnVar18->m_backend).data + -1) + lVar19);
                *puVar16 = CONCAT44(local_198.data._M_elems[5],local_198.data._M_elems[4]);
                puVar16[1] = CONCAT44(local_198.data._M_elems[7],local_198.data._M_elems[6]);
                puVar16 = (undefined8 *)((long)pnVar18[-1].m_backend.data._M_elems + lVar19);
                *puVar16 = CONCAT44(local_198.data._M_elems[1],local_198.data._M_elems[0]);
                puVar16[1] = CONCAT44(local_198.data._M_elems[3],local_198.data._M_elems[2]);
                *(int *)((long)(pnVar18->m_backend).data._M_elems + lVar19 + -0x10) = local_198.exp;
                *(bool *)((long)(pnVar18->m_backend).data._M_elems + lVar19 + -0xc) = local_198.neg;
                *(undefined8 *)((long)(pnVar18->m_backend).data._M_elems + lVar19 + -8) =
                     local_198._72_8_;
              }
              else {
                pnVar18 = (this->theUCbound).val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                if (((*(int *)((long)(pnVar18->m_backend).data._M_elems + lVar19 + -8) != 2) &&
                    (local_148.fpclass != cpp_dec_float_NaN)) &&
                   (iVar14 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::
                             compare((cpp_dec_float<100U,_int,_void> *)
                                     ((long)pnVar18[-1].m_backend.data._M_elems + lVar19),pcVar21),
                   0 < iVar14)) goto LAB_00396474;
                pnVar18 = (this->theLCbound).val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                if (((*(int *)((long)(pnVar18->m_backend).data._M_elems + lVar19 + -8) != 2) &&
                    (local_198.fpclass != cpp_dec_float_NaN)) &&
                   (iVar14 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::
                             compare((cpp_dec_float<100U,_int,_void> *)
                                     ((long)pnVar18[-1].m_backend.data._M_elems + lVar19),&local_198
                                    ), iVar14 < 0)) goto LAB_00396504;
              }
            }
            else {
              pnVar18 = (this->theUCbound).val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              if (((*(int *)((long)(pnVar18->m_backend).data._M_elems + lVar19 + -8) == 2) ||
                  (local_148.fpclass == cpp_dec_float_NaN)) ||
                 (iVar14 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                     ((cpp_dec_float<100U,_int,_void> *)
                                      ((long)pnVar18[-1].m_backend.data._M_elems + lVar19),pcVar21),
                 iVar14 < 1)) {
LAB_00396504:
                pcVar21 = (cpp_dec_float<100U,_int,_void> *)
                          ((long)(this->theLCbound).val.
                                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data.
                                 _M_elems + lVar19);
                local_1f8.fpclass = cpp_dec_float_finite;
                local_1f8.prec_elem = 0x10;
                local_1f8.data._M_elems[0] = 0;
                local_1f8.data._M_elems[1] = 0;
                local_1f8.data._M_elems[2] = 0;
                local_1f8.data._M_elems[3] = 0;
                local_1f8.data._M_elems[4] = 0;
                local_1f8.data._M_elems[5] = 0;
                local_1f8.data._M_elems[6] = 0;
                local_1f8.data._M_elems[7] = 0;
                local_1f8.data._M_elems[8] = 0;
                local_1f8.data._M_elems[9] = 0;
                local_1f8.data._M_elems[10] = 0;
                local_1f8.data._M_elems[0xb] = 0;
                local_1f8.data._M_elems[0xc] = 0;
                local_1f8.data._M_elems[0xd] = 0;
                local_1f8.data._M_elems[0xe] = 0;
                local_1f8.data._M_elems[0xf] = 0;
                local_1f8.exp = 0;
                local_1f8.neg = false;
                if (pcVar21 != &local_1f8) {
                  local_1f8.data._M_elems[0xc] = local_198.data._M_elems[0xc];
                  local_1f8.data._M_elems[0xd] = local_198.data._M_elems[0xd];
                  local_1f8.data._M_elems[0xe] = local_198.data._M_elems[0xe];
                  local_1f8.data._M_elems[0xf] =
                       (uint)(CONCAT35(local_198.data._M_elems[0xf]._1_3_,
                                       local_198.data._M_elems._56_5_) >> 0x20);
                  local_1f8.data._M_elems[8] = local_198.data._M_elems[8];
                  local_1f8.data._M_elems[9] = local_198.data._M_elems[9];
                  local_1f8.data._M_elems[10] = local_198.data._M_elems[10];
                  local_1f8.data._M_elems[0xb] = local_198.data._M_elems[0xb];
                  local_1f8.data._M_elems[4] = local_198.data._M_elems[4];
                  local_1f8.data._M_elems[5] = local_198.data._M_elems[5];
                  local_1f8.data._M_elems[6] = local_198.data._M_elems[6];
                  local_1f8.data._M_elems[7] = local_198.data._M_elems[7];
                  local_1f8.data._M_elems[0] = local_198.data._M_elems[0];
                  local_1f8.data._M_elems[1] = local_198.data._M_elems[1];
                  local_1f8.data._M_elems[2] = local_198.data._M_elems[2];
                  local_1f8.data._M_elems[3] = local_198.data._M_elems[3];
                  local_1f8.exp = local_198.exp;
                  local_1f8.neg = local_198.neg;
                  local_1f8.fpclass = local_198.fpclass;
                  local_1f8.prec_elem = local_198.prec_elem;
                  goto LAB_003965a4;
                }
                boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                          (&local_1f8,&local_198);
                if (local_1f8.data._M_elems[0] != 0 || local_1f8.fpclass != cpp_dec_float_finite) {
LAB_0039667a:
                  local_1f8.neg = (bool)(local_1f8.neg ^ 1);
                }
              }
              else {
LAB_00396474:
                pnVar18 = (this->theUCbound).val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                puVar16 = (undefined8 *)((long)pnVar18[-1].m_backend.data._M_elems + lVar19);
                local_1f8.fpclass = cpp_dec_float_finite;
                local_1f8.prec_elem = 0x10;
                local_1f8.data._M_elems[0] = 0;
                local_1f8.data._M_elems[1] = 0;
                local_1f8.data._M_elems[2] = 0;
                local_1f8.data._M_elems[3] = 0;
                local_1f8.data._M_elems[4] = 0;
                local_1f8.data._M_elems[5] = 0;
                local_1f8.data._M_elems[6] = 0;
                local_1f8.data._M_elems[7] = 0;
                local_1f8.data._M_elems[8] = 0;
                local_1f8.data._M_elems[9] = 0;
                local_1f8.data._M_elems[10] = 0;
                local_1f8.data._M_elems[0xb] = 0;
                local_1f8.data._M_elems[0xc] = 0;
                local_1f8.data._M_elems[0xd] = 0;
                local_1f8.data._M_elems[0xe] = 0;
                local_1f8.data._M_elems[0xf] = 0;
                local_1f8.exp = 0;
                local_1f8.neg = false;
                if ((cpp_dec_float<100U,_int,_void> *)puVar16 != &local_1f8) {
                  uVar6 = *puVar16;
                  uVar7 = *(undefined8 *)((long)(pnVar18->m_backend).data._M_elems + lVar19 + -0x48)
                  ;
                  uVar8 = *(undefined8 *)((long)(&(pnVar18->m_backend).data + -1) + lVar19);
                  uVar9 = *(undefined8 *)((long)(pnVar18->m_backend).data._M_elems + lVar19 + -0x38)
                  ;
                  uVar10 = *(undefined8 *)
                            ((long)(pnVar18->m_backend).data._M_elems + lVar19 + -0x30);
                  uVar11 = *(undefined8 *)
                            ((long)(pnVar18->m_backend).data._M_elems + lVar19 + -0x28);
                  uVar12 = *(undefined8 *)
                            ((long)(pnVar18->m_backend).data._M_elems + lVar19 + -0x20);
                  uVar13 = *(undefined8 *)
                            ((long)(pnVar18->m_backend).data._M_elems + lVar19 + -0x18);
                  local_1f8.data._M_elems[0xc] = (uint)uVar12;
                  local_1f8.data._M_elems[0xd] = (uint)((ulong)uVar12 >> 0x20);
                  local_1f8.data._M_elems[0xe] = (uint)uVar13;
                  local_1f8.data._M_elems[0xf] = (uint)((ulong)uVar13 >> 0x20);
                  local_1f8.data._M_elems[8] = (uint)uVar10;
                  local_1f8.data._M_elems[9] = (uint)((ulong)uVar10 >> 0x20);
                  local_1f8.data._M_elems[10] = (uint)uVar11;
                  local_1f8.data._M_elems[0xb] = (uint)((ulong)uVar11 >> 0x20);
                  local_1f8.data._M_elems[4] = (uint)uVar8;
                  local_1f8.data._M_elems[5] = (uint)((ulong)uVar8 >> 0x20);
                  local_1f8.data._M_elems[6] = (uint)uVar9;
                  local_1f8.data._M_elems[7] = (uint)((ulong)uVar9 >> 0x20);
                  local_1f8.data._M_elems[0] = (uint)uVar6;
                  local_1f8.data._M_elems[1] = (uint)((ulong)uVar6 >> 0x20);
                  local_1f8.data._M_elems[2] = (uint)uVar7;
                  local_1f8.data._M_elems[3] = (uint)((ulong)uVar7 >> 0x20);
                  local_1f8.exp =
                       *(int *)((long)(pnVar18->m_backend).data._M_elems + lVar19 + -0x10);
                  local_1f8.neg =
                       *(bool *)((long)(pnVar18->m_backend).data._M_elems + lVar19 + -0xc);
                  local_1f8._72_8_ =
                       *(undefined8 *)((long)(pnVar18->m_backend).data._M_elems + lVar19 + -8);
                }
LAB_003965a4:
                boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                          (&local_1f8,pcVar21);
              }
LAB_0039667f:
              boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=
                        (local_1a0,&local_1f8);
            }
            uVar24 = uVar24 - 1;
            lVar19 = lVar19 + -0x50;
          } while (1 < uVar24);
        }
      }
    }
  }
  return;
}

Assistant:

void SPxSolverBase<R>::unShift(void)
{
   SPX_MSG_INFO3((*this->spxout), (*this->spxout) << "DSHIFT07 = " << "unshifting ..." << std::endl;);

   if(isInitialized())
   {
      int i;
      R t_up, t_low;
      const typename SPxBasisBase<R>::Desc& ds = this->desc();

      theShift = 0;

      if(type() == ENTER)
      {
         R eps = entertol();

         if(rep() == COLUMN)
         {
            for(i = dim(); i-- > 0;)
            {
               SPxId l_id = this->baseId(i);
               int l_num = this->number(l_id);

               if(l_id.type() == SPxId::ROW_ID)
               {
                  t_up = -this->lhs(l_num);
                  t_low = -this->rhs(l_num);
               }
               else
               {
                  assert(l_id.type() == SPxId::COL_ID);
                  t_up = this->upper(l_num);
                  t_low = this->lower(l_num);
               }

               if(t_up != t_low)
               {
                  if((*theFvec)[i] < t_up + eps)  // check allowed violation
                     theUBbound[i] = t_up; // reset shifted bound to original
                  else if((*theFvec)[i] > t_up)  // shifted bound is required for feasibility
                     theShift += theUBbound[i] - t_up;

                  if((*theFvec)[i] > t_low - eps)  // check allowed violation
                     theLBbound[i] = t_low; // reset shifted bound to original
                  else if((*theFvec)[i] < t_low)  // shifted bound is required for feasibility
                     theShift -= theLBbound[i] - t_low;
               }
               else
               {
                  if(theUBbound[i] > t_up)
                     theShift += theUBbound[i] - t_up;
                  else if(theLBbound[i] < t_low)
                     theShift += t_low - theLBbound[i];
               }
            }

            for(i = this->nRows(); i-- > 0;)
            {
               if(!isBasic(ds.rowStatus(i)))
               {
                  t_up = -this->lhs(i);
                  t_low = -this->rhs(i);

                  if(theURbound[i] > t_up)  // what about t_up == t_low ?
                     theShift += theURbound[i] - t_up;

                  if(t_low > theLRbound[i])  // what about t_up == t_low ?
                     theShift += t_low - theLRbound[i];
               }
            }

            for(i = this->nCols(); i-- > 0;)
            {
               if(!isBasic(ds.colStatus(i)))
               {
                  t_up = this->upper(i);
                  t_low = this->lower(i);

                  if(theUCbound[i] > t_up)  // what about t_up == t_low ?
                     theShift += theUCbound[i] - t_up;

                  if(t_low > theLCbound[i])  // what about t_up == t_low ?
                     theShift += t_low - theLCbound[i];
               }
            }
         }
         else
         {
            assert(rep() == ROW);

            for(i = dim(); i-- > 0;)
            {
               SPxId l_id = this->baseId(i);
               int l_num = this->number(l_id);
               t_up = t_low = 0;

               if(l_id.type() == SPxId::ROW_ID)
                  clearDualBounds(ds.rowStatus(l_num), t_up, t_low);
               else
                  clearDualBounds(ds.colStatus(l_num), t_up, t_low);

               if(theUBbound[i] != theLBbound[i])
               {
                  if(theUBbound[i] > t_up)
                     theShift += theUBbound[i] - t_up;
                  else
                     theShift -= theUBbound[i] - t_up;
               }
               else
               {
                  /* if the basic (primal or dual) variable is fixed (e.g., basis status P_FREE in row representation)
                   * then shiftFvec() and shiftPvec() do not relax the bounds, but shift both, hence they may be outside
                   * of [t_low,t_up] */
                  assert(theLBbound[i] == theUBbound[i] || theUBbound[i] >= t_up);
                  assert(theLBbound[i] == theUBbound[i] || theLBbound[i] <= t_low);

                  if((*theFvec)[i] < t_up - eps)
                     theUBbound[i] = t_up;
                  else if((*theFvec)[i] > t_up)
                     theShift += theUBbound[i] - t_up;

                  if((*theFvec)[i] > t_low + eps)
                     theLBbound[i] = t_low;
                  else if((*theFvec)[i] < t_low)
                     theShift -= theLBbound[i] - t_low;
               }
            }

            for(i = this->nRows(); i-- > 0;)
            {
               if(!isBasic(ds.rowStatus(i)))
               {
                  t_up = t_low = 0;
                  clearDualBounds(ds.rowStatus(i), t_up, t_low);

                  if(theURbound[i] > t_up)  // what about t_up == t_low ?
                     theShift += theURbound[i] - t_up;

                  if(t_low > theLRbound[i])  // what about t_up == t_low ?
                     theShift += t_low - theLRbound[i];
               }
            }

            for(i = this->nCols(); i-- > 0;)
            {
               if(!isBasic(ds.colStatus(i)))
               {
                  t_up = t_low = 0;
                  clearDualBounds(ds.colStatus(i), t_up, t_low);

                  if(theUCbound[i] > t_up)  // what about t_up == t_low ?
                     theShift += theUCbound[i] - t_up;

                  if(t_low > theLCbound[i])  // what about t_up == t_low ?
                     theShift += t_low - theLCbound[i];
               }
            }
         }
      }
      else
      {
         assert(type() == LEAVE);

         R eps = leavetol();

         if(rep() == COLUMN)
         {
            for(i = this->nRows(); i-- > 0;)
            {
               t_up = t_low = this->maxRowObj(i);
               clearDualBounds(ds.rowStatus(i), t_up, t_low);

               if(!isBasic(ds.rowStatus(i)))
               {
                  if((*theCoPvec)[i] < t_up + eps)
                  {
                     theURbound[i] = t_up; // reset bound to original value

                     if(t_up == t_low)
                        theLRbound[i] = t_low; // for fixed rows we change both bounds
                  }
                  else
                     theShift += theURbound[i] - t_up;

                  if((*theCoPvec)[i] > t_low - eps)
                  {
                     theLRbound[i] = t_low; // reset bound to original value

                     if(t_up == t_low)
                        theURbound[i] = t_up; // for fixed rows we change both bounds
                  }
                  else
                     theShift += t_low - theLRbound[i];
               }
               else if(theURbound[i] > t_up)
                  theShift += theURbound[i] - t_up;
               else if(theLRbound[i] < t_low)
                  theShift += t_low - theLRbound[i];
            }

            for(i = this->nCols(); i-- > 0;)
            {
               t_up = t_low = -this->maxObj(i);
               clearDualBounds(ds.colStatus(i), t_low, t_up);

               if(!isBasic(ds.colStatus(i)))
               {
                  if((*thePvec)[i] < -t_up + eps)
                  {
                     theUCbound[i] = -t_up; // reset bound to original value

                     if(t_up == t_low)
                        theLCbound[i] = -t_low; // for fixed variables we change both bounds
                  }
                  else
                     theShift += theUCbound[i] - (-t_up);

                  if((*thePvec)[i] > -t_low - eps)
                  {
                     theLCbound[i] = -t_low; // reset bound to original value

                     if(t_up == t_low)
                        theUCbound[i] = -t_up; // for fixed variables we change both bounds
                  }
                  else
                     theShift += (-t_low) - theLCbound[i];
               }
               else if(theUCbound[i] > -t_up)
                  theShift += theUCbound[i] - (-t_up);
               else if(theLCbound[i] < -t_low)
                  theShift += (-t_low) - theLCbound[i];
            }
         }
         else
         {
            assert(rep() == ROW);

            for(i = this->nRows(); i-- > 0;)
            {
               t_up = this->rhs(i);
               t_low = this->lhs(i);

               if(t_up == t_low)
               {
                  if(theURbound[i] > t_up)
                     theShift += theURbound[i] - t_up;
                  else
                     theShift += t_low - theLRbound[i];
               }
               else if(!isBasic(ds.rowStatus(i)))
               {
                  if((*thePvec)[i] < t_up + eps)
                     theURbound[i] = t_up; // reset bound to original value
                  else
                     theShift += theURbound[i] - t_up;

                  if((*thePvec)[i] > t_low - eps)
                     theLRbound[i] = t_low; // reset bound to original value
                  else
                     theShift += t_low - theLRbound[i];
               }
               else if(theURbound[i] > t_up)
                  theShift += theURbound[i] - t_up;
               else if(theLRbound[i] < t_low)
                  theShift += t_low - theLRbound[i];
            }

            for(i = this->nCols(); i-- > 0;)
            {
               t_up = this->upper(i);
               t_low = this->lower(i);

               if(t_up == t_low)
               {
                  if(theUCbound[i] > t_up)
                     theShift += theUCbound[i] - t_up;
                  else
                     theShift += t_low - theLCbound[i];
               }
               else if(!isBasic(ds.colStatus(i)))
               {
                  if((*theCoPvec)[i] < t_up + eps)
                     theUCbound[i] = t_up; // reset bound to original value
                  else
                     theShift += theUCbound[i] - t_up;

                  if((*theCoPvec)[i] > t_low - eps)
                     theLCbound[i] = t_low; // reset bound to original value
                  else
                     theShift += t_low - theLCbound[i];
               }
               else if(theUCbound[i] > t_up)
                  theShift += theUCbound[i] - t_up;
               else if(theLCbound[i] < t_low)
                  theShift += t_low - theLCbound[i];
            }
         }
      }
   }
}